

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_mb_intersector.h
# Opt level: O3

void embree::avx512::CurveNiMBIntersectorK<4,4>::
     intersect_t<embree::avx512::SweepCurve1IntersectorK<embree::BSplineCurveT,4>,embree::avx512::Intersect1KEpilog1<4,true>>
               (Precalculations *pre,RayHitK<4> *ray,size_t k,RayQueryContext *context,
               Primitive *prim)

{
  float *pfVar1;
  Primitive PVar2;
  undefined4 uVar3;
  Geometry *pGVar4;
  __int_type_conflict _Var5;
  long lVar6;
  long lVar7;
  RTCFilterFunctionN p_Var8;
  bool bVar9;
  bool bVar10;
  bool bVar11;
  bool bVar12;
  bool bVar13;
  bool bVar14;
  bool bVar15;
  bool bVar16;
  undefined8 uVar17;
  undefined8 uVar18;
  ulong uVar19;
  undefined8 uVar20;
  int iVar21;
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [12];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  int iVar55;
  int iVar56;
  int iVar57;
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  byte bVar61;
  byte bVar62;
  uint uVar63;
  ulong uVar64;
  byte bVar65;
  long lVar66;
  byte bVar67;
  long lVar68;
  byte bVar69;
  ulong uVar70;
  ulong uVar71;
  uint uVar72;
  uint uVar73;
  uint uVar131;
  uint uVar132;
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  uint uVar134;
  uint uVar135;
  uint uVar136;
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  undefined1 auVar121 [32];
  undefined1 auVar122 [32];
  undefined1 auVar123 [32];
  undefined1 auVar124 [32];
  undefined1 auVar125 [32];
  uint uVar133;
  uint uVar137;
  undefined1 auVar126 [32];
  undefined1 auVar127 [32];
  undefined1 auVar128 [32];
  undefined1 auVar129 [32];
  undefined1 auVar130 [32];
  float fVar138;
  float fVar158;
  float fVar160;
  vint4 bi_2;
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  float fVar159;
  float fVar161;
  float fVar162;
  float fVar163;
  float fVar164;
  undefined1 auVar150 [32];
  undefined1 auVar151 [32];
  undefined1 auVar152 [32];
  undefined1 auVar153 [32];
  undefined1 auVar154 [32];
  undefined1 auVar155 [32];
  undefined1 auVar156 [32];
  undefined1 auVar157 [32];
  undefined1 extraout_var [60];
  undefined1 extraout_var_00 [60];
  undefined1 extraout_var_01 [60];
  undefined1 extraout_var_02 [60];
  undefined4 uVar165;
  vint4 bi_1;
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar180 [32];
  undefined1 auVar181 [32];
  undefined1 auVar182 [32];
  undefined1 auVar179 [16];
  undefined1 auVar183 [32];
  undefined1 auVar184 [64];
  float fVar185;
  float fVar210;
  float fVar211;
  vint4 bi;
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  float fVar212;
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 auVar207 [32];
  undefined1 auVar208 [32];
  undefined1 auVar209 [32];
  undefined1 auVar213 [16];
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  undefined1 auVar217 [16];
  undefined1 auVar218 [16];
  undefined1 auVar219 [16];
  float fVar220;
  float fVar221;
  float fVar222;
  float fVar223;
  float fVar233;
  float fVar234;
  vint4 ai_2;
  undefined1 auVar224 [16];
  undefined1 auVar225 [16];
  undefined1 auVar226 [16];
  float fVar235;
  undefined1 auVar227 [16];
  undefined1 auVar228 [16];
  undefined1 auVar229 [16];
  undefined1 auVar230 [16];
  undefined1 auVar231 [16];
  float fVar236;
  undefined1 auVar232 [32];
  vint4 ai_1;
  undefined1 auVar237 [16];
  undefined1 auVar238 [16];
  undefined1 auVar239 [16];
  undefined1 auVar240 [16];
  float fVar242;
  undefined1 auVar241 [64];
  vint4 ai;
  undefined1 auVar243 [16];
  undefined1 auVar244 [16];
  undefined1 auVar245 [16];
  undefined1 auVar246 [16];
  undefined1 auVar247 [32];
  float fVar248;
  undefined1 auVar249 [16];
  undefined1 auVar250 [16];
  undefined1 auVar251 [32];
  undefined1 auVar252 [64];
  float fVar253;
  float fVar256;
  float fVar257;
  undefined1 auVar254 [16];
  float fVar258;
  undefined1 auVar255 [64];
  undefined1 auVar259 [64];
  undefined1 auVar260 [28];
  float fVar261;
  undefined1 auVar262 [64];
  undefined1 auVar263 [16];
  undefined1 auVar264 [16];
  undefined1 auVar265 [16];
  undefined1 auVar266 [32];
  undefined1 auVar268 [16];
  undefined1 auVar269 [16];
  undefined1 auVar270 [16];
  undefined1 auVar271 [16];
  undefined1 auVar272 [64];
  undefined1 auVar273 [64];
  undefined1 auVar274 [64];
  undefined1 auVar275 [64];
  undefined1 auVar276 [64];
  undefined1 auVar277 [64];
  undefined1 auVar278 [64];
  undefined1 auVar279 [64];
  undefined1 auVar280 [64];
  undefined1 auVar281 [64];
  undefined1 auVar282 [64];
  undefined1 auVar283 [64];
  RTCFilterFunctionNArguments args;
  Vec3fa dir;
  vfloatx_conflict vu0;
  BBox<embree::vfloat_impl<8>_> tp1;
  vfloat<8> dOdO;
  BBox<embree::vfloat_impl<8>_> tp0;
  StackEntry stack [3];
  undefined1 local_9c0 [16];
  uint local_9b0;
  int local_9ac;
  float local_9a8;
  float local_9a4;
  undefined1 local_9a0 [32];
  undefined1 local_980 [32];
  undefined1 local_960 [32];
  undefined1 local_940 [32];
  undefined1 local_920 [32];
  undefined1 local_900 [32];
  undefined1 local_8e0 [32];
  undefined1 local_8c0 [32];
  undefined1 local_8a0 [32];
  RTCFilterFunctionNArguments local_870;
  undefined1 local_840 [32];
  undefined1 local_820 [32];
  undefined1 local_800 [32];
  undefined1 local_7e0 [32];
  undefined1 local_7c0 [32];
  undefined1 local_7a0 [8];
  float fStack_798;
  float fStack_794;
  float fStack_790;
  float fStack_78c;
  float fStack_788;
  undefined1 local_780 [32];
  undefined1 local_760 [16];
  ulong local_748;
  undefined1 local_740 [32];
  undefined1 local_720 [32];
  undefined1 local_700 [16];
  undefined1 local_6f0 [16];
  undefined1 local_6e0 [8];
  float fStack_6d8;
  float fStack_6d4;
  float fStack_6d0;
  float fStack_6cc;
  float fStack_6c8;
  float fStack_6c4;
  undefined1 local_6c0 [8];
  float fStack_6b8;
  float fStack_6b4;
  undefined1 local_6a0 [32];
  undefined1 local_680 [32];
  undefined1 local_660 [32];
  undefined1 local_640 [16];
  undefined1 local_630 [16];
  float local_620;
  float fStack_61c;
  float fStack_618;
  float fStack_614;
  undefined1 local_610 [16];
  undefined1 local_600 [16];
  Primitive *local_5f0;
  ulong local_5e8;
  undefined1 local_5e0 [8];
  float fStack_5d8;
  float fStack_5d4;
  float fStack_5d0;
  float fStack_5cc;
  float fStack_5c8;
  float fStack_5c4;
  undefined1 local_5c0 [32];
  undefined1 local_5a0 [32];
  undefined1 local_580 [32];
  undefined1 local_560 [8];
  float fStack_558;
  float fStack_554;
  undefined1 auStack_550 [16];
  undefined1 local_540 [32];
  undefined1 local_510 [16];
  undefined1 local_500 [16];
  undefined1 local_4f0 [16];
  RTCHitN local_4e0 [16];
  undefined1 auStack_4d0 [16];
  undefined4 local_4c0;
  undefined4 uStack_4bc;
  undefined4 uStack_4b8;
  undefined4 uStack_4b4;
  float local_4b0;
  float fStack_4ac;
  float fStack_4a8;
  float fStack_4a4;
  undefined1 local_4a0 [16];
  undefined8 local_490;
  undefined8 uStack_488;
  undefined1 local_480 [16];
  uint local_470;
  uint uStack_46c;
  uint uStack_468;
  uint uStack_464;
  uint uStack_460;
  uint uStack_45c;
  uint uStack_458;
  uint uStack_454;
  undefined1 local_440 [32];
  undefined1 local_420 [32];
  undefined1 local_400 [8];
  float fStack_3f8;
  float fStack_3f4;
  float fStack_3f0;
  float fStack_3ec;
  float fStack_3e8;
  undefined1 local_3e0 [32];
  float local_3c0;
  float fStack_3bc;
  float fStack_3b8;
  float fStack_3b4;
  float fStack_3b0;
  float fStack_3ac;
  float fStack_3a8;
  float fStack_3a4;
  undefined1 local_3a0 [16];
  undefined1 local_390 [16];
  undefined1 local_380 [32];
  undefined1 local_360 [32];
  undefined1 local_340 [32];
  undefined1 local_320 [32];
  undefined1 local_300 [32];
  float local_2e0;
  float fStack_2dc;
  float fStack_2d8;
  float fStack_2d4;
  float fStack_2d0;
  float fStack_2cc;
  float fStack_2c8;
  float fStack_2c4;
  undefined1 local_2c0 [32];
  undefined1 local_2a0 [32];
  undefined1 local_280 [32];
  undefined1 local_260 [32];
  undefined1 local_240 [32];
  undefined1 local_220 [32];
  undefined1 local_200 [8];
  float fStack_1f8;
  float fStack_1f4;
  float fStack_1f0;
  float fStack_1ec;
  float fStack_1e8;
  float fStack_1e4;
  undefined1 local_1e0 [32];
  undefined1 local_1c0 [32];
  undefined1 local_1a0 [32];
  byte abStack_180 [32];
  undefined1 auStack_160 [32];
  ulong uStack_140;
  int aiStack_138 [66];
  undefined1 auVar267 [64];
  
  PVar2 = prim[1];
  uVar70 = (ulong)(byte)PVar2;
  lVar68 = uVar70 * 0x25;
  fVar253 = *(float *)(prim + lVar68 + 0x12);
  auVar78 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x10)),
                          0x10);
  auVar78 = vinsertps_avx(auVar78,ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x20);
  auVar77 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x40)),
                          ZEXT416(*(uint *)(ray + k * 4 + 0x50)),0x10);
  auVar77 = vinsertps_avx(auVar77,ZEXT416(*(uint *)(ray + k * 4 + 0x60)),0x20);
  auVar78 = vsubps_avx(auVar78,*(undefined1 (*) [16])(prim + lVar68 + 6));
  auVar213._0_4_ = fVar253 * auVar78._0_4_;
  auVar213._4_4_ = fVar253 * auVar78._4_4_;
  auVar213._8_4_ = fVar253 * auVar78._8_4_;
  auVar213._12_4_ = fVar253 * auVar78._12_4_;
  auVar78 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar70 * 4 + 6)));
  auVar139._0_4_ = fVar253 * auVar77._0_4_;
  auVar139._4_4_ = fVar253 * auVar77._4_4_;
  auVar139._8_4_ = fVar253 * auVar77._8_4_;
  auVar139._12_4_ = fVar253 * auVar77._12_4_;
  auVar78 = vcvtdq2ps_avx(auVar78);
  auVar77 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar70 * 5 + 6)));
  auVar77 = vcvtdq2ps_avx(auVar77);
  auVar80 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar70 * 6 + 6)));
  auVar85 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar70 * 0xf + 6)));
  auVar80 = vcvtdq2ps_avx(auVar80);
  auVar85 = vcvtdq2ps_avx(auVar85);
  auVar86 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)(byte)PVar2 * 0x10 + 6)));
  auVar86 = vcvtdq2ps_avx(auVar86);
  auVar227 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)(byte)PVar2 * 0x10 + uVar70 + 6)));
  auVar227 = vcvtdq2ps_avx(auVar227);
  auVar81 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar70 * 0x1a + 6)));
  auVar81 = vcvtdq2ps_avx(auVar81);
  auVar79 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar70 * 0x1b + 6)));
  auVar79 = vcvtdq2ps_avx(auVar79);
  auVar82 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar70 * 0x1c + 6)));
  auVar82 = vcvtdq2ps_avx(auVar82);
  auVar237._4_4_ = auVar139._0_4_;
  auVar237._0_4_ = auVar139._0_4_;
  auVar237._8_4_ = auVar139._0_4_;
  auVar237._12_4_ = auVar139._0_4_;
  auVar84 = vshufps_avx(auVar139,auVar139,0x55);
  auVar83 = vshufps_avx(auVar139,auVar139,0xaa);
  fVar253 = auVar83._0_4_;
  auVar186._0_4_ = fVar253 * auVar80._0_4_;
  fVar158 = auVar83._4_4_;
  auVar186._4_4_ = fVar158 * auVar80._4_4_;
  fVar256 = auVar83._8_4_;
  auVar186._8_4_ = fVar256 * auVar80._8_4_;
  fVar257 = auVar83._12_4_;
  auVar186._12_4_ = fVar257 * auVar80._12_4_;
  auVar166._0_4_ = auVar227._0_4_ * fVar253;
  auVar166._4_4_ = auVar227._4_4_ * fVar158;
  auVar166._8_4_ = auVar227._8_4_ * fVar256;
  auVar166._12_4_ = auVar227._12_4_ * fVar257;
  auVar140._0_4_ = auVar82._0_4_ * fVar253;
  auVar140._4_4_ = auVar82._4_4_ * fVar158;
  auVar140._8_4_ = auVar82._8_4_ * fVar256;
  auVar140._12_4_ = auVar82._12_4_ * fVar257;
  auVar83 = vfmadd231ps_fma(auVar186,auVar84,auVar77);
  auVar23 = vfmadd231ps_fma(auVar166,auVar84,auVar86);
  auVar84 = vfmadd231ps_fma(auVar140,auVar79,auVar84);
  auVar24 = vfmadd231ps_fma(auVar83,auVar237,auVar78);
  auVar23 = vfmadd231ps_fma(auVar23,auVar237,auVar85);
  auVar25 = vfmadd231ps_fma(auVar84,auVar81,auVar237);
  auVar269._4_4_ = auVar213._0_4_;
  auVar269._0_4_ = auVar213._0_4_;
  auVar269._8_4_ = auVar213._0_4_;
  auVar269._12_4_ = auVar213._0_4_;
  auVar84 = vshufps_avx(auVar213,auVar213,0x55);
  auVar83 = vshufps_avx(auVar213,auVar213,0xaa);
  fVar253 = auVar83._0_4_;
  auVar238._0_4_ = fVar253 * auVar80._0_4_;
  fVar158 = auVar83._4_4_;
  auVar238._4_4_ = fVar158 * auVar80._4_4_;
  fVar256 = auVar83._8_4_;
  auVar238._8_4_ = fVar256 * auVar80._8_4_;
  fVar257 = auVar83._12_4_;
  auVar238._12_4_ = fVar257 * auVar80._12_4_;
  auVar224._0_4_ = auVar227._0_4_ * fVar253;
  auVar224._4_4_ = auVar227._4_4_ * fVar158;
  auVar224._8_4_ = auVar227._8_4_ * fVar256;
  auVar224._12_4_ = auVar227._12_4_ * fVar257;
  auVar214._0_4_ = auVar82._0_4_ * fVar253;
  auVar214._4_4_ = auVar82._4_4_ * fVar158;
  auVar214._8_4_ = auVar82._8_4_ * fVar256;
  auVar214._12_4_ = auVar82._12_4_ * fVar257;
  auVar77 = vfmadd231ps_fma(auVar238,auVar84,auVar77);
  auVar80 = vfmadd231ps_fma(auVar224,auVar84,auVar86);
  auVar86 = vfmadd231ps_fma(auVar214,auVar84,auVar79);
  auVar26 = vfmadd231ps_fma(auVar77,auVar269,auVar78);
  auVar139 = vfmadd231ps_fma(auVar80,auVar269,auVar85);
  auVar254._8_4_ = 0x7fffffff;
  auVar254._0_8_ = 0x7fffffff7fffffff;
  auVar254._12_4_ = 0x7fffffff;
  auVar140 = vfmadd231ps_fma(auVar86,auVar269,auVar81);
  auVar78 = vandps_avx(auVar254,auVar24);
  auVar249._8_4_ = 0x219392ef;
  auVar249._0_8_ = 0x219392ef219392ef;
  auVar249._12_4_ = 0x219392ef;
  uVar64 = vcmpps_avx512vl(auVar78,auVar249,1);
  bVar9 = (bool)((byte)uVar64 & 1);
  auVar74._0_4_ = (uint)bVar9 * 0x219392ef | (uint)!bVar9 * auVar24._0_4_;
  bVar9 = (bool)((byte)(uVar64 >> 1) & 1);
  auVar74._4_4_ = (uint)bVar9 * 0x219392ef | (uint)!bVar9 * auVar24._4_4_;
  bVar9 = (bool)((byte)(uVar64 >> 2) & 1);
  auVar74._8_4_ = (uint)bVar9 * 0x219392ef | (uint)!bVar9 * auVar24._8_4_;
  bVar9 = (bool)((byte)(uVar64 >> 3) & 1);
  auVar74._12_4_ = (uint)bVar9 * 0x219392ef | (uint)!bVar9 * auVar24._12_4_;
  auVar78 = vandps_avx(auVar254,auVar23);
  uVar64 = vcmpps_avx512vl(auVar78,auVar249,1);
  bVar9 = (bool)((byte)uVar64 & 1);
  auVar75._0_4_ = (uint)bVar9 * 0x219392ef | (uint)!bVar9 * auVar23._0_4_;
  bVar9 = (bool)((byte)(uVar64 >> 1) & 1);
  auVar75._4_4_ = (uint)bVar9 * 0x219392ef | (uint)!bVar9 * auVar23._4_4_;
  bVar9 = (bool)((byte)(uVar64 >> 2) & 1);
  auVar75._8_4_ = (uint)bVar9 * 0x219392ef | (uint)!bVar9 * auVar23._8_4_;
  bVar9 = (bool)((byte)(uVar64 >> 3) & 1);
  auVar75._12_4_ = (uint)bVar9 * 0x219392ef | (uint)!bVar9 * auVar23._12_4_;
  auVar78 = vandps_avx(auVar254,auVar25);
  uVar64 = vcmpps_avx512vl(auVar78,auVar249,1);
  bVar9 = (bool)((byte)uVar64 & 1);
  auVar76._0_4_ = (uint)bVar9 * 0x219392ef | (uint)!bVar9 * auVar25._0_4_;
  bVar9 = (bool)((byte)(uVar64 >> 1) & 1);
  auVar76._4_4_ = (uint)bVar9 * 0x219392ef | (uint)!bVar9 * auVar25._4_4_;
  bVar9 = (bool)((byte)(uVar64 >> 2) & 1);
  auVar76._8_4_ = (uint)bVar9 * 0x219392ef | (uint)!bVar9 * auVar25._8_4_;
  bVar9 = (bool)((byte)(uVar64 >> 3) & 1);
  auVar76._12_4_ = (uint)bVar9 * 0x219392ef | (uint)!bVar9 * auVar25._12_4_;
  auVar77 = vrcp14ps_avx512vl(auVar74);
  auVar250._8_4_ = 0x3f800000;
  auVar250._0_8_ = 0x3f8000003f800000;
  auVar250._12_4_ = 0x3f800000;
  auVar78 = vfnmadd213ps_fma(auVar74,auVar77,auVar250);
  auVar24 = vfmadd132ps_fma(auVar78,auVar77,auVar77);
  auVar77 = vrcp14ps_avx512vl(auVar75);
  auVar78 = vfnmadd213ps_fma(auVar75,auVar77,auVar250);
  auVar25 = vfmadd132ps_fma(auVar78,auVar77,auVar77);
  auVar77 = vrcp14ps_avx512vl(auVar76);
  auVar78 = vfnmadd213ps_fma(auVar76,auVar77,auVar250);
  auVar22 = vfmadd132ps_fma(auVar78,auVar77,auVar77);
  fVar253 = (*(float *)(ray + k * 4 + 0x70) - *(float *)(prim + lVar68 + 0x16)) *
            *(float *)(prim + lVar68 + 0x1a);
  auVar243._4_4_ = fVar253;
  auVar243._0_4_ = fVar253;
  auVar243._8_4_ = fVar253;
  auVar243._12_4_ = fVar253;
  auVar78._8_8_ = 0;
  auVar78._0_8_ = *(ulong *)(prim + uVar70 * 7 + 6);
  auVar78 = vpmovsxwd_avx(auVar78);
  auVar78 = vcvtdq2ps_avx(auVar78);
  auVar77._8_8_ = 0;
  auVar77._0_8_ = *(ulong *)(prim + uVar70 * 0xb + 6);
  auVar77 = vpmovsxwd_avx(auVar77);
  auVar77 = vcvtdq2ps_avx(auVar77);
  auVar85 = vsubps_avx(auVar77,auVar78);
  auVar80._8_8_ = 0;
  auVar80._0_8_ = *(ulong *)(prim + uVar70 * 9 + 6);
  auVar77 = vpmovsxwd_avx(auVar80);
  auVar80 = vfmadd213ps_fma(auVar85,auVar243,auVar78);
  auVar78 = vcvtdq2ps_avx(auVar77);
  auVar85._8_8_ = 0;
  auVar85._0_8_ = *(ulong *)(prim + uVar70 * 0xd + 6);
  auVar77 = vpmovsxwd_avx(auVar85);
  auVar77 = vcvtdq2ps_avx(auVar77);
  auVar77 = vsubps_avx(auVar77,auVar78);
  auVar85 = vfmadd213ps_fma(auVar77,auVar243,auVar78);
  auVar86._8_8_ = 0;
  auVar86._0_8_ = *(ulong *)(prim + uVar70 * 0x12 + 6);
  auVar78 = vpmovsxwd_avx(auVar86);
  auVar78 = vcvtdq2ps_avx(auVar78);
  uVar64 = (ulong)(uint)((int)(uVar70 * 5) << 2);
  auVar227._8_8_ = 0;
  auVar227._0_8_ = *(ulong *)(prim + uVar70 * 2 + uVar64 + 6);
  auVar77 = vpmovsxwd_avx(auVar227);
  auVar77 = vcvtdq2ps_avx(auVar77);
  auVar77 = vsubps_avx(auVar77,auVar78);
  auVar86 = vfmadd213ps_fma(auVar77,auVar243,auVar78);
  auVar81._8_8_ = 0;
  auVar81._0_8_ = *(ulong *)(prim + uVar64 + 6);
  auVar78 = vpmovsxwd_avx(auVar81);
  auVar78 = vcvtdq2ps_avx(auVar78);
  auVar79._8_8_ = 0;
  auVar79._0_8_ = *(ulong *)(prim + uVar70 * 0x18 + 6);
  auVar77 = vpmovsxwd_avx(auVar79);
  auVar77 = vcvtdq2ps_avx(auVar77);
  auVar77 = vsubps_avx(auVar77,auVar78);
  auVar227 = vfmadd213ps_fma(auVar77,auVar243,auVar78);
  auVar82._8_8_ = 0;
  auVar82._0_8_ = *(ulong *)(prim + uVar70 * 0x1d + 6);
  auVar78 = vpmovsxwd_avx(auVar82);
  auVar78 = vcvtdq2ps_avx(auVar78);
  auVar84._8_8_ = 0;
  auVar84._0_8_ = *(ulong *)(prim + uVar70 + (ulong)(byte)PVar2 * 0x20 + 6);
  auVar77 = vpmovsxwd_avx(auVar84);
  auVar77 = vcvtdq2ps_avx(auVar77);
  auVar77 = vsubps_avx(auVar77,auVar78);
  auVar81 = vfmadd213ps_fma(auVar77,auVar243,auVar78);
  auVar83._8_8_ = 0;
  auVar83._0_8_ = *(ulong *)(prim + ((ulong)(byte)PVar2 * 0x20 - uVar70) + 6);
  auVar78 = vpmovsxwd_avx(auVar83);
  auVar78 = vcvtdq2ps_avx(auVar78);
  auVar23._8_8_ = 0;
  auVar23._0_8_ = *(ulong *)(prim + uVar70 * 0x23 + 6);
  auVar77 = vpmovsxwd_avx(auVar23);
  auVar77 = vcvtdq2ps_avx(auVar77);
  auVar77 = vsubps_avx(auVar77,auVar78);
  auVar77 = vfmadd213ps_fma(auVar77,auVar243,auVar78);
  auVar78 = vsubps_avx(auVar80,auVar26);
  auVar244._0_4_ = auVar24._0_4_ * auVar78._0_4_;
  auVar244._4_4_ = auVar24._4_4_ * auVar78._4_4_;
  auVar244._8_4_ = auVar24._8_4_ * auVar78._8_4_;
  auVar244._12_4_ = auVar24._12_4_ * auVar78._12_4_;
  auVar78 = vsubps_avx(auVar85,auVar26);
  auVar187._0_4_ = auVar24._0_4_ * auVar78._0_4_;
  auVar187._4_4_ = auVar24._4_4_ * auVar78._4_4_;
  auVar187._8_4_ = auVar24._8_4_ * auVar78._8_4_;
  auVar187._12_4_ = auVar24._12_4_ * auVar78._12_4_;
  auVar78 = vsubps_avx(auVar86,auVar139);
  auVar239._0_4_ = auVar25._0_4_ * auVar78._0_4_;
  auVar239._4_4_ = auVar25._4_4_ * auVar78._4_4_;
  auVar239._8_4_ = auVar25._8_4_ * auVar78._8_4_;
  auVar239._12_4_ = auVar25._12_4_ * auVar78._12_4_;
  auVar78 = vsubps_avx(auVar227,auVar139);
  auVar167._0_4_ = auVar25._0_4_ * auVar78._0_4_;
  auVar167._4_4_ = auVar25._4_4_ * auVar78._4_4_;
  auVar167._8_4_ = auVar25._8_4_ * auVar78._8_4_;
  auVar167._12_4_ = auVar25._12_4_ * auVar78._12_4_;
  auVar78 = vsubps_avx(auVar81,auVar140);
  auVar225._0_4_ = auVar22._0_4_ * auVar78._0_4_;
  auVar225._4_4_ = auVar22._4_4_ * auVar78._4_4_;
  auVar225._8_4_ = auVar22._8_4_ * auVar78._8_4_;
  auVar225._12_4_ = auVar22._12_4_ * auVar78._12_4_;
  auVar78 = vsubps_avx(auVar77,auVar140);
  auVar141._0_4_ = auVar22._0_4_ * auVar78._0_4_;
  auVar141._4_4_ = auVar22._4_4_ * auVar78._4_4_;
  auVar141._8_4_ = auVar22._8_4_ * auVar78._8_4_;
  auVar141._12_4_ = auVar22._12_4_ * auVar78._12_4_;
  auVar78 = vpminsd_avx(auVar244,auVar187);
  auVar77 = vpminsd_avx(auVar239,auVar167);
  auVar78 = vmaxps_avx(auVar78,auVar77);
  auVar77 = vpminsd_avx(auVar225,auVar141);
  uVar165 = *(undefined4 *)(ray + k * 4 + 0x30);
  auVar24._4_4_ = uVar165;
  auVar24._0_4_ = uVar165;
  auVar24._8_4_ = uVar165;
  auVar24._12_4_ = uVar165;
  auVar77 = vmaxps_avx512vl(auVar77,auVar24);
  auVar78 = vmaxps_avx(auVar78,auVar77);
  auVar25._8_4_ = 0x3f7ffffa;
  auVar25._0_8_ = 0x3f7ffffa3f7ffffa;
  auVar25._12_4_ = 0x3f7ffffa;
  local_3a0 = vmulps_avx512vl(auVar78,auVar25);
  auVar78 = vpmaxsd_avx(auVar244,auVar187);
  auVar77 = vpmaxsd_avx(auVar239,auVar167);
  auVar78 = vminps_avx(auVar78,auVar77);
  auVar77 = vpmaxsd_avx(auVar225,auVar141);
  uVar165 = *(undefined4 *)(ray + k * 4 + 0x80);
  auVar22._4_4_ = uVar165;
  auVar22._0_4_ = uVar165;
  auVar22._8_4_ = uVar165;
  auVar22._12_4_ = uVar165;
  auVar77 = vminps_avx512vl(auVar77,auVar22);
  auVar78 = vminps_avx(auVar78,auVar77);
  auVar26._8_4_ = 0x3f800003;
  auVar26._0_8_ = 0x3f8000033f800003;
  auVar26._12_4_ = 0x3f800003;
  auVar78 = vmulps_avx512vl(auVar78,auVar26);
  auVar77 = vpbroadcastd_avx512vl();
  uVar17 = vcmpps_avx512vl(local_3a0,auVar78,2);
  local_5e8 = vpcmpgtd_avx512vl(auVar77,_DAT_01f7fcf0);
  local_5e8 = ((byte)uVar17 & 0xf) & local_5e8;
  if ((char)local_5e8 == '\0') {
    return;
  }
  local_510 = vpmovm2d_avx512vl((ulong)(uint)(1 << ((uint)k & 0x1f)));
  local_5f0 = prim;
LAB_01b9e678:
  lVar68 = 0;
  for (uVar64 = local_5e8; (uVar64 & 1) == 0; uVar64 = uVar64 >> 1 | 0x8000000000000000) {
    lVar68 = lVar68 + 1;
  }
  uVar63 = *(uint *)(local_5f0 + 2);
  local_748 = (ulong)*(uint *)(local_5f0 + lVar68 * 4 + 6);
  pGVar4 = (context->scene->geometries).items[uVar63].ptr;
  uVar64 = (ulong)*(uint *)(*(long *)&pGVar4->field_0x58 +
                           local_748 *
                           pGVar4[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                           _M_i);
  fVar253 = (pGVar4->time_range).lower;
  fVar253 = pGVar4->fnumTimeSegments *
            ((*(float *)(ray + k * 4 + 0x70) - fVar253) / ((pGVar4->time_range).upper - fVar253));
  auVar78 = vroundss_avx(ZEXT416((uint)fVar253),ZEXT416((uint)fVar253),9);
  auVar78 = vminss_avx(auVar78,ZEXT416((uint)(pGVar4->fnumTimeSegments + -1.0)));
  auVar78 = vmaxss_avx(ZEXT816(0) << 0x20,auVar78);
  fVar253 = fVar253 - auVar78._0_4_;
  _Var5 = pGVar4[4].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
  lVar66 = (long)(int)auVar78._0_4_ * 0x38;
  lVar68 = *(long *)(_Var5 + 0x10 + lVar66);
  lVar6 = *(long *)(_Var5 + 0x38 + lVar66);
  lVar7 = *(long *)(_Var5 + 0x48 + lVar66);
  pfVar1 = (float *)(lVar6 + uVar64 * lVar7);
  auVar188._0_4_ = fVar253 * *pfVar1;
  auVar188._4_4_ = fVar253 * pfVar1[1];
  auVar188._8_4_ = fVar253 * pfVar1[2];
  auVar188._12_4_ = fVar253 * pfVar1[3];
  pfVar1 = (float *)(lVar6 + (uVar64 + 1) * lVar7);
  auVar215._0_4_ = fVar253 * *pfVar1;
  auVar215._4_4_ = fVar253 * pfVar1[1];
  auVar215._8_4_ = fVar253 * pfVar1[2];
  auVar215._12_4_ = fVar253 * pfVar1[3];
  pfVar1 = (float *)(lVar6 + (uVar64 + 2) * lVar7);
  auVar226._0_4_ = fVar253 * *pfVar1;
  auVar226._4_4_ = fVar253 * pfVar1[1];
  auVar226._8_4_ = fVar253 * pfVar1[2];
  auVar226._12_4_ = fVar253 * pfVar1[3];
  pfVar1 = (float *)(lVar6 + lVar7 * (uVar64 + 3));
  auVar168._0_4_ = fVar253 * *pfVar1;
  auVar168._4_4_ = fVar253 * pfVar1[1];
  auVar168._8_4_ = fVar253 * pfVar1[2];
  auVar168._12_4_ = fVar253 * pfVar1[3];
  lVar6 = *(long *)(_Var5 + lVar66);
  fVar253 = 1.0 - fVar253;
  auVar142._4_4_ = fVar253;
  auVar142._0_4_ = fVar253;
  auVar142._8_4_ = fVar253;
  auVar142._12_4_ = fVar253;
  auVar80 = vfmadd231ps_fma(auVar188,auVar142,*(undefined1 (*) [16])(lVar6 + lVar68 * uVar64));
  auVar85 = vfmadd231ps_fma(auVar215,auVar142,*(undefined1 (*) [16])(lVar6 + lVar68 * (uVar64 + 1)))
  ;
  auVar86 = vfmadd231ps_fma(auVar226,auVar142,*(undefined1 (*) [16])(lVar6 + lVar68 * (uVar64 + 2)))
  ;
  auVar227 = vfmadd231ps_fma(auVar168,auVar142,*(undefined1 (*) [16])(lVar6 + lVar68 * (uVar64 + 3))
                            );
  auVar78 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x10)),
                          0x1c);
  auVar77 = vinsertps_avx(auVar78,ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x28);
  uVar165 = *(undefined4 *)(ray + k * 4 + 0x40);
  auVar263._4_4_ = uVar165;
  auVar263._0_4_ = uVar165;
  auVar263._8_4_ = uVar165;
  auVar263._12_4_ = uVar165;
  fStack_3f0 = (float)uVar165;
  _local_400 = auVar263;
  fStack_3ec = (float)uVar165;
  fStack_3e8 = (float)uVar165;
  register0x0000151c = uVar165;
  auVar267 = ZEXT3264(_local_400);
  uVar165 = *(undefined4 *)(ray + k * 4 + 0x50);
  auVar268._4_4_ = uVar165;
  auVar268._0_4_ = uVar165;
  auVar268._8_4_ = uVar165;
  auVar268._12_4_ = uVar165;
  local_420._16_4_ = uVar165;
  local_420._0_16_ = auVar268;
  local_420._20_4_ = uVar165;
  local_420._24_4_ = uVar165;
  local_420._28_4_ = uVar165;
  auVar78 = vunpcklps_avx(auVar263,auVar268);
  fVar253 = *(float *)(ray + k * 4 + 0x60);
  auVar270._4_4_ = fVar253;
  auVar270._0_4_ = fVar253;
  auVar270._8_4_ = fVar253;
  auVar270._12_4_ = fVar253;
  local_440._16_4_ = fVar253;
  local_440._0_16_ = auVar270;
  local_440._20_4_ = fVar253;
  local_440._24_4_ = fVar253;
  local_440._28_4_ = fVar253;
  local_6f0 = vinsertps_avx(auVar78,auVar270,0x28);
  auVar259 = ZEXT1664(local_6f0);
  auVar240._0_4_ = auVar80._0_4_ + auVar85._0_4_ + auVar86._0_4_ + auVar227._0_4_;
  auVar240._4_4_ = auVar80._4_4_ + auVar85._4_4_ + auVar86._4_4_ + auVar227._4_4_;
  auVar240._8_4_ = auVar80._8_4_ + auVar85._8_4_ + auVar86._8_4_ + auVar227._8_4_;
  auVar240._12_4_ = auVar80._12_4_ + auVar85._12_4_ + auVar86._12_4_ + auVar227._12_4_;
  auVar27._8_4_ = 0x3e800000;
  auVar27._0_8_ = 0x3e8000003e800000;
  auVar27._12_4_ = 0x3e800000;
  auVar78 = vmulps_avx512vl(auVar240,auVar27);
  auVar78 = vsubps_avx(auVar78,auVar77);
  auVar78 = vdpps_avx(auVar78,local_6f0,0x7f);
  fVar158 = *(float *)(ray + k * 4 + 0x30);
  local_700 = vdpps_avx(local_6f0,local_6f0,0x7f);
  auVar262 = ZEXT1664(local_700);
  auVar82 = ZEXT816(0) << 0x40;
  auVar255 = ZEXT1664(auVar82);
  auVar245._4_12_ = ZEXT812(0) << 0x20;
  auVar245._0_4_ = local_700._0_4_;
  auVar79 = vrcp14ss_avx512f(auVar82,auVar245);
  auVar81 = vfnmadd213ss_fma(auVar79,local_700,ZEXT416(0x40000000));
  local_2e0 = auVar78._0_4_ * auVar79._0_4_ * auVar81._0_4_;
  auVar241 = ZEXT464((uint)local_2e0);
  auVar246._4_4_ = local_2e0;
  auVar246._0_4_ = local_2e0;
  auVar246._8_4_ = local_2e0;
  auVar246._12_4_ = local_2e0;
  fStack_6d0 = local_2e0;
  _local_6e0 = auVar246;
  fStack_6cc = local_2e0;
  fStack_6c8 = local_2e0;
  fStack_6c4 = local_2e0;
  auVar78 = vfmadd231ps_fma(auVar77,local_6f0,auVar246);
  auVar78 = vblendps_avx(auVar78,auVar82,8);
  auVar77 = vsubps_avx(auVar80,auVar78);
  auVar80 = vsubps_avx(auVar86,auVar78);
  auVar85 = vsubps_avx(auVar85,auVar78);
  auVar78 = vsubps_avx(auVar227,auVar78);
  auVar252 = ZEXT1664(auVar78);
  local_8e0 = vbroadcastss_avx512vl(auVar77);
  auVar280 = ZEXT3264(local_8e0);
  auVar88._8_4_ = 1;
  auVar88._0_8_ = 0x100000001;
  auVar88._12_4_ = 1;
  auVar88._16_4_ = 1;
  auVar88._20_4_ = 1;
  auVar88._24_4_ = 1;
  auVar88._28_4_ = 1;
  local_660 = ZEXT1632(auVar77);
  local_900 = vpermps_avx512vl(auVar88,local_660);
  auVar272 = ZEXT3264(local_900);
  auVar89._8_4_ = 2;
  auVar89._0_8_ = 0x200000002;
  auVar89._12_4_ = 2;
  auVar89._16_4_ = 2;
  auVar89._20_4_ = 2;
  auVar89._24_4_ = 2;
  auVar89._28_4_ = 2;
  local_920 = vpermps_avx512vl(auVar89,local_660);
  auVar273 = ZEXT3264(local_920);
  auVar92._8_4_ = 3;
  auVar92._0_8_ = 0x300000003;
  auVar92._12_4_ = 3;
  auVar92._16_4_ = 3;
  auVar92._20_4_ = 3;
  auVar92._24_4_ = 3;
  auVar92._28_4_ = 3;
  local_940 = vpermps_avx512vl(auVar92,local_660);
  auVar274 = ZEXT3264(local_940);
  local_7e0 = vbroadcastss_avx512vl(auVar85);
  auVar275 = ZEXT3264(local_7e0);
  local_6a0 = ZEXT1632(auVar85);
  local_960 = vpermps_avx512vl(auVar88,local_6a0);
  auVar276 = ZEXT3264(local_960);
  local_800 = vpermps_avx512vl(auVar89,local_6a0);
  auVar277 = ZEXT3264(local_800);
  local_980 = vpermps_avx512vl(auVar92,local_6a0);
  auVar278 = ZEXT3264(local_980);
  local_9a0 = vbroadcastss_avx512vl(auVar80);
  auVar279 = ZEXT3264(local_9a0);
  local_680 = ZEXT1632(auVar80);
  local_820 = vpermps_avx512vl(auVar88,local_680);
  auVar281 = ZEXT3264(local_820);
  local_840 = vpermps_avx512vl(auVar89,local_680);
  auVar282 = ZEXT3264(local_840);
  local_8c0 = vpermps_avx512vl(auVar92,local_680);
  auVar283 = ZEXT3264(local_8c0);
  local_260 = vbroadcastss_avx512vl(auVar78);
  _local_6c0 = ZEXT1632(auVar78);
  local_240 = vpermps_avx512vl(auVar88,_local_6c0);
  local_2a0 = vpermps_avx2(auVar89,_local_6c0);
  local_2c0 = vpermps_avx2(auVar92,_local_6c0);
  auVar78 = vfmadd231ps_fma(ZEXT432((uint)(fVar253 * fVar253)),local_420,local_420);
  auVar78 = vfmadd231ps_fma(ZEXT1632(auVar78),_local_400,_local_400);
  local_220._0_4_ = auVar78._0_4_;
  local_220._4_4_ = local_220._0_4_;
  local_220._8_4_ = local_220._0_4_;
  local_220._12_4_ = local_220._0_4_;
  local_220._16_4_ = local_220._0_4_;
  local_220._20_4_ = local_220._0_4_;
  local_220._24_4_ = local_220._0_4_;
  local_220._28_4_ = local_220._0_4_;
  auVar91._8_4_ = 0x7fffffff;
  auVar91._0_8_ = 0x7fffffff7fffffff;
  auVar91._12_4_ = 0x7fffffff;
  auVar91._16_4_ = 0x7fffffff;
  auVar91._20_4_ = 0x7fffffff;
  auVar91._24_4_ = 0x7fffffff;
  auVar91._28_4_ = 0x7fffffff;
  vandps_avx512vl(local_220,auVar91);
  local_640 = ZEXT416((uint)local_2e0);
  local_2e0 = fVar158 - local_2e0;
  fStack_2dc = local_2e0;
  fStack_2d8 = local_2e0;
  fStack_2d4 = local_2e0;
  fStack_2d0 = local_2e0;
  fStack_2cc = local_2e0;
  fStack_2c8 = local_2e0;
  fStack_2c4 = local_2e0;
  local_4f0 = vpbroadcastd_avx512vl();
  uVar64 = 0;
  local_9ac = 1;
  local_500 = vpbroadcastd_avx512vl();
  auVar78 = vsqrtss_avx(local_700,local_700);
  local_9a4 = auVar78._0_4_;
  auVar78 = vsqrtss_avx(local_700,local_700);
  local_9a8 = auVar78._0_4_;
  auVar184 = ZEXT1664(ZEXT816(0x3f80000000000000));
  local_280 = local_240;
  do {
    local_390 = auVar184._0_16_;
    auVar78 = vmovshdup_avx(local_390);
    auVar78 = vsubps_avx(auVar78,local_390);
    local_720._0_4_ = auVar78._0_4_;
    fVar235 = local_720._0_4_ * 0.04761905;
    uVar165 = auVar184._0_4_;
    local_8a0._4_4_ = uVar165;
    local_8a0._0_4_ = uVar165;
    local_8a0._8_4_ = uVar165;
    local_8a0._12_4_ = uVar165;
    local_8a0._16_4_ = uVar165;
    local_8a0._20_4_ = uVar165;
    local_8a0._24_4_ = uVar165;
    local_8a0._28_4_ = uVar165;
    local_720._4_4_ = local_720._0_4_;
    local_720._8_4_ = local_720._0_4_;
    local_720._12_4_ = local_720._0_4_;
    local_720._16_4_ = local_720._0_4_;
    local_720._20_4_ = local_720._0_4_;
    local_720._24_4_ = local_720._0_4_;
    local_720._28_4_ = local_720._0_4_;
    auVar78 = vfmadd231ps_fma(local_8a0,local_720,_DAT_01faff20);
    auVar88 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
    auVar89 = vsubps_avx512vl(auVar88,ZEXT1632(auVar78));
    fVar253 = auVar89._0_4_;
    fVar257 = auVar89._4_4_;
    fVar220 = auVar89._8_4_;
    fVar222 = auVar89._12_4_;
    fVar223 = auVar89._16_4_;
    fVar233 = auVar89._20_4_;
    fVar234 = auVar89._24_4_;
    fVar138 = fVar253 * fVar253 * fVar253;
    fVar159 = fVar257 * fVar257 * fVar257;
    auVar93._4_4_ = fVar159;
    auVar93._0_4_ = fVar138;
    fVar160 = fVar220 * fVar220 * fVar220;
    auVar93._8_4_ = fVar160;
    fVar161 = fVar222 * fVar222 * fVar222;
    auVar93._12_4_ = fVar161;
    fVar162 = fVar223 * fVar223 * fVar223;
    auVar93._16_4_ = fVar162;
    fVar163 = fVar233 * fVar233 * fVar233;
    auVar93._20_4_ = fVar163;
    fVar164 = fVar234 * fVar234 * fVar234;
    auVar93._24_4_ = fVar164;
    auVar93._28_4_ = local_720._0_4_;
    auVar90 = vbroadcastss_avx512vl(ZEXT416(0x40800000));
    auVar91 = vmulps_avx512vl(auVar93,auVar90);
    fVar256 = auVar78._0_4_;
    fVar258 = auVar78._4_4_;
    fVar221 = auVar78._8_4_;
    fVar248 = auVar78._12_4_;
    fVar185 = fVar256 * fVar256 * fVar256;
    fVar210 = fVar258 * fVar258 * fVar258;
    fVar211 = fVar221 * fVar221 * fVar221;
    fVar212 = fVar248 * fVar248 * fVar248;
    auVar113._28_4_ = DAT_01faff20._28_4_;
    auVar113._0_28_ = ZEXT1628(CONCAT412(fVar212,CONCAT48(fVar211,CONCAT44(fVar210,fVar185))));
    auVar184._0_4_ = fVar256 * fVar253;
    auVar184._4_4_ = fVar258 * fVar257;
    auVar184._8_4_ = fVar221 * fVar220;
    auVar184._12_4_ = fVar248 * fVar222;
    auVar184._16_4_ = fVar223 * 0.0;
    auVar184._20_4_ = fVar233 * 0.0;
    auVar184._28_36_ = auVar259._28_36_;
    auVar184._24_4_ = fVar234 * 0.0;
    auVar92 = vmulps_avx512vl(auVar113,auVar90);
    fVar261 = auVar92._28_4_ + local_720._0_4_;
    fVar236 = auVar262._28_4_;
    fVar242 = fVar261 + fVar236 + auVar241._28_4_;
    auVar98._4_4_ = fVar159 * 0.16666667;
    auVar98._0_4_ = fVar138 * 0.16666667;
    auVar98._8_4_ = fVar160 * 0.16666667;
    auVar98._12_4_ = fVar161 * 0.16666667;
    auVar98._16_4_ = fVar162 * 0.16666667;
    auVar98._20_4_ = fVar163 * 0.16666667;
    auVar98._24_4_ = fVar164 * 0.16666667;
    auVar98._28_4_ = fVar261;
    auVar95._4_4_ =
         (auVar184._4_4_ * fVar257 * 12.0 + auVar184._4_4_ * fVar258 * 6.0 + fVar210 + auVar91._4_4_
         ) * 0.16666667;
    auVar95._0_4_ =
         (auVar184._0_4_ * fVar253 * 12.0 + auVar184._0_4_ * fVar256 * 6.0 + fVar185 + auVar91._0_4_
         ) * 0.16666667;
    auVar95._8_4_ =
         (auVar184._8_4_ * fVar220 * 12.0 + auVar184._8_4_ * fVar221 * 6.0 + fVar211 + auVar91._8_4_
         ) * 0.16666667;
    auVar95._12_4_ =
         (auVar184._12_4_ * fVar222 * 12.0 + auVar184._12_4_ * fVar248 * 6.0 +
         fVar212 + auVar91._12_4_) * 0.16666667;
    auVar95._16_4_ =
         (auVar184._16_4_ * fVar223 * 12.0 + auVar184._16_4_ * 0.0 * 6.0 + auVar91._16_4_ + 0.0) *
         0.16666667;
    auVar95._20_4_ =
         (auVar184._20_4_ * fVar233 * 12.0 + auVar184._20_4_ * 0.0 * 6.0 + auVar91._20_4_ + 0.0) *
         0.16666667;
    auVar95._24_4_ =
         (auVar184._24_4_ * fVar234 * 12.0 + auVar184._24_4_ * 0.0 * 6.0 + auVar91._24_4_ + 0.0) *
         0.16666667;
    auVar95._28_4_ = fVar236;
    auVar96._4_4_ =
         (auVar92._4_4_ + fVar159 + auVar184._4_4_ * fVar258 * 12.0 + auVar184._4_4_ * fVar257 * 6.0
         ) * 0.16666667;
    auVar96._0_4_ =
         (auVar92._0_4_ + fVar138 + auVar184._0_4_ * fVar256 * 12.0 + auVar184._0_4_ * fVar253 * 6.0
         ) * 0.16666667;
    auVar96._8_4_ =
         (auVar92._8_4_ + fVar160 + auVar184._8_4_ * fVar221 * 12.0 + auVar184._8_4_ * fVar220 * 6.0
         ) * 0.16666667;
    auVar96._12_4_ =
         (auVar92._12_4_ + fVar161 +
         auVar184._12_4_ * fVar248 * 12.0 + auVar184._12_4_ * fVar222 * 6.0) * 0.16666667;
    auVar96._16_4_ =
         (auVar92._16_4_ + fVar162 + auVar184._16_4_ * 0.0 * 12.0 + auVar184._16_4_ * fVar223 * 6.0)
         * 0.16666667;
    auVar96._20_4_ =
         (auVar92._20_4_ + fVar163 + auVar184._20_4_ * 0.0 * 12.0 + auVar184._20_4_ * fVar233 * 6.0)
         * 0.16666667;
    auVar96._24_4_ =
         (auVar92._24_4_ + fVar164 + auVar184._24_4_ * 0.0 * 12.0 + auVar184._24_4_ * fVar234 * 6.0)
         * 0.16666667;
    auVar96._28_4_ = auVar267._28_4_;
    fVar185 = fVar185 * 0.16666667;
    fVar210 = fVar210 * 0.16666667;
    fVar211 = fVar211 * 0.16666667;
    fVar212 = fVar212 * 0.16666667;
    auVar97._28_4_ = fVar242;
    auVar97._0_28_ = ZEXT1628(CONCAT412(fVar212,CONCAT48(fVar211,CONCAT44(fVar210,fVar185))));
    auVar91 = vmulps_avx512vl(local_260,auVar97);
    auVar92 = vmulps_avx512vl(local_280,auVar97);
    auVar99._4_4_ = local_2a0._4_4_ * fVar210;
    auVar99._0_4_ = local_2a0._0_4_ * fVar185;
    auVar99._8_4_ = local_2a0._8_4_ * fVar211;
    auVar99._12_4_ = local_2a0._12_4_ * fVar212;
    auVar99._16_4_ = local_2a0._16_4_ * 0.0;
    auVar99._20_4_ = local_2a0._20_4_ * 0.0;
    auVar99._24_4_ = local_2a0._24_4_ * 0.0;
    auVar99._28_4_ = local_720._0_4_;
    auVar100._4_4_ = local_2c0._4_4_ * fVar210;
    auVar100._0_4_ = local_2c0._0_4_ * fVar185;
    auVar100._8_4_ = local_2c0._8_4_ * fVar211;
    auVar100._12_4_ = local_2c0._12_4_ * fVar212;
    auVar100._16_4_ = local_2c0._16_4_ * 0.0;
    auVar100._20_4_ = local_2c0._20_4_ * 0.0;
    auVar100._24_4_ = local_2c0._24_4_ * 0.0;
    auVar100._28_4_ = fVar242;
    auVar91 = vfmadd231ps_avx512vl(auVar91,auVar96,auVar279._0_32_);
    auVar92 = vfmadd231ps_avx512vl(auVar92,auVar96,auVar281._0_32_);
    auVar93 = vfmadd231ps_avx512vl(auVar99,auVar96,auVar282._0_32_);
    auVar94 = vfmadd231ps_avx512vl(auVar100,auVar283._0_32_,auVar96);
    auVar91 = vfmadd231ps_avx512vl(auVar91,auVar95,auVar275._0_32_);
    auVar92 = vfmadd231ps_avx512vl(auVar92,auVar95,auVar276._0_32_);
    auVar93 = vfmadd231ps_avx512vl(auVar93,auVar95,auVar277._0_32_);
    auVar94 = vfmadd231ps_avx512vl(auVar94,auVar278._0_32_,auVar95);
    auVar95 = vfmadd231ps_avx512vl(auVar91,auVar98,auVar280._0_32_);
    auVar96 = vfmadd231ps_avx512vl(auVar92,auVar98,auVar272._0_32_);
    auVar97 = vfmadd231ps_avx512vl(auVar93,auVar98,auVar273._0_32_);
    auVar92 = vfmadd231ps_avx512vl(auVar94,auVar274._0_32_,auVar98);
    auVar98 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
    auVar93 = vxorps_avx512vl(auVar89,auVar98);
    auVar91 = vxorps_avx512vl(ZEXT1632(auVar78),auVar98);
    auVar114._0_4_ = auVar91._0_4_ * fVar256;
    auVar114._4_4_ = auVar91._4_4_ * fVar258;
    auVar114._8_4_ = auVar91._8_4_ * fVar221;
    auVar114._12_4_ = auVar91._12_4_ * fVar248;
    auVar114._16_4_ = auVar91._16_4_ * 0.0;
    auVar114._20_4_ = auVar91._20_4_ * 0.0;
    auVar114._24_4_ = auVar91._24_4_ * 0.0;
    auVar114._28_4_ = 0;
    auVar94 = vmulps_avx512vl(auVar184._0_32_,auVar90);
    auVar91 = vsubps_avx(auVar114,auVar94);
    auVar101._4_4_ = auVar93._4_4_ * fVar257 * 0.5;
    auVar101._0_4_ = auVar93._0_4_ * fVar253 * 0.5;
    auVar101._8_4_ = auVar93._8_4_ * fVar220 * 0.5;
    auVar101._12_4_ = auVar93._12_4_ * fVar222 * 0.5;
    auVar101._16_4_ = auVar93._16_4_ * fVar223 * 0.5;
    auVar101._20_4_ = auVar93._20_4_ * fVar233 * 0.5;
    auVar101._24_4_ = auVar93._24_4_ * fVar234 * 0.5;
    auVar101._28_4_ = auVar89._28_4_;
    auVar103._4_4_ = auVar91._4_4_ * 0.5;
    auVar103._0_4_ = auVar91._0_4_ * 0.5;
    auVar103._8_4_ = auVar91._8_4_ * 0.5;
    auVar103._12_4_ = auVar91._12_4_ * 0.5;
    auVar103._16_4_ = auVar91._16_4_ * 0.5;
    auVar103._20_4_ = auVar91._20_4_ * 0.5;
    auVar103._24_4_ = auVar91._24_4_ * 0.5;
    auVar103._28_4_ = auVar91._28_4_;
    auVar104._4_4_ = (auVar94._4_4_ + fVar257 * fVar257) * 0.5;
    auVar104._0_4_ = (auVar94._0_4_ + fVar253 * fVar253) * 0.5;
    auVar104._8_4_ = (auVar94._8_4_ + fVar220 * fVar220) * 0.5;
    auVar104._12_4_ = (auVar94._12_4_ + fVar222 * fVar222) * 0.5;
    auVar104._16_4_ = (auVar94._16_4_ + fVar223 * fVar223) * 0.5;
    auVar104._20_4_ = (auVar94._20_4_ + fVar233 * fVar233) * 0.5;
    auVar104._24_4_ = (auVar94._24_4_ + fVar234 * fVar234) * 0.5;
    auVar104._28_4_ = auVar94._28_4_ + auVar252._28_4_;
    fVar253 = fVar256 * fVar256 * 0.5;
    fVar256 = fVar258 * fVar258 * 0.5;
    fVar257 = fVar221 * fVar221 * 0.5;
    fVar258 = fVar248 * fVar248 * 0.5;
    auVar105._28_4_ = auVar255._28_4_;
    auVar105._0_28_ = ZEXT1628(CONCAT412(fVar258,CONCAT48(fVar257,CONCAT44(fVar256,fVar253))));
    auVar91 = vmulps_avx512vl(local_260,auVar105);
    auVar89 = vmulps_avx512vl(local_280,auVar105);
    auVar109._4_4_ = local_2a0._4_4_ * fVar256;
    auVar109._0_4_ = local_2a0._0_4_ * fVar253;
    auVar109._8_4_ = local_2a0._8_4_ * fVar257;
    auVar109._12_4_ = local_2a0._12_4_ * fVar258;
    auVar109._16_4_ = local_2a0._16_4_ * 0.0;
    auVar109._20_4_ = local_2a0._20_4_ * 0.0;
    auVar109._24_4_ = local_2a0._24_4_ * 0.0;
    auVar109._28_4_ = fVar236;
    auVar110._4_4_ = fVar256 * local_2c0._4_4_;
    auVar110._0_4_ = fVar253 * local_2c0._0_4_;
    auVar110._8_4_ = fVar257 * local_2c0._8_4_;
    auVar110._12_4_ = fVar258 * local_2c0._12_4_;
    auVar110._16_4_ = local_2c0._16_4_ * 0.0;
    auVar110._20_4_ = local_2c0._20_4_ * 0.0;
    auVar110._24_4_ = local_2c0._24_4_ * 0.0;
    auVar110._28_4_ = auVar255._28_4_;
    auVar91 = vfmadd231ps_avx512vl(auVar91,auVar104,auVar279._0_32_);
    auVar89 = vfmadd231ps_avx512vl(auVar89,auVar104,auVar281._0_32_);
    auVar93 = vfmadd231ps_avx512vl(auVar109,auVar104,auVar282._0_32_);
    auVar78 = vfmadd231ps_fma(auVar110,auVar283._0_32_,auVar104);
    auVar91 = vfmadd231ps_avx512vl(auVar91,auVar103,auVar275._0_32_);
    auVar89 = vfmadd231ps_avx512vl(auVar89,auVar103,auVar276._0_32_);
    auVar93 = vfmadd231ps_avx512vl(auVar93,auVar103,auVar277._0_32_);
    auVar94 = vfmadd231ps_avx512vl(ZEXT1632(auVar78),auVar278._0_32_,auVar103);
    auVar91 = vfmadd231ps_avx512vl(auVar91,auVar101,auVar280._0_32_);
    auVar89 = vfmadd231ps_avx512vl(auVar89,auVar101,auVar272._0_32_);
    auVar93 = vfmadd231ps_avx512vl(auVar93,auVar101,auVar273._0_32_);
    auVar94 = vfmadd231ps_avx512vl(auVar94,auVar274._0_32_,auVar101);
    auVar117._4_4_ = auVar91._4_4_ * fVar235;
    auVar117._0_4_ = auVar91._0_4_ * fVar235;
    auVar117._8_4_ = auVar91._8_4_ * fVar235;
    auVar117._12_4_ = auVar91._12_4_ * fVar235;
    auVar117._16_4_ = auVar91._16_4_ * fVar235;
    auVar117._20_4_ = auVar91._20_4_ * fVar235;
    auVar117._24_4_ = auVar91._24_4_ * fVar235;
    auVar117._28_4_ = auVar283._28_4_;
    auVar267 = ZEXT3264(auVar117);
    auVar118._4_4_ = auVar89._4_4_ * fVar235;
    auVar118._0_4_ = auVar89._0_4_ * fVar235;
    auVar118._8_4_ = auVar89._8_4_ * fVar235;
    auVar118._12_4_ = auVar89._12_4_ * fVar235;
    auVar118._16_4_ = auVar89._16_4_ * fVar235;
    auVar118._20_4_ = auVar89._20_4_ * fVar235;
    auVar118._24_4_ = auVar89._24_4_ * fVar235;
    auVar118._28_4_ = 0x3e2aaaab;
    auVar119._4_4_ = auVar93._4_4_ * fVar235;
    auVar119._0_4_ = auVar93._0_4_ * fVar235;
    auVar119._8_4_ = auVar93._8_4_ * fVar235;
    auVar119._12_4_ = auVar93._12_4_ * fVar235;
    auVar119._16_4_ = auVar93._16_4_ * fVar235;
    auVar119._20_4_ = auVar93._20_4_ * fVar235;
    auVar119._24_4_ = auVar93._24_4_ * fVar235;
    auVar119._28_4_ = 0x40c00000;
    fVar253 = auVar94._0_4_ * fVar235;
    fVar256 = auVar94._4_4_ * fVar235;
    auVar111._4_4_ = fVar256;
    auVar111._0_4_ = fVar253;
    fVar257 = auVar94._8_4_ * fVar235;
    auVar111._8_4_ = fVar257;
    fVar258 = auVar94._12_4_ * fVar235;
    auVar111._12_4_ = fVar258;
    fVar220 = auVar94._16_4_ * fVar235;
    auVar111._16_4_ = fVar220;
    fVar221 = auVar94._20_4_ * fVar235;
    auVar111._20_4_ = fVar221;
    fVar222 = auVar94._24_4_ * fVar235;
    auVar111._24_4_ = fVar222;
    auVar111._28_4_ = fVar235;
    auVar78 = vxorps_avx512vl(auVar88._0_16_,auVar88._0_16_);
    auVar99 = vpermt2ps_avx512vl(auVar95,_DAT_01feed00,ZEXT1632(auVar78));
    auVar259 = ZEXT3264(auVar99);
    auVar100 = vpermt2ps_avx512vl(auVar96,_DAT_01feed00,ZEXT1632(auVar78));
    auVar89 = ZEXT1632(auVar78);
    auVar101 = vpermt2ps_avx512vl(auVar97,_DAT_01feed00,auVar89);
    auVar262 = ZEXT3264(auVar101);
    auVar232._0_4_ = fVar253 + auVar92._0_4_;
    auVar232._4_4_ = fVar256 + auVar92._4_4_;
    auVar232._8_4_ = fVar257 + auVar92._8_4_;
    auVar232._12_4_ = fVar258 + auVar92._12_4_;
    auVar232._16_4_ = fVar220 + auVar92._16_4_;
    auVar232._20_4_ = fVar221 + auVar92._20_4_;
    auVar232._24_4_ = fVar222 + auVar92._24_4_;
    auVar232._28_4_ = fVar235 + auVar92._28_4_;
    auVar91 = vmaxps_avx(auVar92,auVar232);
    auVar88 = vminps_avx(auVar92,auVar232);
    auVar102 = vpermt2ps_avx512vl(auVar92,_DAT_01feed00,auVar89);
    auVar103 = vpermt2ps_avx512vl(auVar117,_DAT_01feed00,auVar89);
    auVar255 = ZEXT3264(auVar103);
    auVar104 = vpermt2ps_avx512vl(auVar118,_DAT_01feed00,auVar89);
    auVar232 = ZEXT1632(auVar78);
    auVar105 = vpermt2ps_avx512vl(auVar119,_DAT_01feed00,auVar232);
    auVar89 = vpermt2ps_avx512vl(auVar111,_DAT_01feed00,auVar232);
    auVar106 = vsubps_avx512vl(auVar102,auVar89);
    auVar89 = vsubps_avx(auVar99,auVar95);
    auVar252 = ZEXT3264(auVar89);
    auVar92 = vsubps_avx(auVar100,auVar96);
    auVar93 = vsubps_avx(auVar101,auVar97);
    auVar241 = ZEXT3264(auVar93);
    auVar94 = vmulps_avx512vl(auVar92,auVar119);
    auVar94 = vfmsub231ps_avx512vl(auVar94,auVar118,auVar93);
    auVar107 = vmulps_avx512vl(auVar93,auVar117);
    auVar107 = vfmsub231ps_avx512vl(auVar107,auVar119,auVar89);
    auVar108 = vmulps_avx512vl(auVar89,auVar118);
    auVar108 = vfmsub231ps_avx512vl(auVar108,auVar117,auVar92);
    auVar108 = vmulps_avx512vl(auVar108,auVar108);
    auVar107 = vfmadd231ps_avx512vl(auVar108,auVar107,auVar107);
    auVar107 = vfmadd231ps_avx512vl(auVar107,auVar94,auVar94);
    auVar94 = vmulps_avx512vl(auVar93,auVar93);
    auVar94 = vfmadd231ps_avx512vl(auVar94,auVar92,auVar92);
    auVar108 = vfmadd231ps_avx512vl(auVar94,auVar89,auVar89);
    auVar109 = vrcp14ps_avx512vl(auVar108);
    auVar94._8_4_ = 0x3f800000;
    auVar94._0_8_ = 0x3f8000003f800000;
    auVar94._12_4_ = 0x3f800000;
    auVar94._16_4_ = 0x3f800000;
    auVar94._20_4_ = 0x3f800000;
    auVar94._24_4_ = 0x3f800000;
    auVar94._28_4_ = 0x3f800000;
    auVar94 = vfnmadd213ps_avx512vl(auVar109,auVar108,auVar94);
    auVar94 = vfmadd132ps_avx512vl(auVar94,auVar109,auVar109);
    auVar107 = vmulps_avx512vl(auVar107,auVar94);
    auVar109 = vmulps_avx512vl(auVar92,auVar105);
    auVar109 = vfmsub231ps_avx512vl(auVar109,auVar104,auVar93);
    auVar110 = vmulps_avx512vl(auVar93,auVar103);
    auVar110 = vfmsub231ps_avx512vl(auVar110,auVar105,auVar89);
    auVar111 = vmulps_avx512vl(auVar89,auVar104);
    auVar111 = vfmsub231ps_avx512vl(auVar111,auVar103,auVar92);
    auVar111 = vmulps_avx512vl(auVar111,auVar111);
    auVar110 = vfmadd231ps_avx512vl(auVar111,auVar110,auVar110);
    auVar109 = vfmadd231ps_avx512vl(auVar110,auVar109,auVar109);
    auVar94 = vmulps_avx512vl(auVar109,auVar94);
    auVar94 = vmaxps_avx512vl(auVar107,auVar94);
    auVar94 = vsqrtps_avx512vl(auVar94);
    auVar107 = vmaxps_avx512vl(auVar106,auVar102);
    auVar91 = vmaxps_avx512vl(auVar91,auVar107);
    auVar109 = vaddps_avx512vl(auVar94,auVar91);
    auVar91 = vminps_avx512vl(auVar106,auVar102);
    auVar91 = vminps_avx(auVar88,auVar91);
    auVar91 = vsubps_avx512vl(auVar91,auVar94);
    auVar102._8_4_ = 0x3f800002;
    auVar102._0_8_ = 0x3f8000023f800002;
    auVar102._12_4_ = 0x3f800002;
    auVar102._16_4_ = 0x3f800002;
    auVar102._20_4_ = 0x3f800002;
    auVar102._24_4_ = 0x3f800002;
    auVar102._28_4_ = 0x3f800002;
    auVar88 = vmulps_avx512vl(auVar109,auVar102);
    auVar106._8_4_ = 0x3f7ffffc;
    auVar106._0_8_ = 0x3f7ffffc3f7ffffc;
    auVar106._12_4_ = 0x3f7ffffc;
    auVar106._16_4_ = 0x3f7ffffc;
    auVar106._20_4_ = 0x3f7ffffc;
    auVar106._24_4_ = 0x3f7ffffc;
    auVar106._28_4_ = 0x3f7ffffc;
    auVar91 = vmulps_avx512vl(auVar91,auVar106);
    auVar88 = vmulps_avx512vl(auVar88,auVar88);
    auVar94 = vrsqrt14ps_avx512vl(auVar108);
    auVar107._8_4_ = 0xbf000000;
    auVar107._0_8_ = 0xbf000000bf000000;
    auVar107._12_4_ = 0xbf000000;
    auVar107._16_4_ = 0xbf000000;
    auVar107._20_4_ = 0xbf000000;
    auVar107._24_4_ = 0xbf000000;
    auVar107._28_4_ = 0xbf000000;
    auVar102 = vmulps_avx512vl(auVar108,auVar107);
    fVar253 = auVar94._0_4_;
    fVar256 = auVar94._4_4_;
    fVar257 = auVar94._8_4_;
    fVar258 = auVar94._12_4_;
    fVar220 = auVar94._16_4_;
    fVar221 = auVar94._20_4_;
    fVar222 = auVar94._24_4_;
    auVar112._4_4_ = fVar256 * fVar256 * fVar256 * auVar102._4_4_;
    auVar112._0_4_ = fVar253 * fVar253 * fVar253 * auVar102._0_4_;
    auVar112._8_4_ = fVar257 * fVar257 * fVar257 * auVar102._8_4_;
    auVar112._12_4_ = fVar258 * fVar258 * fVar258 * auVar102._12_4_;
    auVar112._16_4_ = fVar220 * fVar220 * fVar220 * auVar102._16_4_;
    auVar112._20_4_ = fVar221 * fVar221 * fVar221 * auVar102._20_4_;
    auVar112._24_4_ = fVar222 * fVar222 * fVar222 * auVar102._24_4_;
    auVar112._28_4_ = auVar109._28_4_;
    auVar108._8_4_ = 0x3fc00000;
    auVar108._0_8_ = 0x3fc000003fc00000;
    auVar108._12_4_ = 0x3fc00000;
    auVar108._16_4_ = 0x3fc00000;
    auVar108._20_4_ = 0x3fc00000;
    auVar108._24_4_ = 0x3fc00000;
    auVar108._28_4_ = 0x3fc00000;
    auVar94 = vfmadd231ps_avx512vl(auVar112,auVar94,auVar108);
    auVar102 = vmulps_avx512vl(auVar89,auVar94);
    auVar106 = vmulps_avx512vl(auVar92,auVar94);
    auVar107 = vmulps_avx512vl(auVar93,auVar94);
    auVar108 = vsubps_avx512vl(auVar232,auVar95);
    auVar109 = vsubps_avx512vl(auVar232,auVar96);
    auVar110 = vsubps_avx512vl(auVar232,auVar97);
    auVar111 = vmulps_avx512vl(local_440,auVar110);
    auVar111 = vfmadd231ps_avx512vl(auVar111,local_420,auVar109);
    auVar111 = vfmadd231ps_avx512vl(auVar111,_local_400,auVar108);
    auVar112 = vmulps_avx512vl(auVar110,auVar110);
    auVar112 = vfmadd231ps_avx512vl(auVar112,auVar109,auVar109);
    auVar112 = vfmadd231ps_avx512vl(auVar112,auVar108,auVar108);
    auVar113 = vmulps_avx512vl(local_440,auVar107);
    auVar113 = vfmadd231ps_avx512vl(auVar113,auVar106,local_420);
    auVar113 = vfmadd231ps_avx512vl(auVar113,auVar102,_local_400);
    auVar107 = vmulps_avx512vl(auVar110,auVar107);
    auVar106 = vfmadd231ps_avx512vl(auVar107,auVar109,auVar106);
    auVar102 = vfmadd231ps_avx512vl(auVar106,auVar108,auVar102);
    auVar106 = vmulps_avx512vl(auVar113,auVar113);
    auVar107 = vsubps_avx512vl(local_220,auVar106);
    auVar114 = vmulps_avx512vl(auVar113,auVar102);
    auVar111 = vsubps_avx512vl(auVar111,auVar114);
    auVar111 = vaddps_avx512vl(auVar111,auVar111);
    auVar114 = vmulps_avx512vl(auVar102,auVar102);
    local_740 = vsubps_avx512vl(auVar112,auVar114);
    auVar88 = vsubps_avx512vl(local_740,auVar88);
    local_780 = vmulps_avx512vl(auVar111,auVar111);
    _local_7a0 = vmulps_avx512vl(auVar107,auVar90);
    auVar112 = vmulps_avx512vl(_local_7a0,auVar88);
    auVar112 = vsubps_avx512vl(local_780,auVar112);
    auVar78 = vxorps_avx512vl(auVar90._0_16_,auVar90._0_16_);
    uVar70 = vcmpps_avx512vl(auVar112,auVar232,5);
    bVar61 = (byte)uVar70;
    fVar253 = (float)local_6e0._0_4_;
    fVar256 = (float)local_6e0._4_4_;
    fVar257 = fStack_6d8;
    fVar258 = fStack_6d4;
    fVar220 = fStack_6d0;
    fVar221 = fStack_6cc;
    fVar222 = fStack_6c8;
    fVar248 = fStack_6c4;
    if (bVar61 == 0) {
LAB_01b9f3fa:
      auVar280 = ZEXT3264(local_8e0);
      auVar272 = ZEXT3264(local_900);
      auVar273 = ZEXT3264(local_920);
      auVar274 = ZEXT3264(local_940);
      auVar275 = ZEXT3264(local_7e0);
      auVar276 = ZEXT3264(local_960);
      auVar277 = ZEXT3264(local_800);
      auVar278 = ZEXT3264(local_980);
      auVar279 = ZEXT3264(local_9a0);
      auVar281 = ZEXT3264(local_820);
      auVar282 = ZEXT3264(local_840);
      auVar283 = ZEXT3264(local_8c0);
    }
    else {
      auVar112 = vsqrtps_avx512vl(auVar112);
      auVar114 = vaddps_avx512vl(auVar107,auVar107);
      _local_560 = vrcp14ps_avx512vl(auVar114);
      auVar90._8_4_ = 0x3f800000;
      auVar90._0_8_ = 0x3f8000003f800000;
      auVar90._12_4_ = 0x3f800000;
      auVar90._16_4_ = 0x3f800000;
      auVar90._20_4_ = 0x3f800000;
      auVar90._24_4_ = 0x3f800000;
      auVar90._28_4_ = 0x3f800000;
      auVar90 = vfnmadd213ps_avx512vl(_local_560,auVar114,auVar90);
      auVar90 = vfmadd132ps_avx512vl(auVar90,_local_560,_local_560);
      local_580 = vxorps_avx512vl(auVar111,auVar98);
      auVar98 = vsubps_avx512vl(local_580,auVar112);
      local_7c0 = vmulps_avx512vl(auVar98,auVar90);
      auVar98 = vsubps_avx512vl(auVar112,auVar111);
      local_540 = vmulps_avx512vl(auVar98,auVar90);
      auVar98 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
      auVar112 = vblendmps_avx512vl(auVar98,local_7c0);
      auVar115._0_4_ =
           (uint)(bVar61 & 1) * auVar112._0_4_ | (uint)!(bool)(bVar61 & 1) * auVar98._0_4_;
      bVar9 = (bool)((byte)(uVar70 >> 1) & 1);
      auVar115._4_4_ = (uint)bVar9 * auVar112._4_4_ | (uint)!bVar9 * auVar98._4_4_;
      bVar9 = (bool)((byte)(uVar70 >> 2) & 1);
      auVar115._8_4_ = (uint)bVar9 * auVar112._8_4_ | (uint)!bVar9 * auVar98._8_4_;
      bVar9 = (bool)((byte)(uVar70 >> 3) & 1);
      auVar115._12_4_ = (uint)bVar9 * auVar112._12_4_ | (uint)!bVar9 * auVar98._12_4_;
      bVar9 = (bool)((byte)(uVar70 >> 4) & 1);
      auVar115._16_4_ = (uint)bVar9 * auVar112._16_4_ | (uint)!bVar9 * auVar98._16_4_;
      bVar9 = (bool)((byte)(uVar70 >> 5) & 1);
      auVar115._20_4_ = (uint)bVar9 * auVar112._20_4_ | (uint)!bVar9 * auVar98._20_4_;
      bVar9 = (bool)((byte)(uVar70 >> 6) & 1);
      auVar115._24_4_ = (uint)bVar9 * auVar112._24_4_ | (uint)!bVar9 * auVar98._24_4_;
      bVar9 = SUB81(uVar70 >> 7,0);
      auVar115._28_4_ = (uint)bVar9 * auVar112._28_4_ | (uint)!bVar9 * auVar98._28_4_;
      auVar98 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
      auVar112 = vblendmps_avx512vl(auVar98,local_540);
      auVar116._0_4_ =
           (uint)(bVar61 & 1) * auVar112._0_4_ | (uint)!(bool)(bVar61 & 1) * auVar98._0_4_;
      bVar9 = (bool)((byte)(uVar70 >> 1) & 1);
      auVar116._4_4_ = (uint)bVar9 * auVar112._4_4_ | (uint)!bVar9 * auVar98._4_4_;
      bVar9 = (bool)((byte)(uVar70 >> 2) & 1);
      auVar116._8_4_ = (uint)bVar9 * auVar112._8_4_ | (uint)!bVar9 * auVar98._8_4_;
      bVar9 = (bool)((byte)(uVar70 >> 3) & 1);
      auVar116._12_4_ = (uint)bVar9 * auVar112._12_4_ | (uint)!bVar9 * auVar98._12_4_;
      bVar9 = (bool)((byte)(uVar70 >> 4) & 1);
      auVar116._16_4_ = (uint)bVar9 * auVar112._16_4_ | (uint)!bVar9 * auVar98._16_4_;
      bVar9 = (bool)((byte)(uVar70 >> 5) & 1);
      auVar116._20_4_ = (uint)bVar9 * auVar112._20_4_ | (uint)!bVar9 * auVar98._20_4_;
      bVar9 = (bool)((byte)(uVar70 >> 6) & 1);
      auVar116._24_4_ = (uint)bVar9 * auVar112._24_4_ | (uint)!bVar9 * auVar98._24_4_;
      bVar9 = SUB81(uVar70 >> 7,0);
      auVar116._28_4_ = (uint)bVar9 * auVar112._28_4_ | (uint)!bVar9 * auVar98._28_4_;
      auVar98 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
      vandps_avx512vl(auVar106,auVar98);
      local_5a0 = vmaxps_avx512vl(local_240,auVar98);
      auVar35._8_4_ = 0x36000000;
      auVar35._0_8_ = 0x3600000036000000;
      auVar35._12_4_ = 0x36000000;
      auVar35._16_4_ = 0x36000000;
      auVar35._20_4_ = 0x36000000;
      auVar35._24_4_ = 0x36000000;
      auVar35._28_4_ = 0x36000000;
      local_5c0 = vmulps_avx512vl(local_5a0,auVar35);
      vandps_avx512vl(auVar107,auVar98);
      uVar71 = vcmpps_avx512vl(local_5c0,local_5c0,1);
      uVar70 = uVar70 & uVar71;
      bVar65 = (byte)uVar70;
      if (bVar65 != 0) {
        uVar71 = vcmpps_avx512vl(auVar88,ZEXT1632(auVar78),2);
        auVar88 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
        auVar106 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
        auVar107 = vblendmps_avx512vl(auVar88,auVar106);
        bVar67 = (byte)uVar71;
        uVar73 = (uint)(bVar67 & 1) * auVar107._0_4_ | (uint)!(bool)(bVar67 & 1) * local_5c0._0_4_;
        bVar9 = (bool)((byte)(uVar71 >> 1) & 1);
        uVar72 = (uint)bVar9 * auVar107._4_4_ | (uint)!bVar9 * local_5c0._4_4_;
        bVar9 = (bool)((byte)(uVar71 >> 2) & 1);
        uVar131 = (uint)bVar9 * auVar107._8_4_ | (uint)!bVar9 * local_5c0._8_4_;
        bVar9 = (bool)((byte)(uVar71 >> 3) & 1);
        uVar132 = (uint)bVar9 * auVar107._12_4_ | (uint)!bVar9 * local_5c0._12_4_;
        bVar9 = (bool)((byte)(uVar71 >> 4) & 1);
        uVar133 = (uint)bVar9 * auVar107._16_4_ | (uint)!bVar9 * local_5c0._16_4_;
        bVar9 = (bool)((byte)(uVar71 >> 5) & 1);
        uVar134 = (uint)bVar9 * auVar107._20_4_ | (uint)!bVar9 * local_5c0._20_4_;
        bVar9 = (bool)((byte)(uVar71 >> 6) & 1);
        uVar135 = (uint)bVar9 * auVar107._24_4_ | (uint)!bVar9 * local_5c0._24_4_;
        bVar9 = SUB81(uVar71 >> 7,0);
        uVar136 = (uint)bVar9 * auVar107._28_4_ | (uint)!bVar9 * local_5c0._28_4_;
        auVar115._0_4_ = (bVar65 & 1) * uVar73 | !(bool)(bVar65 & 1) * auVar115._0_4_;
        bVar9 = (bool)((byte)(uVar70 >> 1) & 1);
        auVar115._4_4_ = bVar9 * uVar72 | !bVar9 * auVar115._4_4_;
        bVar9 = (bool)((byte)(uVar70 >> 2) & 1);
        auVar115._8_4_ = bVar9 * uVar131 | !bVar9 * auVar115._8_4_;
        bVar9 = (bool)((byte)(uVar70 >> 3) & 1);
        auVar115._12_4_ = bVar9 * uVar132 | !bVar9 * auVar115._12_4_;
        bVar9 = (bool)((byte)(uVar70 >> 4) & 1);
        auVar115._16_4_ = bVar9 * uVar133 | !bVar9 * auVar115._16_4_;
        bVar9 = (bool)((byte)(uVar70 >> 5) & 1);
        auVar115._20_4_ = bVar9 * uVar134 | !bVar9 * auVar115._20_4_;
        bVar9 = (bool)((byte)(uVar70 >> 6) & 1);
        auVar115._24_4_ = bVar9 * uVar135 | !bVar9 * auVar115._24_4_;
        bVar9 = SUB81(uVar70 >> 7,0);
        auVar115._28_4_ = bVar9 * uVar136 | !bVar9 * auVar115._28_4_;
        auVar88 = vblendmps_avx512vl(auVar106,auVar88);
        bVar9 = (bool)((byte)(uVar71 >> 1) & 1);
        bVar11 = (bool)((byte)(uVar71 >> 2) & 1);
        bVar12 = (bool)((byte)(uVar71 >> 3) & 1);
        bVar13 = (bool)((byte)(uVar71 >> 4) & 1);
        bVar14 = (bool)((byte)(uVar71 >> 5) & 1);
        bVar15 = (bool)((byte)(uVar71 >> 6) & 1);
        bVar16 = SUB81(uVar71 >> 7,0);
        auVar116._0_4_ =
             (uint)(bVar65 & 1) *
             ((uint)(bVar67 & 1) * auVar88._0_4_ | !(bool)(bVar67 & 1) * uVar73) |
             !(bool)(bVar65 & 1) * auVar116._0_4_;
        bVar10 = (bool)((byte)(uVar70 >> 1) & 1);
        auVar116._4_4_ =
             (uint)bVar10 * ((uint)bVar9 * auVar88._4_4_ | !bVar9 * uVar72) |
             !bVar10 * auVar116._4_4_;
        bVar9 = (bool)((byte)(uVar70 >> 2) & 1);
        auVar116._8_4_ =
             (uint)bVar9 * ((uint)bVar11 * auVar88._8_4_ | !bVar11 * uVar131) |
             !bVar9 * auVar116._8_4_;
        bVar9 = (bool)((byte)(uVar70 >> 3) & 1);
        auVar116._12_4_ =
             (uint)bVar9 * ((uint)bVar12 * auVar88._12_4_ | !bVar12 * uVar132) |
             !bVar9 * auVar116._12_4_;
        bVar9 = (bool)((byte)(uVar70 >> 4) & 1);
        auVar116._16_4_ =
             (uint)bVar9 * ((uint)bVar13 * auVar88._16_4_ | !bVar13 * uVar133) |
             !bVar9 * auVar116._16_4_;
        bVar9 = (bool)((byte)(uVar70 >> 5) & 1);
        auVar116._20_4_ =
             (uint)bVar9 * ((uint)bVar14 * auVar88._20_4_ | !bVar14 * uVar134) |
             !bVar9 * auVar116._20_4_;
        bVar9 = (bool)((byte)(uVar70 >> 6) & 1);
        auVar116._24_4_ =
             (uint)bVar9 * ((uint)bVar15 * auVar88._24_4_ | !bVar15 * uVar135) |
             !bVar9 * auVar116._24_4_;
        bVar9 = SUB81(uVar70 >> 7,0);
        auVar116._28_4_ =
             (uint)bVar9 * ((uint)bVar16 * auVar88._28_4_ | !bVar16 * uVar136) |
             !bVar9 * auVar116._28_4_;
        bVar61 = (~bVar65 | bVar67) & bVar61;
      }
      auVar283 = ZEXT3264(local_8c0);
      if ((bVar61 & 0x7f) == 0) {
        auVar280 = ZEXT3264(local_8e0);
        auVar272 = ZEXT3264(local_900);
        auVar273 = ZEXT3264(local_920);
        auVar274 = ZEXT3264(local_940);
        auVar275 = ZEXT3264(local_7e0);
        auVar276 = ZEXT3264(local_960);
        auVar277 = ZEXT3264(local_800);
        auVar278 = ZEXT3264(local_980);
        auVar279 = ZEXT3264(local_9a0);
        auVar281 = ZEXT3264(local_820);
        auVar282 = ZEXT3264(local_840);
      }
      else {
        auVar88 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
        auVar106 = vxorps_avx512vl(auVar105,auVar88);
        auVar107 = vxorps_avx512vl(auVar103,auVar88);
        uVar73 = *(uint *)(ray + k * 4 + 0x80);
        auVar98 = vxorps_avx512vl(auVar104,auVar88);
        auVar78 = vsubss_avx512f(ZEXT416(uVar73),ZEXT416((uint)local_640._0_4_));
        auVar103 = vbroadcastss_avx512vl(auVar78);
        auVar103 = vminps_avx512vl(auVar103,auVar116);
        auVar60._4_4_ = fStack_2dc;
        auVar60._0_4_ = local_2e0;
        auVar60._8_4_ = fStack_2d8;
        auVar60._12_4_ = fStack_2d4;
        auVar60._16_4_ = fStack_2d0;
        auVar60._20_4_ = fStack_2cc;
        auVar60._24_4_ = fStack_2c8;
        auVar60._28_4_ = fStack_2c4;
        auVar104 = vmaxps_avx512vl(auVar60,auVar115);
        auVar105 = vmulps_avx512vl(auVar119,auVar110);
        auVar105 = vfmadd213ps_avx512vl(auVar109,auVar118,auVar105);
        auVar78 = vfmadd213ps_fma(auVar108,auVar117,auVar105);
        auVar108 = vmulps_avx512vl(local_440,auVar119);
        auVar108 = vfmadd231ps_avx512vl(auVar108,local_420,auVar118);
        auVar77 = vfmadd231ps_fma(auVar108,_local_400,auVar117);
        auVar108 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
        vandps_avx512vl(ZEXT1632(auVar77),auVar108);
        auVar105 = vbroadcastss_avx512vl(ZEXT416(0x219392ef));
        uVar17 = vcmpps_avx512vl(auVar108,auVar105,1);
        auVar109 = vxorps_avx512vl(ZEXT1632(auVar78),auVar88);
        auVar110 = vrcp14ps_avx512vl(ZEXT1632(auVar77));
        auVar90 = ZEXT1632(auVar77);
        auVar117 = vxorps_avx512vl(auVar90,auVar88);
        auVar118 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
        auVar119 = vfnmadd213ps_avx512vl(auVar110,auVar90,auVar118);
        auVar78 = vfmadd132ps_fma(auVar119,auVar110,auVar110);
        fVar223 = auVar78._0_4_ * auVar109._0_4_;
        fVar233 = auVar78._4_4_ * auVar109._4_4_;
        auVar40._4_4_ = fVar233;
        auVar40._0_4_ = fVar223;
        fVar234 = auVar78._8_4_ * auVar109._8_4_;
        auVar40._8_4_ = fVar234;
        fVar235 = auVar78._12_4_ * auVar109._12_4_;
        auVar40._12_4_ = fVar235;
        fVar236 = auVar109._16_4_ * 0.0;
        auVar40._16_4_ = fVar236;
        fVar138 = auVar109._20_4_ * 0.0;
        auVar40._20_4_ = fVar138;
        fVar159 = auVar109._24_4_ * 0.0;
        auVar40._24_4_ = fVar159;
        auVar40._28_4_ = auVar109._28_4_;
        uVar18 = vcmpps_avx512vl(auVar90,auVar117,1);
        bVar65 = (byte)uVar17 | (byte)uVar18;
        auVar119 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
        auVar112 = vblendmps_avx512vl(auVar40,auVar119);
        auVar120._0_4_ =
             (uint)(bVar65 & 1) * auVar112._0_4_ | (uint)!(bool)(bVar65 & 1) * auVar110._0_4_;
        bVar9 = (bool)(bVar65 >> 1 & 1);
        auVar120._4_4_ = (uint)bVar9 * auVar112._4_4_ | (uint)!bVar9 * auVar110._4_4_;
        bVar9 = (bool)(bVar65 >> 2 & 1);
        auVar120._8_4_ = (uint)bVar9 * auVar112._8_4_ | (uint)!bVar9 * auVar110._8_4_;
        bVar9 = (bool)(bVar65 >> 3 & 1);
        auVar120._12_4_ = (uint)bVar9 * auVar112._12_4_ | (uint)!bVar9 * auVar110._12_4_;
        bVar9 = (bool)(bVar65 >> 4 & 1);
        auVar120._16_4_ = (uint)bVar9 * auVar112._16_4_ | (uint)!bVar9 * auVar110._16_4_;
        bVar9 = (bool)(bVar65 >> 5 & 1);
        auVar120._20_4_ = (uint)bVar9 * auVar112._20_4_ | (uint)!bVar9 * auVar110._20_4_;
        bVar9 = (bool)(bVar65 >> 6 & 1);
        auVar120._24_4_ = (uint)bVar9 * auVar112._24_4_ | (uint)!bVar9 * auVar110._24_4_;
        auVar120._28_4_ =
             (uint)(bVar65 >> 7) * auVar112._28_4_ | (uint)!(bool)(bVar65 >> 7) * auVar110._28_4_;
        auVar110 = vmaxps_avx512vl(auVar104,auVar120);
        auVar267 = ZEXT3264(auVar110);
        uVar18 = vcmpps_avx512vl(auVar90,auVar117,6);
        bVar65 = (byte)uVar17 | (byte)uVar18;
        auVar121._0_4_ = (uint)(bVar65 & 1) * 0x7f800000 | (uint)!(bool)(bVar65 & 1) * (int)fVar223;
        bVar9 = (bool)(bVar65 >> 1 & 1);
        auVar121._4_4_ = (uint)bVar9 * 0x7f800000 | (uint)!bVar9 * (int)fVar233;
        bVar9 = (bool)(bVar65 >> 2 & 1);
        auVar121._8_4_ = (uint)bVar9 * 0x7f800000 | (uint)!bVar9 * (int)fVar234;
        bVar9 = (bool)(bVar65 >> 3 & 1);
        auVar121._12_4_ = (uint)bVar9 * 0x7f800000 | (uint)!bVar9 * (int)fVar235;
        bVar9 = (bool)(bVar65 >> 4 & 1);
        auVar121._16_4_ = (uint)bVar9 * 0x7f800000 | (uint)!bVar9 * (int)fVar236;
        bVar9 = (bool)(bVar65 >> 5 & 1);
        auVar121._20_4_ = (uint)bVar9 * 0x7f800000 | (uint)!bVar9 * (int)fVar138;
        bVar9 = (bool)(bVar65 >> 6 & 1);
        auVar121._24_4_ = (uint)bVar9 * 0x7f800000 | (uint)!bVar9 * (int)fVar159;
        auVar121._28_4_ =
             (uint)(bVar65 >> 7) * 0x7f800000 | (uint)!(bool)(bVar65 >> 7) * auVar109._28_4_;
        auVar109 = vminps_avx512vl(auVar103,auVar121);
        auVar78 = vxorps_avx512vl(auVar104._0_16_,auVar104._0_16_);
        auVar99 = vsubps_avx512vl(ZEXT1632(auVar78),auVar99);
        auVar100 = vsubps_avx512vl(ZEXT1632(auVar78),auVar100);
        auVar104 = ZEXT1632(auVar78);
        auVar101 = vsubps_avx512vl(auVar104,auVar101);
        auVar101 = vmulps_avx512vl(auVar101,auVar106);
        auVar100 = vfmadd231ps_avx512vl(auVar101,auVar98,auVar100);
        auVar99 = vfmadd231ps_avx512vl(auVar100,auVar107,auVar99);
        auVar106 = vmulps_avx512vl(local_440,auVar106);
        auVar106 = vfmadd231ps_avx512vl(auVar106,local_420,auVar98);
        auVar106 = vfmadd231ps_avx512vl(auVar106,_local_400,auVar107);
        vandps_avx512vl(auVar106,auVar108);
        uVar17 = vcmpps_avx512vl(auVar106,auVar105,1);
        auVar107 = vxorps_avx512vl(auVar99,auVar88);
        auVar108 = vrcp14ps_avx512vl(auVar106);
        auVar88 = vxorps_avx512vl(auVar106,auVar88);
        auVar262 = ZEXT3264(auVar88);
        auVar98 = vfnmadd213ps_avx512vl(auVar108,auVar106,auVar118);
        auVar78 = vfmadd132ps_fma(auVar98,auVar108,auVar108);
        fVar223 = auVar78._0_4_ * auVar107._0_4_;
        fVar233 = auVar78._4_4_ * auVar107._4_4_;
        auVar41._4_4_ = fVar233;
        auVar41._0_4_ = fVar223;
        fVar234 = auVar78._8_4_ * auVar107._8_4_;
        auVar41._8_4_ = fVar234;
        fVar235 = auVar78._12_4_ * auVar107._12_4_;
        auVar41._12_4_ = fVar235;
        fVar236 = auVar107._16_4_ * 0.0;
        auVar41._16_4_ = fVar236;
        fVar138 = auVar107._20_4_ * 0.0;
        auVar41._20_4_ = fVar138;
        fVar159 = auVar107._24_4_ * 0.0;
        auVar41._24_4_ = fVar159;
        auVar41._28_4_ = auVar107._28_4_;
        uVar18 = vcmpps_avx512vl(auVar106,auVar88,1);
        bVar65 = (byte)uVar17 | (byte)uVar18;
        auVar98 = vblendmps_avx512vl(auVar41,auVar119);
        auVar122._0_4_ =
             (uint)(bVar65 & 1) * auVar98._0_4_ | (uint)!(bool)(bVar65 & 1) * auVar108._0_4_;
        bVar9 = (bool)(bVar65 >> 1 & 1);
        auVar122._4_4_ = (uint)bVar9 * auVar98._4_4_ | (uint)!bVar9 * auVar108._4_4_;
        bVar9 = (bool)(bVar65 >> 2 & 1);
        auVar122._8_4_ = (uint)bVar9 * auVar98._8_4_ | (uint)!bVar9 * auVar108._8_4_;
        bVar9 = (bool)(bVar65 >> 3 & 1);
        auVar122._12_4_ = (uint)bVar9 * auVar98._12_4_ | (uint)!bVar9 * auVar108._12_4_;
        bVar9 = (bool)(bVar65 >> 4 & 1);
        auVar122._16_4_ = (uint)bVar9 * auVar98._16_4_ | (uint)!bVar9 * auVar108._16_4_;
        bVar9 = (bool)(bVar65 >> 5 & 1);
        auVar122._20_4_ = (uint)bVar9 * auVar98._20_4_ | (uint)!bVar9 * auVar108._20_4_;
        bVar9 = (bool)(bVar65 >> 6 & 1);
        auVar122._24_4_ = (uint)bVar9 * auVar98._24_4_ | (uint)!bVar9 * auVar108._24_4_;
        auVar122._28_4_ =
             (uint)(bVar65 >> 7) * auVar98._28_4_ | (uint)!(bool)(bVar65 >> 7) * auVar108._28_4_;
        _local_5e0 = vmaxps_avx(auVar110,auVar122);
        auVar255 = ZEXT3264(_local_5e0);
        uVar18 = vcmpps_avx512vl(auVar106,auVar88,6);
        bVar65 = (byte)uVar17 | (byte)uVar18;
        auVar123._0_4_ = (uint)(bVar65 & 1) * 0x7f800000 | (uint)!(bool)(bVar65 & 1) * (int)fVar223;
        bVar9 = (bool)(bVar65 >> 1 & 1);
        auVar123._4_4_ = (uint)bVar9 * 0x7f800000 | (uint)!bVar9 * (int)fVar233;
        bVar9 = (bool)(bVar65 >> 2 & 1);
        auVar123._8_4_ = (uint)bVar9 * 0x7f800000 | (uint)!bVar9 * (int)fVar234;
        bVar9 = (bool)(bVar65 >> 3 & 1);
        auVar123._12_4_ = (uint)bVar9 * 0x7f800000 | (uint)!bVar9 * (int)fVar235;
        bVar9 = (bool)(bVar65 >> 4 & 1);
        auVar123._16_4_ = (uint)bVar9 * 0x7f800000 | (uint)!bVar9 * (int)fVar236;
        bVar9 = (bool)(bVar65 >> 5 & 1);
        auVar123._20_4_ = (uint)bVar9 * 0x7f800000 | (uint)!bVar9 * (int)fVar138;
        bVar9 = (bool)(bVar65 >> 6 & 1);
        auVar123._24_4_ = (uint)bVar9 * 0x7f800000 | (uint)!bVar9 * (int)fVar159;
        auVar123._28_4_ =
             (uint)(bVar65 >> 7) * 0x7f800000 | (uint)!(bool)(bVar65 >> 7) * auVar107._28_4_;
        local_340 = vminps_avx(auVar109,auVar123);
        auVar259 = ZEXT3264(local_340);
        uVar17 = vcmpps_avx512vl(_local_5e0,local_340,2);
        bVar61 = bVar61 & 0x7f & (byte)uVar17;
        if (bVar61 == 0) goto LAB_01b9f3fa;
        auVar88 = vmaxps_avx512vl(auVar104,auVar91);
        auVar91 = vfmadd213ps_avx512vl(local_7c0,auVar113,auVar102);
        fVar223 = auVar94._0_4_;
        fVar233 = auVar94._4_4_;
        auVar42._4_4_ = fVar233 * auVar91._4_4_;
        auVar42._0_4_ = fVar223 * auVar91._0_4_;
        fVar234 = auVar94._8_4_;
        auVar42._8_4_ = fVar234 * auVar91._8_4_;
        fVar235 = auVar94._12_4_;
        auVar42._12_4_ = fVar235 * auVar91._12_4_;
        fVar236 = auVar94._16_4_;
        auVar42._16_4_ = fVar236 * auVar91._16_4_;
        fVar138 = auVar94._20_4_;
        auVar42._20_4_ = fVar138 * auVar91._20_4_;
        fVar159 = auVar94._24_4_;
        auVar42._24_4_ = fVar159 * auVar91._24_4_;
        auVar42._28_4_ = auVar91._28_4_;
        auVar91 = vfmadd213ps_avx512vl(local_540,auVar113,auVar102);
        auVar43._4_4_ = fVar233 * auVar91._4_4_;
        auVar43._0_4_ = fVar223 * auVar91._0_4_;
        auVar43._8_4_ = fVar234 * auVar91._8_4_;
        auVar43._12_4_ = fVar235 * auVar91._12_4_;
        auVar43._16_4_ = fVar236 * auVar91._16_4_;
        auVar43._20_4_ = fVar138 * auVar91._20_4_;
        auVar43._24_4_ = fVar159 * auVar91._24_4_;
        auVar43._28_4_ = auVar122._28_4_;
        auVar91 = vminps_avx512vl(auVar42,auVar118);
        auVar52 = ZEXT812(0);
        auVar106 = ZEXT1232(auVar52) << 0x20;
        auVar91 = vmaxps_avx(auVar91,ZEXT1232(auVar52) << 0x20);
        auVar107 = vminps_avx512vl(auVar43,auVar118);
        auVar44._4_4_ = (auVar91._4_4_ + 1.0) * 0.125;
        auVar44._0_4_ = (auVar91._0_4_ + 0.0) * 0.125;
        auVar44._8_4_ = (auVar91._8_4_ + 2.0) * 0.125;
        auVar44._12_4_ = (auVar91._12_4_ + 3.0) * 0.125;
        auVar44._16_4_ = (auVar91._16_4_ + 4.0) * 0.125;
        auVar44._20_4_ = (auVar91._20_4_ + 5.0) * 0.125;
        auVar44._24_4_ = (auVar91._24_4_ + 6.0) * 0.125;
        auVar44._28_4_ = auVar91._28_4_ + 7.0;
        auVar78 = vfmadd213ps_fma(auVar44,local_720,local_8a0);
        local_1a0 = ZEXT1632(auVar78);
        auVar91 = vmaxps_avx(auVar107,ZEXT1232(auVar52) << 0x20);
        auVar45._4_4_ = (auVar91._4_4_ + 1.0) * 0.125;
        auVar45._0_4_ = (auVar91._0_4_ + 0.0) * 0.125;
        auVar45._8_4_ = (auVar91._8_4_ + 2.0) * 0.125;
        auVar45._12_4_ = (auVar91._12_4_ + 3.0) * 0.125;
        auVar45._16_4_ = (auVar91._16_4_ + 4.0) * 0.125;
        auVar45._20_4_ = (auVar91._20_4_ + 5.0) * 0.125;
        auVar45._24_4_ = (auVar91._24_4_ + 6.0) * 0.125;
        auVar45._28_4_ = auVar91._28_4_ + 7.0;
        auVar78 = vfmadd213ps_fma(auVar45,local_720,local_8a0);
        local_1c0 = ZEXT1632(auVar78);
        auVar46._4_4_ = auVar88._4_4_ * auVar88._4_4_;
        auVar46._0_4_ = auVar88._0_4_ * auVar88._0_4_;
        auVar46._8_4_ = auVar88._8_4_ * auVar88._8_4_;
        auVar46._12_4_ = auVar88._12_4_ * auVar88._12_4_;
        auVar46._16_4_ = auVar88._16_4_ * auVar88._16_4_;
        auVar46._20_4_ = auVar88._20_4_ * auVar88._20_4_;
        auVar46._24_4_ = auVar88._24_4_ * auVar88._24_4_;
        auVar46._28_4_ = auVar88._28_4_;
        auVar91 = vsubps_avx(local_740,auVar46);
        auVar47._4_4_ = auVar91._4_4_ * (float)local_7a0._4_4_;
        auVar47._0_4_ = auVar91._0_4_ * (float)local_7a0._0_4_;
        auVar47._8_4_ = auVar91._8_4_ * fStack_798;
        auVar47._12_4_ = auVar91._12_4_ * fStack_794;
        auVar47._16_4_ = auVar91._16_4_ * fStack_790;
        auVar47._20_4_ = auVar91._20_4_ * fStack_78c;
        auVar47._24_4_ = auVar91._24_4_ * fStack_788;
        auVar47._28_4_ = auVar88._28_4_;
        auVar88 = vsubps_avx(local_780,auVar47);
        uVar70 = vcmpps_avx512vl(auVar88,ZEXT1232(auVar52) << 0x20,5);
        auVar281 = ZEXT3264(local_820);
        auVar282 = ZEXT3264(local_840);
        auVar283 = ZEXT3264(local_8c0);
        if ((byte)uVar70 == 0) {
          uVar70 = 0;
          auVar89 = ZEXT1232(ZEXT812(0)) << 0x20;
          auVar184 = ZEXT864(0) << 0x20;
          auVar88 = ZEXT1232(ZEXT812(0)) << 0x20;
          auVar107 = SUB6432(ZEXT864(0),0) << 0x20;
          auVar260 = SUB6428(ZEXT864(0),0) << 0x20;
          auVar124._8_4_ = 0x7f800000;
          auVar124._0_8_ = 0x7f8000007f800000;
          auVar124._12_4_ = 0x7f800000;
          auVar124._16_4_ = 0x7f800000;
          auVar124._20_4_ = 0x7f800000;
          auVar124._24_4_ = 0x7f800000;
          auVar124._28_4_ = 0x7f800000;
          auVar125._8_4_ = 0xff800000;
          auVar125._0_8_ = 0xff800000ff800000;
          auVar125._12_4_ = 0xff800000;
          auVar125._16_4_ = 0xff800000;
          auVar125._20_4_ = 0xff800000;
          auVar125._24_4_ = 0xff800000;
          auVar125._28_4_ = 0xff800000;
        }
        else {
          auVar77 = vxorps_avx512vl(auVar103._0_16_,auVar103._0_16_);
          uVar71 = vcmpps_avx512vl(auVar88,auVar104,5);
          auVar88 = vsqrtps_avx(auVar88);
          auVar106 = vfnmadd213ps_avx512vl(auVar114,_local_560,auVar118);
          auVar108 = vfmadd132ps_avx512vl(auVar106,_local_560,_local_560);
          auVar106 = vsubps_avx(local_580,auVar88);
          auVar98 = vmulps_avx512vl(auVar106,auVar108);
          auVar88 = vsubps_avx512vl(auVar88,auVar111);
          auVar108 = vmulps_avx512vl(auVar88,auVar108);
          auVar88 = vfmadd213ps_avx512vl(auVar113,auVar98,auVar102);
          auVar48._4_4_ = fVar233 * auVar88._4_4_;
          auVar48._0_4_ = fVar223 * auVar88._0_4_;
          auVar48._8_4_ = fVar234 * auVar88._8_4_;
          auVar48._12_4_ = fVar235 * auVar88._12_4_;
          auVar48._16_4_ = fVar236 * auVar88._16_4_;
          auVar48._20_4_ = fVar138 * auVar88._20_4_;
          auVar48._24_4_ = fVar159 * auVar88._24_4_;
          auVar48._28_4_ = auVar107._28_4_;
          auVar49._4_4_ = (float)local_400._4_4_ * auVar98._4_4_;
          auVar49._0_4_ = (float)local_400._0_4_ * auVar98._0_4_;
          auVar49._8_4_ = fStack_3f8 * auVar98._8_4_;
          auVar49._12_4_ = fStack_3f4 * auVar98._12_4_;
          auVar49._16_4_ = fStack_3f0 * auVar98._16_4_;
          auVar49._20_4_ = fStack_3ec * auVar98._20_4_;
          auVar49._24_4_ = fStack_3e8 * auVar98._24_4_;
          auVar49._28_4_ = auVar88._28_4_;
          auVar106 = vmulps_avx512vl(local_420,auVar98);
          auVar99 = vmulps_avx512vl(local_440,auVar98);
          auVar88 = vfmadd213ps_avx512vl(auVar89,auVar48,auVar95);
          auVar88 = vsubps_avx512vl(auVar49,auVar88);
          auVar107 = vfmadd213ps_avx512vl(auVar92,auVar48,auVar96);
          auVar107 = vsubps_avx512vl(auVar106,auVar107);
          auVar78 = vfmadd213ps_fma(auVar48,auVar93,auVar97);
          auVar106 = vsubps_avx(auVar99,ZEXT1632(auVar78));
          auVar260 = auVar106._0_28_;
          auVar102 = vfmadd213ps_avx512vl(auVar113,auVar108,auVar102);
          auVar94 = vmulps_avx512vl(auVar94,auVar102);
          auVar50._4_4_ = (float)local_400._4_4_ * auVar108._4_4_;
          auVar50._0_4_ = (float)local_400._0_4_ * auVar108._0_4_;
          auVar50._8_4_ = fStack_3f8 * auVar108._8_4_;
          auVar50._12_4_ = fStack_3f4 * auVar108._12_4_;
          auVar50._16_4_ = fStack_3f0 * auVar108._16_4_;
          auVar50._20_4_ = fStack_3ec * auVar108._20_4_;
          auVar50._24_4_ = fStack_3e8 * auVar108._24_4_;
          auVar50._28_4_ = auVar99._28_4_;
          auVar102 = vmulps_avx512vl(local_420,auVar108);
          auVar99 = vmulps_avx512vl(local_440,auVar108);
          auVar78 = vfmadd213ps_fma(auVar89,auVar94,auVar95);
          auVar106 = vsubps_avx(auVar50,ZEXT1632(auVar78));
          auVar78 = vfmadd213ps_fma(auVar92,auVar94,auVar96);
          auVar89 = vsubps_avx512vl(auVar102,ZEXT1632(auVar78));
          auVar78 = vfmadd213ps_fma(auVar93,auVar94,auVar97);
          auVar92 = vsubps_avx512vl(auVar99,ZEXT1632(auVar78));
          auVar184 = ZEXT3264(auVar92);
          auVar150._8_4_ = 0x7f800000;
          auVar150._0_8_ = 0x7f8000007f800000;
          auVar150._12_4_ = 0x7f800000;
          auVar150._16_4_ = 0x7f800000;
          auVar150._20_4_ = 0x7f800000;
          auVar150._24_4_ = 0x7f800000;
          auVar150._28_4_ = 0x7f800000;
          auVar92 = vblendmps_avx512vl(auVar150,auVar98);
          bVar9 = (bool)((byte)uVar71 & 1);
          auVar124._0_4_ = (uint)bVar9 * auVar92._0_4_ | (uint)!bVar9 * auVar95._0_4_;
          bVar9 = (bool)((byte)(uVar71 >> 1) & 1);
          auVar124._4_4_ = (uint)bVar9 * auVar92._4_4_ | (uint)!bVar9 * auVar95._4_4_;
          bVar9 = (bool)((byte)(uVar71 >> 2) & 1);
          auVar124._8_4_ = (uint)bVar9 * auVar92._8_4_ | (uint)!bVar9 * auVar95._8_4_;
          bVar9 = (bool)((byte)(uVar71 >> 3) & 1);
          auVar124._12_4_ = (uint)bVar9 * auVar92._12_4_ | (uint)!bVar9 * auVar95._12_4_;
          bVar9 = (bool)((byte)(uVar71 >> 4) & 1);
          auVar124._16_4_ = (uint)bVar9 * auVar92._16_4_ | (uint)!bVar9 * auVar95._16_4_;
          bVar9 = (bool)((byte)(uVar71 >> 5) & 1);
          auVar124._20_4_ = (uint)bVar9 * auVar92._20_4_ | (uint)!bVar9 * auVar95._20_4_;
          bVar9 = (bool)((byte)(uVar71 >> 6) & 1);
          auVar124._24_4_ = (uint)bVar9 * auVar92._24_4_ | (uint)!bVar9 * auVar95._24_4_;
          bVar9 = SUB81(uVar71 >> 7,0);
          auVar124._28_4_ = (uint)bVar9 * auVar92._28_4_ | (uint)!bVar9 * auVar95._28_4_;
          auVar151._8_4_ = 0xff800000;
          auVar151._0_8_ = 0xff800000ff800000;
          auVar151._12_4_ = 0xff800000;
          auVar151._16_4_ = 0xff800000;
          auVar151._20_4_ = 0xff800000;
          auVar151._24_4_ = 0xff800000;
          auVar151._28_4_ = 0xff800000;
          auVar92 = vblendmps_avx512vl(auVar151,auVar108);
          bVar9 = (bool)((byte)uVar71 & 1);
          auVar125._0_4_ = (uint)bVar9 * auVar92._0_4_ | (uint)!bVar9 * -0x800000;
          bVar9 = (bool)((byte)(uVar71 >> 1) & 1);
          auVar125._4_4_ = (uint)bVar9 * auVar92._4_4_ | (uint)!bVar9 * -0x800000;
          bVar9 = (bool)((byte)(uVar71 >> 2) & 1);
          auVar125._8_4_ = (uint)bVar9 * auVar92._8_4_ | (uint)!bVar9 * -0x800000;
          bVar9 = (bool)((byte)(uVar71 >> 3) & 1);
          auVar125._12_4_ = (uint)bVar9 * auVar92._12_4_ | (uint)!bVar9 * -0x800000;
          bVar9 = (bool)((byte)(uVar71 >> 4) & 1);
          auVar125._16_4_ = (uint)bVar9 * auVar92._16_4_ | (uint)!bVar9 * -0x800000;
          bVar9 = (bool)((byte)(uVar71 >> 5) & 1);
          auVar125._20_4_ = (uint)bVar9 * auVar92._20_4_ | (uint)!bVar9 * -0x800000;
          bVar9 = (bool)((byte)(uVar71 >> 6) & 1);
          auVar125._24_4_ = (uint)bVar9 * auVar92._24_4_ | (uint)!bVar9 * -0x800000;
          bVar9 = SUB81(uVar71 >> 7,0);
          auVar125._28_4_ = (uint)bVar9 * auVar92._28_4_ | (uint)!bVar9 * -0x800000;
          auVar36._8_4_ = 0x36000000;
          auVar36._0_8_ = 0x3600000036000000;
          auVar36._12_4_ = 0x36000000;
          auVar36._16_4_ = 0x36000000;
          auVar36._20_4_ = 0x36000000;
          auVar36._24_4_ = 0x36000000;
          auVar36._28_4_ = 0x36000000;
          auVar92 = vmulps_avx512vl(local_5a0,auVar36);
          uVar19 = vcmpps_avx512vl(auVar92,local_5c0,0xe);
          uVar71 = uVar71 & uVar19;
          bVar65 = (byte)uVar71;
          if (bVar65 != 0) {
            uVar19 = vcmpps_avx512vl(auVar91,ZEXT1632(auVar77),2);
            auVar251._8_4_ = 0x7f800000;
            auVar251._0_8_ = 0x7f8000007f800000;
            auVar251._12_4_ = 0x7f800000;
            auVar251._16_4_ = 0x7f800000;
            auVar251._20_4_ = 0x7f800000;
            auVar251._24_4_ = 0x7f800000;
            auVar251._28_4_ = 0x7f800000;
            auVar266._8_4_ = 0xff800000;
            auVar266._0_8_ = 0xff800000ff800000;
            auVar266._12_4_ = 0xff800000;
            auVar266._16_4_ = 0xff800000;
            auVar266._20_4_ = 0xff800000;
            auVar266._24_4_ = 0xff800000;
            auVar266._28_4_ = 0xff800000;
            auVar91 = vblendmps_avx512vl(auVar251,auVar266);
            bVar67 = (byte)uVar19;
            uVar72 = (uint)(bVar67 & 1) * auVar91._0_4_ | (uint)!(bool)(bVar67 & 1) * auVar92._0_4_;
            bVar9 = (bool)((byte)(uVar19 >> 1) & 1);
            uVar131 = (uint)bVar9 * auVar91._4_4_ | (uint)!bVar9 * auVar92._4_4_;
            bVar9 = (bool)((byte)(uVar19 >> 2) & 1);
            uVar132 = (uint)bVar9 * auVar91._8_4_ | (uint)!bVar9 * auVar92._8_4_;
            bVar9 = (bool)((byte)(uVar19 >> 3) & 1);
            uVar133 = (uint)bVar9 * auVar91._12_4_ | (uint)!bVar9 * auVar92._12_4_;
            bVar9 = (bool)((byte)(uVar19 >> 4) & 1);
            uVar134 = (uint)bVar9 * auVar91._16_4_ | (uint)!bVar9 * auVar92._16_4_;
            bVar9 = (bool)((byte)(uVar19 >> 5) & 1);
            uVar135 = (uint)bVar9 * auVar91._20_4_ | (uint)!bVar9 * auVar92._20_4_;
            bVar9 = (bool)((byte)(uVar19 >> 6) & 1);
            uVar136 = (uint)bVar9 * auVar91._24_4_ | (uint)!bVar9 * auVar92._24_4_;
            bVar9 = SUB81(uVar19 >> 7,0);
            uVar137 = (uint)bVar9 * auVar91._28_4_ | (uint)!bVar9 * auVar92._28_4_;
            auVar124._0_4_ = (bVar65 & 1) * uVar72 | !(bool)(bVar65 & 1) * auVar124._0_4_;
            bVar9 = (bool)((byte)(uVar71 >> 1) & 1);
            auVar124._4_4_ = bVar9 * uVar131 | !bVar9 * auVar124._4_4_;
            bVar9 = (bool)((byte)(uVar71 >> 2) & 1);
            auVar124._8_4_ = bVar9 * uVar132 | !bVar9 * auVar124._8_4_;
            bVar9 = (bool)((byte)(uVar71 >> 3) & 1);
            auVar124._12_4_ = bVar9 * uVar133 | !bVar9 * auVar124._12_4_;
            bVar9 = (bool)((byte)(uVar71 >> 4) & 1);
            auVar124._16_4_ = bVar9 * uVar134 | !bVar9 * auVar124._16_4_;
            bVar9 = (bool)((byte)(uVar71 >> 5) & 1);
            auVar124._20_4_ = bVar9 * uVar135 | !bVar9 * auVar124._20_4_;
            bVar9 = (bool)((byte)(uVar71 >> 6) & 1);
            auVar124._24_4_ = bVar9 * uVar136 | !bVar9 * auVar124._24_4_;
            bVar9 = SUB81(uVar71 >> 7,0);
            auVar124._28_4_ = bVar9 * uVar137 | !bVar9 * auVar124._28_4_;
            auVar91 = vblendmps_avx512vl(auVar266,auVar251);
            bVar9 = (bool)((byte)(uVar19 >> 1) & 1);
            bVar11 = (bool)((byte)(uVar19 >> 2) & 1);
            bVar12 = (bool)((byte)(uVar19 >> 3) & 1);
            bVar13 = (bool)((byte)(uVar19 >> 4) & 1);
            bVar14 = (bool)((byte)(uVar19 >> 5) & 1);
            bVar15 = (bool)((byte)(uVar19 >> 6) & 1);
            bVar16 = SUB81(uVar19 >> 7,0);
            auVar125._0_4_ =
                 (uint)(bVar65 & 1) *
                 ((uint)(bVar67 & 1) * auVar91._0_4_ | !(bool)(bVar67 & 1) * uVar72) |
                 !(bool)(bVar65 & 1) * auVar125._0_4_;
            bVar10 = (bool)((byte)(uVar71 >> 1) & 1);
            auVar125._4_4_ =
                 (uint)bVar10 * ((uint)bVar9 * auVar91._4_4_ | !bVar9 * uVar131) |
                 !bVar10 * auVar125._4_4_;
            bVar9 = (bool)((byte)(uVar71 >> 2) & 1);
            auVar125._8_4_ =
                 (uint)bVar9 * ((uint)bVar11 * auVar91._8_4_ | !bVar11 * uVar132) |
                 !bVar9 * auVar125._8_4_;
            bVar9 = (bool)((byte)(uVar71 >> 3) & 1);
            auVar125._12_4_ =
                 (uint)bVar9 * ((uint)bVar12 * auVar91._12_4_ | !bVar12 * uVar133) |
                 !bVar9 * auVar125._12_4_;
            bVar9 = (bool)((byte)(uVar71 >> 4) & 1);
            auVar125._16_4_ =
                 (uint)bVar9 * ((uint)bVar13 * auVar91._16_4_ | !bVar13 * uVar134) |
                 !bVar9 * auVar125._16_4_;
            bVar9 = (bool)((byte)(uVar71 >> 5) & 1);
            auVar125._20_4_ =
                 (uint)bVar9 * ((uint)bVar14 * auVar91._20_4_ | !bVar14 * uVar135) |
                 !bVar9 * auVar125._20_4_;
            bVar9 = (bool)((byte)(uVar71 >> 6) & 1);
            auVar125._24_4_ =
                 (uint)bVar9 * ((uint)bVar15 * auVar91._24_4_ | !bVar15 * uVar136) |
                 !bVar9 * auVar125._24_4_;
            bVar9 = SUB81(uVar71 >> 7,0);
            auVar125._28_4_ =
                 (uint)bVar9 * ((uint)bVar16 * auVar91._28_4_ | !bVar16 * uVar137) |
                 !bVar9 * auVar125._28_4_;
            uVar70 = (ulong)(byte)((~bVar65 | bVar67) & (byte)uVar70);
          }
        }
        auVar280 = ZEXT3264(local_8e0);
        auVar272 = ZEXT3264(local_900);
        auVar273 = ZEXT3264(local_920);
        auVar274 = ZEXT3264(local_940);
        auVar276 = ZEXT3264(local_960);
        auVar278 = ZEXT3264(local_980);
        auVar279 = ZEXT3264(local_9a0);
        auVar267 = ZEXT3264(local_440);
        auVar241._0_4_ = local_440._0_4_ * auVar184._0_4_;
        auVar241._4_4_ = local_440._4_4_ * auVar184._4_4_;
        auVar241._8_4_ = local_440._8_4_ * auVar184._8_4_;
        auVar241._12_4_ = local_440._12_4_ * auVar184._12_4_;
        auVar241._16_4_ = local_440._16_4_ * auVar184._16_4_;
        auVar241._20_4_ = local_440._20_4_ * auVar184._20_4_;
        auVar241._28_36_ = auVar184._28_36_;
        auVar241._24_4_ = local_440._24_4_ * auVar184._24_4_;
        auVar255 = ZEXT3264(local_420);
        auVar78 = vfmadd231ps_fma(auVar241._0_32_,local_420,auVar89);
        auVar252 = ZEXT3264(_local_400);
        auVar78 = vfmadd231ps_fma(ZEXT1632(auVar78),_local_400,auVar106);
        auVar262 = ZEXT3264(_local_5e0);
        _local_200 = _local_5e0;
        local_1e0 = vminps_avx(local_340,auVar124);
        auVar247._8_4_ = 0x7fffffff;
        auVar247._0_8_ = 0x7fffffff7fffffff;
        auVar247._12_4_ = 0x7fffffff;
        auVar247._16_4_ = 0x7fffffff;
        auVar247._20_4_ = 0x7fffffff;
        auVar247._24_4_ = 0x7fffffff;
        auVar247._28_4_ = 0x7fffffff;
        auVar91 = vandps_avx(ZEXT1632(auVar78),auVar247);
        local_360 = vmaxps_avx(_local_5e0,auVar125);
        auVar241 = ZEXT3264(local_360);
        auVar152._8_4_ = 0x3e99999a;
        auVar152._0_8_ = 0x3e99999a3e99999a;
        auVar152._12_4_ = 0x3e99999a;
        auVar152._16_4_ = 0x3e99999a;
        auVar152._20_4_ = 0x3e99999a;
        auVar152._24_4_ = 0x3e99999a;
        auVar152._28_4_ = 0x3e99999a;
        uVar17 = vcmpps_avx512vl(auVar91,auVar152,1);
        local_3e0._0_2_ = (short)uVar17;
        uVar17 = vcmpps_avx512vl(_local_5e0,local_1e0,2);
        bVar65 = (byte)uVar17 & bVar61;
        uVar18 = vcmpps_avx512vl(local_360,local_340,2);
        auVar275 = ZEXT3264(local_7e0);
        auVar277 = ZEXT3264(local_800);
        if ((bVar61 & ((byte)uVar18 | (byte)uVar17)) != 0) {
          uVar71 = CONCAT71((int7)(uVar70 >> 8),~(byte)uVar70);
          auVar51._4_4_ = local_440._4_4_ * auVar260._4_4_;
          auVar51._0_4_ = local_440._0_4_ * auVar260._0_4_;
          auVar51._8_4_ = local_440._8_4_ * auVar260._8_4_;
          auVar51._12_4_ = local_440._12_4_ * auVar260._12_4_;
          auVar51._16_4_ = local_440._16_4_ * auVar260._16_4_;
          auVar51._20_4_ = local_440._20_4_ * auVar260._20_4_;
          auVar51._24_4_ = local_440._24_4_ * auVar260._24_4_;
          auVar51._28_4_ = 0x3e99999a;
          auVar78 = vfmadd213ps_fma(auVar107,local_420,auVar51);
          auVar78 = vfmadd213ps_fma(auVar88,_local_400,ZEXT1632(auVar78));
          auVar91 = vandps_avx(ZEXT1632(auVar78),auVar247);
          uVar17 = vcmpps_avx512vl(auVar91,auVar152,1);
          bVar67 = (byte)uVar17 | ~(byte)uVar70;
          auVar153._8_4_ = 2;
          auVar153._0_8_ = 0x200000002;
          auVar153._12_4_ = 2;
          auVar153._16_4_ = 2;
          auVar153._20_4_ = 2;
          auVar153._24_4_ = 2;
          auVar153._28_4_ = 2;
          auVar37._8_4_ = 3;
          auVar37._0_8_ = 0x300000003;
          auVar37._12_4_ = 3;
          auVar37._16_4_ = 3;
          auVar37._20_4_ = 3;
          auVar37._24_4_ = 3;
          auVar37._28_4_ = 3;
          auVar91 = vpblendmd_avx512vl(auVar153,auVar37);
          local_300._0_4_ = (uint)(bVar67 & 1) * auVar91._0_4_ | (uint)!(bool)(bVar67 & 1) * 2;
          bVar9 = (bool)(bVar67 >> 1 & 1);
          local_300._4_4_ = (uint)bVar9 * auVar91._4_4_ | (uint)!bVar9 * 2;
          bVar9 = (bool)(bVar67 >> 2 & 1);
          local_300._8_4_ = (uint)bVar9 * auVar91._8_4_ | (uint)!bVar9 * 2;
          bVar9 = (bool)(bVar67 >> 3 & 1);
          local_300._12_4_ = (uint)bVar9 * auVar91._12_4_ | (uint)!bVar9 * 2;
          bVar9 = (bool)(bVar67 >> 4 & 1);
          local_300._16_4_ = (uint)bVar9 * auVar91._16_4_ | (uint)!bVar9 * 2;
          bVar9 = (bool)(bVar67 >> 5 & 1);
          local_300._20_4_ = (uint)bVar9 * auVar91._20_4_ | (uint)!bVar9 * 2;
          bVar9 = (bool)(bVar67 >> 6 & 1);
          local_300._24_4_ = (uint)bVar9 * auVar91._24_4_ | (uint)!bVar9 * 2;
          local_300._28_4_ = (uint)(bVar67 >> 7) * auVar91._28_4_ | (uint)!(bool)(bVar67 >> 7) * 2;
          local_380 = vpbroadcastd_avx512vl();
          uVar17 = vpcmpd_avx512vl(local_380,local_300,5);
          bVar67 = (byte)uVar17 & bVar65;
          if (bVar67 == 0) {
            auVar155._4_4_ = uVar73;
            auVar155._0_4_ = uVar73;
            auVar155._8_4_ = uVar73;
            auVar155._12_4_ = uVar73;
            auVar155._16_4_ = uVar73;
            auVar155._20_4_ = uVar73;
            auVar155._24_4_ = uVar73;
            auVar155._28_4_ = uVar73;
          }
          else {
            local_320 = local_360;
            local_9b0 = (uint)uVar71;
            auVar77 = vminps_avx(local_660._0_16_,local_6a0._0_16_);
            auVar78 = vmaxps_avx(local_660._0_16_,local_6a0._0_16_);
            auVar80 = vminps_avx(local_680._0_16_,local_6c0._0_16_);
            auVar85 = vminps_avx(auVar77,auVar80);
            auVar77 = vmaxps_avx(local_680._0_16_,local_6c0._0_16_);
            auVar80 = vmaxps_avx(auVar78,auVar77);
            auVar189._8_4_ = 0x7fffffff;
            auVar189._0_8_ = 0x7fffffff7fffffff;
            auVar189._12_4_ = 0x7fffffff;
            auVar78 = vandps_avx(auVar85,auVar189);
            auVar77 = vandps_avx(auVar80,auVar189);
            auVar78 = vmaxps_avx(auVar78,auVar77);
            auVar77 = vmovshdup_avx(auVar78);
            auVar77 = vmaxss_avx(auVar77,auVar78);
            auVar78 = vshufpd_avx(auVar78,auVar78,1);
            auVar78 = vmaxss_avx(auVar78,auVar77);
            local_760._0_4_ = auVar78._0_4_ * 1.9073486e-06;
            local_630 = vshufps_avx(auVar80,auVar80,0xff);
            local_3c0 = (float)local_5e0._0_4_ + (float)local_6e0._0_4_;
            fStack_3bc = (float)local_5e0._4_4_ + (float)local_6e0._4_4_;
            fStack_3b8 = fStack_5d8 + fStack_6d8;
            fStack_3b4 = fStack_5d4 + fStack_6d4;
            fStack_3b0 = fStack_5d0 + fStack_6d0;
            fStack_3ac = fStack_5cc + fStack_6cc;
            fStack_3a8 = fStack_5c8 + fStack_6c8;
            fStack_3a4 = fStack_5c4 + fStack_6c4;
            do {
              auVar154._8_4_ = 0x7f800000;
              auVar154._0_8_ = 0x7f8000007f800000;
              auVar154._12_4_ = 0x7f800000;
              auVar154._16_4_ = 0x7f800000;
              auVar154._20_4_ = 0x7f800000;
              auVar154._24_4_ = 0x7f800000;
              auVar154._28_4_ = 0x7f800000;
              auVar91 = vblendmps_avx512vl(auVar154,_local_5e0);
              auVar126._0_4_ =
                   (uint)(bVar67 & 1) * auVar91._0_4_ | (uint)!(bool)(bVar67 & 1) * 0x7f800000;
              bVar9 = (bool)(bVar67 >> 1 & 1);
              auVar126._4_4_ = (uint)bVar9 * auVar91._4_4_ | (uint)!bVar9 * 0x7f800000;
              bVar9 = (bool)(bVar67 >> 2 & 1);
              auVar126._8_4_ = (uint)bVar9 * auVar91._8_4_ | (uint)!bVar9 * 0x7f800000;
              bVar9 = (bool)(bVar67 >> 3 & 1);
              auVar126._12_4_ = (uint)bVar9 * auVar91._12_4_ | (uint)!bVar9 * 0x7f800000;
              bVar9 = (bool)(bVar67 >> 4 & 1);
              auVar126._16_4_ = (uint)bVar9 * auVar91._16_4_ | (uint)!bVar9 * 0x7f800000;
              bVar9 = (bool)(bVar67 >> 5 & 1);
              auVar126._20_4_ = (uint)bVar9 * auVar91._20_4_ | (uint)!bVar9 * 0x7f800000;
              auVar126._24_4_ =
                   (uint)(bVar67 >> 6) * auVar91._24_4_ | (uint)!(bool)(bVar67 >> 6) * 0x7f800000;
              auVar126._28_4_ = 0x7f800000;
              auVar91 = vshufps_avx(auVar126,auVar126,0xb1);
              auVar91 = vminps_avx(auVar126,auVar91);
              auVar88 = vshufpd_avx(auVar91,auVar91,5);
              auVar91 = vminps_avx(auVar91,auVar88);
              auVar88 = vpermpd_avx2(auVar91,0x4e);
              auVar91 = vminps_avx(auVar91,auVar88);
              uVar17 = vcmpps_avx512vl(auVar126,auVar91,0);
              bVar62 = (byte)uVar17 & bVar67;
              bVar69 = bVar67;
              if (bVar62 != 0) {
                bVar69 = bVar62;
              }
              iVar21 = 0;
              for (uVar73 = (uint)bVar69; (uVar73 & 1) == 0; uVar73 = uVar73 >> 1 | 0x80000000) {
                iVar21 = iVar21 + 1;
              }
              auVar184 = ZEXT464(*(uint *)(local_1a0 + (uint)(iVar21 << 2)));
              auVar255 = ZEXT464(*(uint *)(local_200 + (uint)(iVar21 << 2)));
              fVar253 = local_9a8;
              if ((float)local_700._0_4_ < 0.0) {
                local_8a0._0_16_ = ZEXT416(*(uint *)(local_1a0 + (uint)(iVar21 << 2)));
                local_780._0_16_ = ZEXT416(*(uint *)(local_200 + (uint)(iVar21 << 2)));
                fVar253 = sqrtf((float)local_700._0_4_);
                auVar255 = ZEXT1664(local_780._0_16_);
                auVar184 = ZEXT1664(local_8a0._0_16_);
              }
              lVar68 = 5;
              do {
                local_780._0_16_ = auVar255._0_16_;
                uVar165 = auVar255._0_4_;
                auVar143._4_4_ = uVar165;
                auVar143._0_4_ = uVar165;
                auVar143._8_4_ = uVar165;
                auVar143._12_4_ = uVar165;
                auVar78 = vfmadd132ps_fma(auVar143,ZEXT816(0) << 0x40,local_6f0);
                fVar220 = auVar184._0_4_;
                fVar248 = 1.0 - fVar220;
                fVar258 = fVar248 * fVar248 * fVar248;
                fVar256 = fVar220 * fVar220;
                fVar222 = fVar220 * fVar256;
                auVar77 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40800000),0),ZEXT416((uint)fVar258),
                                          ZEXT416((uint)fVar222));
                fVar257 = fVar220 * fVar248;
                auVar227 = ZEXT416((uint)fVar248);
                auVar85 = vfmadd231ss_fma(ZEXT416((uint)(fVar220 * fVar257 * 6.0)),
                                          ZEXT416((uint)(fVar257 * fVar248)),
                                          SUB6416(ZEXT464(0x41400000),0));
                auVar80 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40800000),0),ZEXT416((uint)fVar222),
                                          ZEXT416((uint)fVar258));
                auVar86 = vfmadd231ss_fma(ZEXT416((uint)(fVar257 * fVar248 * 6.0)),
                                          SUB6416(ZEXT464(0x41400000),0),
                                          ZEXT416((uint)(fVar220 * fVar257)));
                fVar258 = fVar258 * 0.16666667;
                fVar220 = (auVar77._0_4_ + auVar85._0_4_) * 0.16666667;
                fVar221 = (auVar80._0_4_ + auVar86._0_4_) * 0.16666667;
                fVar222 = fVar222 * 0.16666667;
                auVar190._0_4_ = fVar222 * (float)local_6c0._0_4_;
                auVar190._4_4_ = fVar222 * (float)local_6c0._4_4_;
                auVar190._8_4_ = fVar222 * fStack_6b8;
                auVar190._12_4_ = fVar222 * fStack_6b4;
                auVar228._4_4_ = fVar221;
                auVar228._0_4_ = fVar221;
                auVar228._8_4_ = fVar221;
                auVar228._12_4_ = fVar221;
                auVar77 = vfmadd132ps_fma(auVar228,auVar190,local_680._0_16_);
                auVar191._4_4_ = fVar220;
                auVar191._0_4_ = fVar220;
                auVar191._8_4_ = fVar220;
                auVar191._12_4_ = fVar220;
                auVar77 = vfmadd132ps_fma(auVar191,auVar77,local_6a0._0_16_);
                auVar169._4_4_ = fVar258;
                auVar169._0_4_ = fVar258;
                auVar169._8_4_ = fVar258;
                auVar169._12_4_ = fVar258;
                auVar77 = vfmadd132ps_fma(auVar169,auVar77,local_660._0_16_);
                local_540._0_16_ = auVar77;
                auVar78 = vsubps_avx(auVar78,auVar77);
                local_720._0_16_ = auVar78;
                auVar78 = vdpps_avx(auVar78,auVar78,0x7f);
                local_8a0._0_16_ = auVar184._0_16_;
                local_740._0_16_ = auVar78;
                if (auVar78._0_4_ < 0.0) {
                  local_7a0._0_4_ = fVar256;
                  local_7c0._0_4_ = fVar257;
                  auVar252._0_4_ = sqrtf(auVar78._0_4_);
                  auVar252._4_60_ = extraout_var;
                  auVar78 = auVar252._0_16_;
                  fVar257 = (float)local_7c0._0_4_;
                  auVar77 = local_8a0._0_16_;
                }
                else {
                  auVar78 = vsqrtss_avx(auVar78,auVar78);
                  local_7a0._0_4_ = fVar256;
                  auVar77 = auVar184._0_16_;
                }
                local_560._4_4_ = fVar248;
                local_560._0_4_ = fVar248;
                fStack_558 = fVar248;
                fStack_554 = fVar248;
                auVar80 = vfnmsub213ss_fma(auVar77,auVar77,ZEXT416((uint)(fVar257 * 4.0)));
                auVar77 = vfmadd231ss_fma(ZEXT416((uint)(fVar257 * 4.0)),auVar227,auVar227);
                fVar256 = fVar248 * -fVar248 * 0.5;
                fVar257 = auVar80._0_4_ * 0.5;
                fVar258 = auVar77._0_4_ * 0.5;
                local_7a0._0_4_ = (float)local_7a0._0_4_ * 0.5;
                auVar216._0_4_ = (float)local_7a0._0_4_ * (float)local_6c0._0_4_;
                auVar216._4_4_ = (float)local_7a0._0_4_ * (float)local_6c0._4_4_;
                auVar216._8_4_ = (float)local_7a0._0_4_ * fStack_6b8;
                auVar216._12_4_ = (float)local_7a0._0_4_ * fStack_6b4;
                auVar170._4_4_ = fVar258;
                auVar170._0_4_ = fVar258;
                auVar170._8_4_ = fVar258;
                auVar170._12_4_ = fVar258;
                auVar77 = vfmadd132ps_fma(auVar170,auVar216,local_680._0_16_);
                auVar192._4_4_ = fVar257;
                auVar192._0_4_ = fVar257;
                auVar192._8_4_ = fVar257;
                auVar192._12_4_ = fVar257;
                auVar77 = vfmadd132ps_fma(auVar192,auVar77,local_6a0._0_16_);
                auVar264._4_4_ = fVar256;
                auVar264._0_4_ = fVar256;
                auVar264._8_4_ = fVar256;
                auVar264._12_4_ = fVar256;
                _local_7a0 = vfmadd132ps_fma(auVar264,auVar77,local_660._0_16_);
                local_580._0_16_ = vdpps_avx(_local_7a0,_local_7a0,0x7f);
                auVar53._12_4_ = 0;
                auVar53._0_12_ = ZEXT812(0);
                fVar256 = local_580._0_4_;
                auVar77 = vrsqrt14ss_avx512f(auVar53 << 0x20,ZEXT416((uint)fVar256));
                fVar257 = auVar77._0_4_;
                local_5a0._0_16_ = vrcp14ss_avx512f(auVar53 << 0x20,ZEXT416((uint)fVar256));
                auVar77 = vfnmadd213ss_fma(local_5a0._0_16_,local_580._0_16_,ZEXT416(0x40000000));
                local_5c0._0_4_ = auVar77._0_4_;
                local_7c0._0_4_ = auVar78._0_4_;
                if (fVar256 < -fVar256) {
                  auVar255._0_4_ = sqrtf(fVar256);
                  auVar255._4_60_ = extraout_var_00;
                  auVar78 = ZEXT416((uint)local_7c0._0_4_);
                  auVar80 = auVar255._0_16_;
                  auVar77 = _local_7a0;
                }
                else {
                  auVar80 = vsqrtss_avx512f(local_580._0_16_,local_580._0_16_);
                  auVar77 = _local_7a0;
                }
                fVar256 = fVar257 * 1.5 + fVar256 * -0.5 * fVar257 * fVar257 * fVar257;
                auVar144._0_4_ = auVar77._0_4_ * fVar256;
                auVar144._4_4_ = auVar77._4_4_ * fVar256;
                auVar144._8_4_ = auVar77._8_4_ * fVar256;
                auVar144._12_4_ = auVar77._12_4_ * fVar256;
                auVar85 = vdpps_avx(local_720._0_16_,auVar144,0x7f);
                fVar220 = auVar78._0_4_;
                fVar257 = auVar85._0_4_;
                auVar145._0_4_ = fVar257 * fVar257;
                auVar145._4_4_ = auVar85._4_4_ * auVar85._4_4_;
                auVar145._8_4_ = auVar85._8_4_ * auVar85._8_4_;
                auVar145._12_4_ = auVar85._12_4_ * auVar85._12_4_;
                auVar86 = vsubps_avx(local_740._0_16_,auVar145);
                fVar258 = auVar86._0_4_;
                auVar171._4_12_ = ZEXT812(0) << 0x20;
                auVar171._0_4_ = fVar258;
                auVar81 = vrsqrt14ss_avx512f(ZEXT816(0) << 0x40,auVar171);
                auVar79 = vmulss_avx512f(auVar81,ZEXT416(0x3fc00000));
                auVar82 = vmulss_avx512f(auVar86,ZEXT416(0xbf000000));
                if (fVar258 < 0.0) {
                  local_600._0_4_ = auVar79._0_4_;
                  local_620 = fVar256;
                  fStack_61c = fVar256;
                  fStack_618 = fVar256;
                  fStack_614 = fVar256;
                  local_610 = auVar81;
                  fVar258 = sqrtf(fVar258);
                  auVar82 = ZEXT416(auVar82._0_4_);
                  auVar79 = ZEXT416((uint)local_600._0_4_);
                  auVar80 = ZEXT416(auVar80._0_4_);
                  auVar78 = ZEXT416((uint)local_7c0._0_4_);
                  auVar77 = _local_7a0;
                  auVar81 = local_610;
                  fVar256 = local_620;
                  fVar221 = fStack_61c;
                  fVar222 = fStack_618;
                  fVar248 = fStack_614;
                }
                else {
                  auVar86 = vsqrtss_avx(auVar86,auVar86);
                  fVar258 = auVar86._0_4_;
                  fVar221 = fVar256;
                  fVar222 = fVar256;
                  fVar248 = fVar256;
                }
                auVar267 = ZEXT1664(auVar77);
                auVar262 = ZEXT1664(local_740._0_16_);
                auVar259 = ZEXT1664(local_720._0_16_);
                auVar280 = ZEXT3264(local_8e0);
                auVar272 = ZEXT3264(local_900);
                auVar273 = ZEXT3264(local_920);
                auVar274 = ZEXT3264(local_940);
                auVar275 = ZEXT3264(local_7e0);
                auVar276 = ZEXT3264(local_960);
                auVar277 = ZEXT3264(local_800);
                auVar278 = ZEXT3264(local_980);
                auVar279 = ZEXT3264(local_9a0);
                auVar281 = ZEXT3264(local_820);
                auVar282 = ZEXT3264(local_840);
                auVar283 = ZEXT3264(local_8c0);
                auVar84 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),auVar227,local_8a0._0_16_);
                auVar86 = vfmadd231ss_fma(auVar227,local_8a0._0_16_,SUB6416(ZEXT464(0xc0000000),0));
                fVar233 = local_8a0._0_4_;
                auVar193._0_4_ = fVar233 * (float)local_6c0._0_4_;
                auVar193._4_4_ = fVar233 * (float)local_6c0._4_4_;
                auVar193._8_4_ = fVar233 * fStack_6b8;
                auVar193._12_4_ = fVar233 * fStack_6b4;
                auVar217._0_4_ = auVar86._0_4_;
                auVar217._4_4_ = auVar217._0_4_;
                auVar217._8_4_ = auVar217._0_4_;
                auVar217._12_4_ = auVar217._0_4_;
                auVar86 = vfmadd132ps_fma(auVar217,auVar193,local_680._0_16_);
                auVar172._0_4_ = auVar84._0_4_;
                auVar172._4_4_ = auVar172._0_4_;
                auVar172._8_4_ = auVar172._0_4_;
                auVar172._12_4_ = auVar172._0_4_;
                auVar86 = vfmadd132ps_fma(auVar172,auVar86,local_6a0._0_16_);
                auVar86 = vfmadd132ps_fma(_local_560,auVar86,local_660._0_16_);
                auVar173._0_4_ = auVar86._0_4_ * (float)local_580._0_4_;
                auVar173._4_4_ = auVar86._4_4_ * (float)local_580._0_4_;
                auVar173._8_4_ = auVar86._8_4_ * (float)local_580._0_4_;
                auVar173._12_4_ = auVar86._12_4_ * (float)local_580._0_4_;
                auVar86 = vdpps_avx(auVar77,auVar86,0x7f);
                fVar223 = auVar86._0_4_;
                auVar194._0_4_ = auVar77._0_4_ * fVar223;
                auVar194._4_4_ = auVar77._4_4_ * fVar223;
                auVar194._8_4_ = auVar77._8_4_ * fVar223;
                auVar194._12_4_ = auVar77._12_4_ * fVar223;
                auVar86 = vsubps_avx(auVar173,auVar194);
                fVar223 = (float)local_5c0._0_4_ * (float)local_5a0._0_4_;
                auVar28._8_4_ = 0x80000000;
                auVar28._0_8_ = 0x8000000080000000;
                auVar28._12_4_ = 0x80000000;
                auVar83 = vxorps_avx512vl(auVar77,auVar28);
                auVar229._0_4_ = fVar256 * auVar86._0_4_ * fVar223;
                auVar229._4_4_ = fVar221 * auVar86._4_4_ * fVar223;
                auVar229._8_4_ = fVar222 * auVar86._8_4_ * fVar223;
                auVar229._12_4_ = fVar248 * auVar86._12_4_ * fVar223;
                auVar86 = vdpps_avx(auVar83,auVar144,0x7f);
                auVar227 = vmaxss_avx(ZEXT416((uint)local_760._0_4_),
                                      ZEXT416((uint)((float)local_780._0_4_ *
                                                    fVar253 * 1.9073486e-06)));
                auVar84 = vdivss_avx512f(ZEXT416((uint)local_760._0_4_),auVar80);
                auVar80 = vdpps_avx(local_720._0_16_,auVar229,0x7f);
                auVar78 = vfmadd213ss_fma(auVar78,ZEXT416((uint)local_760._0_4_),auVar227);
                auVar84 = vfmadd213ss_fma(ZEXT416((uint)(fVar220 + 1.0)),auVar84,auVar78);
                auVar78 = vdpps_avx(local_6f0,auVar144,0x7f);
                fVar256 = auVar86._0_4_ + auVar80._0_4_;
                auVar80 = vdpps_avx(local_720._0_16_,auVar83,0x7f);
                auVar82 = vmulss_avx512f(auVar82,auVar81);
                auVar81 = vmulss_avx512f(auVar81,auVar81);
                auVar86 = vdpps_avx(local_720._0_16_,local_6f0,0x7f);
                auVar82 = vaddss_avx512f(auVar79,ZEXT416((uint)(auVar82._0_4_ * auVar81._0_4_)));
                auVar81 = vfnmadd231ss_fma(auVar80,auVar85,ZEXT416((uint)fVar256));
                auVar79 = vfnmadd231ss_fma(auVar86,auVar85,auVar78);
                auVar80 = vpermilps_avx(local_540._0_16_,0xff);
                fVar258 = fVar258 - auVar80._0_4_;
                auVar80 = vshufps_avx(auVar77,auVar77,0xff);
                auVar86 = vfmsub213ss_fma(auVar81,auVar82,auVar80);
                fVar220 = auVar79._0_4_ * auVar82._0_4_;
                auVar81 = vfmsub231ss_fma(ZEXT416((uint)(auVar78._0_4_ * auVar86._0_4_)),
                                          ZEXT416((uint)fVar256),ZEXT416((uint)fVar220));
                auVar252 = ZEXT1664(auVar81);
                fVar221 = auVar81._0_4_;
                fVar233 = fVar233 - (fVar257 * (fVar220 / fVar221) -
                                    fVar258 * (auVar78._0_4_ / fVar221));
                auVar184 = ZEXT464((uint)fVar233);
                fVar256 = (float)local_780._0_4_ -
                          (fVar258 * (fVar256 / fVar221) - fVar257 * (auVar86._0_4_ / fVar221));
                auVar255 = ZEXT464((uint)fVar256);
                auVar29._8_4_ = 0x7fffffff;
                auVar29._0_8_ = 0x7fffffff7fffffff;
                auVar29._12_4_ = 0x7fffffff;
                auVar78 = vandps_avx512vl(auVar85,auVar29);
                if (auVar78._0_4_ < auVar84._0_4_) {
                  auVar78 = vfmadd231ss_fma(ZEXT416((uint)(auVar84._0_4_ + auVar227._0_4_)),
                                            local_630,ZEXT416(0x36000000));
                  auVar30._8_4_ = 0x7fffffff;
                  auVar30._0_8_ = 0x7fffffff7fffffff;
                  auVar30._12_4_ = 0x7fffffff;
                  auVar85 = vandps_avx512vl(ZEXT416((uint)fVar258),auVar30);
                  if (auVar85._0_4_ < auVar78._0_4_) {
                    fVar253 = fVar256 + (float)local_640._0_4_;
                    if ((((fVar253 < fVar158) ||
                         (fVar257 = *(float *)(ray + k * 4 + 0x80), fVar257 < fVar253)) ||
                        (fVar233 < 0.0)) || (1.0 < fVar233)) break;
                    auVar195._4_12_ = SUB1612(ZEXT816(0),0);
                    auVar195._0_4_ = local_740._0_4_;
                    auVar78 = vrsqrt14ss_avx512f(ZEXT816(0) << 0x20,auVar195);
                    fVar258 = auVar78._0_4_;
                    pGVar4 = (context->scene->geometries).items[uVar63].ptr;
                    if ((pGVar4->mask & *(uint *)(ray + k * 4 + 0x90)) == 0) break;
                    fVar258 = fVar258 * 1.5 + local_740._0_4_ * -0.5 * fVar258 * fVar258 * fVar258;
                    auVar196._0_4_ = local_720._0_4_ * fVar258;
                    auVar196._4_4_ = local_720._4_4_ * fVar258;
                    auVar196._8_4_ = local_720._8_4_ * fVar258;
                    auVar196._12_4_ = local_720._12_4_ * fVar258;
                    auVar86 = vfmadd213ps_fma(auVar80,auVar196,auVar77);
                    auVar78 = vshufps_avx(auVar196,auVar196,0xc9);
                    auVar80 = vshufps_avx(auVar77,auVar77,0xc9);
                    auVar197._0_4_ = auVar196._0_4_ * auVar80._0_4_;
                    auVar197._4_4_ = auVar196._4_4_ * auVar80._4_4_;
                    auVar197._8_4_ = auVar196._8_4_ * auVar80._8_4_;
                    auVar197._12_4_ = auVar196._12_4_ * auVar80._12_4_;
                    auVar85 = vfmsub231ps_fma(auVar197,auVar77,auVar78);
                    auVar78 = vshufps_avx(auVar85,auVar85,0xc9);
                    auVar80 = vshufps_avx(auVar86,auVar86,0xc9);
                    auVar85 = vshufps_avx(auVar85,auVar85,0xd2);
                    auVar146._0_4_ = auVar86._0_4_ * auVar85._0_4_;
                    auVar146._4_4_ = auVar86._4_4_ * auVar85._4_4_;
                    auVar146._8_4_ = auVar86._8_4_ * auVar85._8_4_;
                    auVar146._12_4_ = auVar86._12_4_ * auVar85._12_4_;
                    auVar78 = vfmsub231ps_fma(auVar146,auVar78,auVar80);
                    uVar165 = auVar78._0_4_;
                    if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                       (pGVar4->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                      *(float *)(ray + k * 4 + 0x80) = fVar253;
                      uVar3 = vextractps_avx(auVar78,1);
                      *(undefined4 *)(ray + k * 4 + 0xc0) = uVar3;
                      uVar3 = vextractps_avx(auVar78,2);
                      *(undefined4 *)(ray + k * 4 + 0xd0) = uVar3;
                      *(undefined4 *)(ray + k * 4 + 0xe0) = uVar165;
                      *(float *)(ray + k * 4 + 0xf0) = fVar233;
                      *(undefined4 *)(ray + k * 4 + 0x100) = 0;
                      *(int *)(ray + k * 4 + 0x110) = (int)local_748;
                      *(uint *)(ray + k * 4 + 0x120) = uVar63;
                      *(uint *)(ray + k * 4 + 0x130) = context->user->instID[0];
                      *(uint *)(ray + k * 4 + 0x140) = context->user->instPrimID[0];
                      break;
                    }
                    local_4e0 = (RTCHitN  [16])vshufps_avx(auVar78,auVar78,0x55);
                    auStack_4d0 = vshufps_avx(auVar78,auVar78,0xaa);
                    local_4c0 = uVar165;
                    uStack_4bc = uVar165;
                    uStack_4b8 = uVar165;
                    uStack_4b4 = uVar165;
                    local_4b0 = fVar233;
                    fStack_4ac = fVar233;
                    fStack_4a8 = fVar233;
                    fStack_4a4 = fVar233;
                    local_4a0 = ZEXT416(0) << 0x20;
                    local_490 = local_500._0_8_;
                    uStack_488 = local_500._8_8_;
                    local_480 = local_4f0;
                    vpcmpeqd_avx2(ZEXT1632(local_4f0),ZEXT1632(local_4f0));
                    uStack_46c = context->user->instID[0];
                    local_470 = uStack_46c;
                    uStack_468 = uStack_46c;
                    uStack_464 = uStack_46c;
                    uStack_460 = context->user->instPrimID[0];
                    uStack_45c = uStack_460;
                    uStack_458 = uStack_460;
                    uStack_454 = uStack_460;
                    *(float *)(ray + k * 4 + 0x80) = fVar253;
                    local_9c0 = local_510;
                    local_870.valid = (int *)local_9c0;
                    local_870.geometryUserPtr = pGVar4->userPtr;
                    local_870.context = context->user;
                    local_870.hit = local_4e0;
                    local_870.N = 4;
                    local_870.ray = (RTCRayN *)ray;
                    if (pGVar4->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                      auVar252 = ZEXT1664(auVar81);
                      auVar255 = ZEXT464((uint)fVar256);
                      auVar259 = ZEXT1664(local_720._0_16_);
                      auVar262 = ZEXT1664(local_740._0_16_);
                      auVar267 = ZEXT1664(auVar77);
                      (*pGVar4->intersectionFilterN)(&local_870);
                      auVar283 = ZEXT3264(local_8c0);
                      auVar282 = ZEXT3264(local_840);
                      auVar281 = ZEXT3264(local_820);
                      auVar279 = ZEXT3264(local_9a0);
                      auVar278 = ZEXT3264(local_980);
                      auVar277 = ZEXT3264(local_800);
                      auVar276 = ZEXT3264(local_960);
                      auVar275 = ZEXT3264(local_7e0);
                      auVar274 = ZEXT3264(local_940);
                      auVar273 = ZEXT3264(local_920);
                      auVar272 = ZEXT3264(local_900);
                      auVar280 = ZEXT3264(local_8e0);
                    }
                    uVar70 = vptestmd_avx512vl(local_9c0,local_9c0);
                    if ((uVar70 & 0xf) != 0) {
                      p_Var8 = context->args->filter;
                      if ((p_Var8 != (RTCFilterFunctionN)0x0) &&
                         (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                           RTC_RAY_QUERY_FLAG_INCOHERENT ||
                          (((pGVar4->field_8).field_0x2 & 0x40) != 0)))) {
                        auVar252 = ZEXT1664(auVar252._0_16_);
                        auVar255 = ZEXT1664(auVar255._0_16_);
                        auVar259 = ZEXT1664(auVar259._0_16_);
                        auVar262 = ZEXT1664(auVar262._0_16_);
                        auVar267 = ZEXT1664(auVar267._0_16_);
                        (*p_Var8)(&local_870);
                        auVar283 = ZEXT3264(local_8c0);
                        auVar282 = ZEXT3264(local_840);
                        auVar281 = ZEXT3264(local_820);
                        auVar279 = ZEXT3264(local_9a0);
                        auVar278 = ZEXT3264(local_980);
                        auVar277 = ZEXT3264(local_800);
                        auVar276 = ZEXT3264(local_960);
                        auVar275 = ZEXT3264(local_7e0);
                        auVar274 = ZEXT3264(local_940);
                        auVar273 = ZEXT3264(local_920);
                        auVar272 = ZEXT3264(local_900);
                        auVar280 = ZEXT3264(local_8e0);
                      }
                      uVar70 = vptestmd_avx512vl(local_9c0,local_9c0);
                      uVar70 = uVar70 & 0xf;
                      bVar69 = (byte)uVar70;
                      if (bVar69 != 0) {
                        iVar55 = *(int *)(local_870.hit + 4);
                        iVar56 = *(int *)(local_870.hit + 8);
                        iVar57 = *(int *)(local_870.hit + 0xc);
                        bVar9 = (bool)((byte)(uVar70 >> 1) & 1);
                        bVar10 = (bool)((byte)(uVar70 >> 2) & 1);
                        bVar11 = SUB81(uVar70 >> 3,0);
                        *(uint *)(local_870.ray + 0xc0) =
                             (uint)(bVar69 & 1) * *(int *)local_870.hit |
                             (uint)!(bool)(bVar69 & 1) * *(int *)(local_870.ray + 0xc0);
                        *(uint *)(local_870.ray + 0xc4) =
                             (uint)bVar9 * iVar55 | (uint)!bVar9 * *(int *)(local_870.ray + 0xc4);
                        *(uint *)(local_870.ray + 200) =
                             (uint)bVar10 * iVar56 | (uint)!bVar10 * *(int *)(local_870.ray + 200);
                        *(uint *)(local_870.ray + 0xcc) =
                             (uint)bVar11 * iVar57 | (uint)!bVar11 * *(int *)(local_870.ray + 0xcc);
                        iVar55 = *(int *)(local_870.hit + 0x14);
                        iVar56 = *(int *)(local_870.hit + 0x18);
                        iVar57 = *(int *)(local_870.hit + 0x1c);
                        bVar9 = (bool)((byte)(uVar70 >> 1) & 1);
                        bVar10 = (bool)((byte)(uVar70 >> 2) & 1);
                        bVar11 = SUB81(uVar70 >> 3,0);
                        *(uint *)(local_870.ray + 0xd0) =
                             (uint)(bVar69 & 1) * *(int *)(local_870.hit + 0x10) |
                             (uint)!(bool)(bVar69 & 1) * *(int *)(local_870.ray + 0xd0);
                        *(uint *)(local_870.ray + 0xd4) =
                             (uint)bVar9 * iVar55 | (uint)!bVar9 * *(int *)(local_870.ray + 0xd4);
                        *(uint *)(local_870.ray + 0xd8) =
                             (uint)bVar10 * iVar56 | (uint)!bVar10 * *(int *)(local_870.ray + 0xd8);
                        *(uint *)(local_870.ray + 0xdc) =
                             (uint)bVar11 * iVar57 | (uint)!bVar11 * *(int *)(local_870.ray + 0xdc);
                        iVar55 = *(int *)(local_870.hit + 0x24);
                        iVar56 = *(int *)(local_870.hit + 0x28);
                        iVar57 = *(int *)(local_870.hit + 0x2c);
                        bVar9 = (bool)((byte)(uVar70 >> 1) & 1);
                        bVar10 = (bool)((byte)(uVar70 >> 2) & 1);
                        bVar11 = SUB81(uVar70 >> 3,0);
                        *(uint *)(local_870.ray + 0xe0) =
                             (uint)(bVar69 & 1) * *(int *)(local_870.hit + 0x20) |
                             (uint)!(bool)(bVar69 & 1) * *(int *)(local_870.ray + 0xe0);
                        *(uint *)(local_870.ray + 0xe4) =
                             (uint)bVar9 * iVar55 | (uint)!bVar9 * *(int *)(local_870.ray + 0xe4);
                        *(uint *)(local_870.ray + 0xe8) =
                             (uint)bVar10 * iVar56 | (uint)!bVar10 * *(int *)(local_870.ray + 0xe8);
                        *(uint *)(local_870.ray + 0xec) =
                             (uint)bVar11 * iVar57 | (uint)!bVar11 * *(int *)(local_870.ray + 0xec);
                        iVar55 = *(int *)(local_870.hit + 0x34);
                        iVar56 = *(int *)(local_870.hit + 0x38);
                        iVar57 = *(int *)(local_870.hit + 0x3c);
                        bVar9 = (bool)((byte)(uVar70 >> 1) & 1);
                        bVar10 = (bool)((byte)(uVar70 >> 2) & 1);
                        bVar11 = SUB81(uVar70 >> 3,0);
                        *(uint *)(local_870.ray + 0xf0) =
                             (uint)(bVar69 & 1) * *(int *)(local_870.hit + 0x30) |
                             (uint)!(bool)(bVar69 & 1) * *(int *)(local_870.ray + 0xf0);
                        *(uint *)(local_870.ray + 0xf4) =
                             (uint)bVar9 * iVar55 | (uint)!bVar9 * *(int *)(local_870.ray + 0xf4);
                        *(uint *)(local_870.ray + 0xf8) =
                             (uint)bVar10 * iVar56 | (uint)!bVar10 * *(int *)(local_870.ray + 0xf8);
                        *(uint *)(local_870.ray + 0xfc) =
                             (uint)bVar11 * iVar57 | (uint)!bVar11 * *(int *)(local_870.ray + 0xfc);
                        iVar55 = *(int *)(local_870.hit + 0x44);
                        iVar56 = *(int *)(local_870.hit + 0x48);
                        iVar57 = *(int *)(local_870.hit + 0x4c);
                        bVar9 = (bool)((byte)(uVar70 >> 1) & 1);
                        bVar10 = (bool)((byte)(uVar70 >> 2) & 1);
                        bVar11 = SUB81(uVar70 >> 3,0);
                        *(uint *)(local_870.ray + 0x100) =
                             (uint)(bVar69 & 1) * *(int *)(local_870.hit + 0x40) |
                             (uint)!(bool)(bVar69 & 1) * *(int *)(local_870.ray + 0x100);
                        *(uint *)(local_870.ray + 0x104) =
                             (uint)bVar9 * iVar55 | (uint)!bVar9 * *(int *)(local_870.ray + 0x104);
                        *(uint *)(local_870.ray + 0x108) =
                             (uint)bVar10 * iVar56 | (uint)!bVar10 * *(int *)(local_870.ray + 0x108)
                        ;
                        *(uint *)(local_870.ray + 0x10c) =
                             (uint)bVar11 * iVar57 | (uint)!bVar11 * *(int *)(local_870.ray + 0x10c)
                        ;
                        auVar78 = vmovdqu32_avx512vl(*(undefined1 (*) [16])(local_870.hit + 0x50));
                        *(undefined1 (*) [16])(local_870.ray + 0x110) = auVar78;
                        auVar78 = vmovdqu32_avx512vl(*(undefined1 (*) [16])(local_870.hit + 0x60));
                        *(undefined1 (*) [16])(local_870.ray + 0x120) = auVar78;
                        auVar78 = vmovdqa32_avx512vl(*(undefined1 (*) [16])(local_870.hit + 0x70));
                        *(undefined1 (*) [16])(local_870.ray + 0x130) = auVar78;
                        auVar78 = vmovdqa32_avx512vl(*(undefined1 (*) [16])(local_870.hit + 0x80));
                        *(undefined1 (*) [16])(local_870.ray + 0x140) = auVar78;
                        break;
                      }
                    }
                    *(float *)(ray + k * 4 + 0x80) = fVar257;
                    break;
                  }
                }
                lVar68 = lVar68 + -1;
              } while (lVar68 != 0);
              uVar165 = *(undefined4 *)(ray + k * 4 + 0x80);
              auVar155._4_4_ = uVar165;
              auVar155._0_4_ = uVar165;
              auVar155._8_4_ = uVar165;
              auVar155._12_4_ = uVar165;
              auVar155._16_4_ = uVar165;
              auVar155._20_4_ = uVar165;
              auVar155._24_4_ = uVar165;
              auVar155._28_4_ = uVar165;
              auVar58._4_4_ = fStack_3bc;
              auVar58._0_4_ = local_3c0;
              auVar58._8_4_ = fStack_3b8;
              auVar58._12_4_ = fStack_3b4;
              auVar58._16_4_ = fStack_3b0;
              auVar58._20_4_ = fStack_3ac;
              auVar58._24_4_ = fStack_3a8;
              auVar58._28_4_ = fStack_3a4;
              uVar17 = vcmpps_avx512vl(auVar155,auVar58,0xd);
              bVar67 = ~('\x01' << ((byte)iVar21 & 0x1f)) & bVar67 & (byte)uVar17;
            } while (bVar67 != 0);
            uVar71 = (ulong)local_9b0;
            auVar241 = ZEXT3264(local_320);
          }
          bVar67 = local_3e0[0] | (byte)uVar71;
          auVar180._0_4_ = (float)local_6e0._0_4_ + auVar241._0_4_;
          auVar180._4_4_ = (float)local_6e0._4_4_ + auVar241._4_4_;
          auVar180._8_4_ = fStack_6d8 + auVar241._8_4_;
          auVar180._12_4_ = fStack_6d4 + auVar241._12_4_;
          auVar180._16_4_ = fStack_6d0 + auVar241._16_4_;
          auVar180._20_4_ = fStack_6cc + auVar241._20_4_;
          auVar180._24_4_ = fStack_6c8 + auVar241._24_4_;
          auVar180._28_4_ = fStack_6c4 + auVar241._28_4_;
          uVar17 = vcmpps_avx512vl(auVar180,auVar155,2);
          bVar61 = (byte)uVar18 & bVar61 & (byte)uVar17;
          auVar181._8_4_ = 2;
          auVar181._0_8_ = 0x200000002;
          auVar181._12_4_ = 2;
          auVar181._16_4_ = 2;
          auVar181._20_4_ = 2;
          auVar181._24_4_ = 2;
          auVar181._28_4_ = 2;
          auVar38._8_4_ = 3;
          auVar38._0_8_ = 0x300000003;
          auVar38._12_4_ = 3;
          auVar38._16_4_ = 3;
          auVar38._20_4_ = 3;
          auVar38._24_4_ = 3;
          auVar38._28_4_ = 3;
          auVar91 = vpblendmd_avx512vl(auVar181,auVar38);
          auVar127._0_4_ = (uint)(bVar67 & 1) * auVar91._0_4_ | (uint)!(bool)(bVar67 & 1) * 2;
          bVar9 = (bool)(bVar67 >> 1 & 1);
          auVar127._4_4_ = (uint)bVar9 * auVar91._4_4_ | (uint)!bVar9 * 2;
          bVar9 = (bool)(bVar67 >> 2 & 1);
          auVar127._8_4_ = (uint)bVar9 * auVar91._8_4_ | (uint)!bVar9 * 2;
          bVar9 = (bool)(bVar67 >> 3 & 1);
          auVar127._12_4_ = (uint)bVar9 * auVar91._12_4_ | (uint)!bVar9 * 2;
          bVar9 = (bool)(bVar67 >> 4 & 1);
          auVar127._16_4_ = (uint)bVar9 * auVar91._16_4_ | (uint)!bVar9 * 2;
          bVar9 = (bool)(bVar67 >> 5 & 1);
          auVar127._20_4_ = (uint)bVar9 * auVar91._20_4_ | (uint)!bVar9 * 2;
          bVar9 = (bool)(bVar67 >> 6 & 1);
          auVar127._24_4_ = (uint)bVar9 * auVar91._24_4_ | (uint)!bVar9 * 2;
          auVar127._28_4_ = (uint)(bVar67 >> 7) * auVar91._28_4_ | (uint)!(bool)(bVar67 >> 7) * 2;
          uVar17 = vpcmpd_avx512vl(local_380,auVar127,5);
          bVar67 = (byte)uVar17 & bVar61;
          fVar253 = (float)local_6e0._0_4_;
          fVar256 = (float)local_6e0._4_4_;
          fVar257 = fStack_6d8;
          fVar258 = fStack_6d4;
          fVar220 = fStack_6d0;
          fVar221 = fStack_6cc;
          fVar222 = fStack_6c8;
          fVar248 = fStack_6c4;
          if (bVar67 != 0) {
            local_3e0 = auVar127;
            auVar77 = vminps_avx(local_660._0_16_,local_6a0._0_16_);
            auVar78 = vmaxps_avx(local_660._0_16_,local_6a0._0_16_);
            auVar80 = vminps_avx(local_680._0_16_,local_6c0._0_16_);
            auVar85 = vminps_avx(auVar77,auVar80);
            auVar77 = vmaxps_avx(local_680._0_16_,local_6c0._0_16_);
            auVar80 = vmaxps_avx(auVar78,auVar77);
            auVar198._8_4_ = 0x7fffffff;
            auVar198._0_8_ = 0x7fffffff7fffffff;
            auVar198._12_4_ = 0x7fffffff;
            auVar78 = vandps_avx(auVar85,auVar198);
            auVar77 = vandps_avx(auVar80,auVar198);
            auVar78 = vmaxps_avx(auVar78,auVar77);
            auVar77 = vmovshdup_avx(auVar78);
            auVar77 = vmaxss_avx(auVar77,auVar78);
            auVar78 = vshufpd_avx(auVar78,auVar78,1);
            auVar78 = vmaxss_avx(auVar78,auVar77);
            fVar253 = auVar78._0_4_ * 1.9073486e-06;
            local_630 = vshufps_avx(auVar80,auVar80,0xff);
            local_3c0 = (float)local_6e0._0_4_ + local_360._0_4_;
            fStack_3bc = (float)local_6e0._4_4_ + local_360._4_4_;
            fStack_3b8 = fStack_6d8 + local_360._8_4_;
            fStack_3b4 = fStack_6d4 + local_360._12_4_;
            fStack_3b0 = fStack_6d0 + local_360._16_4_;
            fStack_3ac = fStack_6cc + local_360._20_4_;
            fStack_3a8 = fStack_6c8 + local_360._24_4_;
            fStack_3a4 = fStack_6c4 + local_360._28_4_;
            _local_5e0 = local_360;
            do {
              auVar156._8_4_ = 0x7f800000;
              auVar156._0_8_ = 0x7f8000007f800000;
              auVar156._12_4_ = 0x7f800000;
              auVar156._16_4_ = 0x7f800000;
              auVar156._20_4_ = 0x7f800000;
              auVar156._24_4_ = 0x7f800000;
              auVar156._28_4_ = 0x7f800000;
              auVar91 = vblendmps_avx512vl(auVar156,_local_5e0);
              auVar128._0_4_ =
                   (uint)(bVar67 & 1) * auVar91._0_4_ | (uint)!(bool)(bVar67 & 1) * 0x7f800000;
              bVar9 = (bool)(bVar67 >> 1 & 1);
              auVar128._4_4_ = (uint)bVar9 * auVar91._4_4_ | (uint)!bVar9 * 0x7f800000;
              bVar9 = (bool)(bVar67 >> 2 & 1);
              auVar128._8_4_ = (uint)bVar9 * auVar91._8_4_ | (uint)!bVar9 * 0x7f800000;
              bVar9 = (bool)(bVar67 >> 3 & 1);
              auVar128._12_4_ = (uint)bVar9 * auVar91._12_4_ | (uint)!bVar9 * 0x7f800000;
              bVar9 = (bool)(bVar67 >> 4 & 1);
              auVar128._16_4_ = (uint)bVar9 * auVar91._16_4_ | (uint)!bVar9 * 0x7f800000;
              bVar9 = (bool)(bVar67 >> 5 & 1);
              auVar128._20_4_ = (uint)bVar9 * auVar91._20_4_ | (uint)!bVar9 * 0x7f800000;
              auVar128._24_4_ =
                   (uint)(bVar67 >> 6) * auVar91._24_4_ | (uint)!(bool)(bVar67 >> 6) * 0x7f800000;
              auVar128._28_4_ = 0x7f800000;
              auVar91 = vshufps_avx(auVar128,auVar128,0xb1);
              auVar91 = vminps_avx(auVar128,auVar91);
              auVar88 = vshufpd_avx(auVar91,auVar91,5);
              auVar91 = vminps_avx(auVar91,auVar88);
              auVar88 = vpermpd_avx2(auVar91,0x4e);
              auVar91 = vminps_avx(auVar91,auVar88);
              uVar17 = vcmpps_avx512vl(auVar128,auVar91,0);
              bVar62 = (byte)uVar17 & bVar67;
              bVar69 = bVar67;
              if (bVar62 != 0) {
                bVar69 = bVar62;
              }
              iVar21 = 0;
              for (uVar73 = (uint)bVar69; (uVar73 & 1) == 0; uVar73 = uVar73 >> 1 | 0x80000000) {
                iVar21 = iVar21 + 1;
              }
              auVar184 = ZEXT464(*(uint *)(local_1c0 + (uint)(iVar21 << 2)));
              auVar255 = ZEXT464(*(uint *)(local_340 + (uint)(iVar21 << 2)));
              fVar256 = local_9a4;
              if ((float)local_700._0_4_ < 0.0) {
                local_8a0._0_16_ = ZEXT416(*(uint *)(local_1c0 + (uint)(iVar21 << 2)));
                local_780._0_16_ = ZEXT416(*(uint *)(local_340 + (uint)(iVar21 << 2)));
                fVar256 = sqrtf((float)local_700._0_4_);
                auVar255 = ZEXT1664(local_780._0_16_);
                auVar184 = ZEXT1664(local_8a0._0_16_);
              }
              lVar68 = 5;
              do {
                local_780._0_16_ = auVar255._0_16_;
                uVar165 = auVar255._0_4_;
                auVar147._4_4_ = uVar165;
                auVar147._0_4_ = uVar165;
                auVar147._8_4_ = uVar165;
                auVar147._12_4_ = uVar165;
                auVar78 = vfmadd132ps_fma(auVar147,ZEXT816(0) << 0x40,local_6f0);
                fVar221 = auVar184._0_4_;
                fVar223 = 1.0 - fVar221;
                fVar220 = fVar223 * fVar223 * fVar223;
                fVar257 = fVar221 * fVar221;
                fVar248 = fVar221 * fVar257;
                auVar77 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40800000),0),ZEXT416((uint)fVar220),
                                          ZEXT416((uint)fVar248));
                fVar258 = fVar221 * fVar223;
                auVar227 = ZEXT416((uint)fVar223);
                auVar85 = vfmadd231ss_fma(ZEXT416((uint)(fVar221 * fVar258 * 6.0)),
                                          ZEXT416((uint)(fVar258 * fVar223)),
                                          SUB6416(ZEXT464(0x41400000),0));
                auVar80 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40800000),0),ZEXT416((uint)fVar248),
                                          ZEXT416((uint)fVar220));
                auVar86 = vfmadd231ss_fma(ZEXT416((uint)(fVar258 * fVar223 * 6.0)),
                                          SUB6416(ZEXT464(0x41400000),0),
                                          ZEXT416((uint)(fVar221 * fVar258)));
                fVar220 = fVar220 * 0.16666667;
                fVar221 = (auVar77._0_4_ + auVar85._0_4_) * 0.16666667;
                fVar222 = (auVar80._0_4_ + auVar86._0_4_) * 0.16666667;
                fVar248 = fVar248 * 0.16666667;
                auVar199._0_4_ = fVar248 * (float)local_6c0._0_4_;
                auVar199._4_4_ = fVar248 * (float)local_6c0._4_4_;
                auVar199._8_4_ = fVar248 * fStack_6b8;
                auVar199._12_4_ = fVar248 * fStack_6b4;
                auVar230._4_4_ = fVar222;
                auVar230._0_4_ = fVar222;
                auVar230._8_4_ = fVar222;
                auVar230._12_4_ = fVar222;
                auVar77 = vfmadd132ps_fma(auVar230,auVar199,local_680._0_16_);
                auVar200._4_4_ = fVar221;
                auVar200._0_4_ = fVar221;
                auVar200._8_4_ = fVar221;
                auVar200._12_4_ = fVar221;
                auVar77 = vfmadd132ps_fma(auVar200,auVar77,local_6a0._0_16_);
                auVar174._4_4_ = fVar220;
                auVar174._0_4_ = fVar220;
                auVar174._8_4_ = fVar220;
                auVar174._12_4_ = fVar220;
                auVar77 = vfmadd132ps_fma(auVar174,auVar77,local_660._0_16_);
                local_540._0_16_ = auVar77;
                auVar78 = vsubps_avx(auVar78,auVar77);
                local_720._0_16_ = auVar78;
                auVar78 = vdpps_avx(auVar78,auVar78,0x7f);
                local_8a0._0_16_ = auVar184._0_16_;
                local_740._0_16_ = auVar78;
                if (auVar78._0_4_ < 0.0) {
                  local_7a0._0_4_ = fVar257;
                  local_7c0._0_4_ = fVar258;
                  auVar259._0_4_ = sqrtf(auVar78._0_4_);
                  auVar259._4_60_ = extraout_var_01;
                  auVar78 = auVar259._0_16_;
                  fVar258 = (float)local_7c0._0_4_;
                  auVar77 = local_8a0._0_16_;
                }
                else {
                  auVar78 = vsqrtss_avx(auVar78,auVar78);
                  local_7a0._0_4_ = fVar257;
                  auVar77 = auVar184._0_16_;
                }
                local_560._4_4_ = fVar223;
                local_560._0_4_ = fVar223;
                fStack_558 = fVar223;
                fStack_554 = fVar223;
                auVar80 = vfnmsub213ss_fma(auVar77,auVar77,ZEXT416((uint)(fVar258 * 4.0)));
                auVar77 = vfmadd231ss_fma(ZEXT416((uint)(fVar258 * 4.0)),auVar227,auVar227);
                fVar257 = fVar223 * -fVar223 * 0.5;
                fVar258 = auVar80._0_4_ * 0.5;
                fVar220 = auVar77._0_4_ * 0.5;
                local_7a0._0_4_ = (float)local_7a0._0_4_ * 0.5;
                auVar218._0_4_ = (float)local_7a0._0_4_ * (float)local_6c0._0_4_;
                auVar218._4_4_ = (float)local_7a0._0_4_ * (float)local_6c0._4_4_;
                auVar218._8_4_ = (float)local_7a0._0_4_ * fStack_6b8;
                auVar218._12_4_ = (float)local_7a0._0_4_ * fStack_6b4;
                auVar175._4_4_ = fVar220;
                auVar175._0_4_ = fVar220;
                auVar175._8_4_ = fVar220;
                auVar175._12_4_ = fVar220;
                auVar77 = vfmadd132ps_fma(auVar175,auVar218,local_680._0_16_);
                auVar201._4_4_ = fVar258;
                auVar201._0_4_ = fVar258;
                auVar201._8_4_ = fVar258;
                auVar201._12_4_ = fVar258;
                auVar77 = vfmadd132ps_fma(auVar201,auVar77,local_6a0._0_16_);
                auVar265._4_4_ = fVar257;
                auVar265._0_4_ = fVar257;
                auVar265._8_4_ = fVar257;
                auVar265._12_4_ = fVar257;
                _local_7a0 = vfmadd132ps_fma(auVar265,auVar77,local_660._0_16_);
                local_580._0_16_ = vdpps_avx(_local_7a0,_local_7a0,0x7f);
                auVar54._12_4_ = 0;
                auVar54._0_12_ = ZEXT812(0);
                fVar257 = local_580._0_4_;
                auVar80 = vrsqrt14ss_avx512f(auVar54 << 0x20,ZEXT416((uint)fVar257));
                local_5a0._0_16_ = vrcp14ss_avx512f(auVar54 << 0x20,ZEXT416((uint)fVar257));
                auVar77 = vfnmadd213ss_fma(local_5a0._0_16_,local_580._0_16_,ZEXT416(0x40000000));
                local_5c0._0_4_ = auVar77._0_4_;
                local_7c0._0_4_ = auVar78._0_4_;
                if (fVar257 < -fVar257) {
                  local_760 = auVar80;
                  auVar262._0_4_ = sqrtf(fVar257);
                  auVar262._4_60_ = extraout_var_02;
                  auVar78 = ZEXT416((uint)local_7c0._0_4_);
                  auVar86 = auVar262._0_16_;
                  auVar77 = local_760;
                  auVar85 = _local_7a0;
                }
                else {
                  auVar86 = vsqrtss_avx512f(local_580._0_16_,local_580._0_16_);
                  auVar77 = auVar80;
                  auVar85 = _local_7a0;
                }
                fVar258 = auVar77._0_4_;
                fVar257 = auVar80._0_4_ * 1.5 + fVar257 * -0.5 * fVar258 * fVar258 * fVar258;
                auVar271._0_4_ = auVar85._0_4_ * fVar257;
                auVar271._4_4_ = auVar85._4_4_ * fVar257;
                auVar271._8_4_ = auVar85._8_4_ * fVar257;
                auVar271._12_4_ = auVar85._12_4_ * fVar257;
                auVar77 = vdpps_avx(local_720._0_16_,auVar271,0x7f);
                fVar258 = auVar78._0_4_ + 1.0;
                fVar220 = auVar77._0_4_;
                auVar148._0_4_ = fVar220 * fVar220;
                auVar148._4_4_ = auVar77._4_4_ * auVar77._4_4_;
                auVar148._8_4_ = auVar77._8_4_ * auVar77._8_4_;
                auVar148._12_4_ = auVar77._12_4_ * auVar77._12_4_;
                auVar80 = vsubps_avx(local_740._0_16_,auVar148);
                fVar221 = auVar80._0_4_;
                auVar176._4_12_ = ZEXT812(0) << 0x20;
                auVar176._0_4_ = fVar221;
                auVar81 = vrsqrt14ss_avx512f(ZEXT816(0) << 0x40,auVar176);
                auVar79 = vmulss_avx512f(auVar81,ZEXT416(0x3fc00000));
                auVar82 = vmulss_avx512f(auVar80,ZEXT416(0xbf000000));
                if (fVar221 < 0.0) {
                  local_760._0_4_ = fVar258;
                  local_620 = fVar257;
                  fStack_61c = fVar257;
                  fStack_618 = fVar257;
                  fStack_614 = fVar257;
                  local_610 = auVar271;
                  local_600 = auVar81;
                  fVar221 = sqrtf(fVar221);
                  auVar82 = ZEXT416(auVar82._0_4_);
                  auVar79 = ZEXT416(auVar79._0_4_);
                  auVar86 = ZEXT416(auVar86._0_4_);
                  auVar78 = ZEXT416((uint)local_7c0._0_4_);
                  auVar85 = _local_7a0;
                  fVar258 = (float)local_760._0_4_;
                  auVar271 = local_610;
                  auVar81 = local_600;
                  fVar257 = local_620;
                  fVar222 = fStack_61c;
                  fVar248 = fStack_618;
                  fVar223 = fStack_614;
                }
                else {
                  auVar80 = vsqrtss_avx(auVar80,auVar80);
                  fVar221 = auVar80._0_4_;
                  fVar222 = fVar257;
                  fVar248 = fVar257;
                  fVar223 = fVar257;
                }
                auVar267 = ZEXT1664(auVar85);
                auVar262 = ZEXT1664(local_740._0_16_);
                auVar259 = ZEXT1664(local_720._0_16_);
                auVar280 = ZEXT3264(local_8e0);
                auVar272 = ZEXT3264(local_900);
                auVar273 = ZEXT3264(local_920);
                auVar274 = ZEXT3264(local_940);
                auVar275 = ZEXT3264(local_7e0);
                auVar276 = ZEXT3264(local_960);
                auVar277 = ZEXT3264(local_800);
                auVar278 = ZEXT3264(local_980);
                auVar279 = ZEXT3264(local_9a0);
                auVar281 = ZEXT3264(local_820);
                auVar282 = ZEXT3264(local_840);
                auVar283 = ZEXT3264(local_8c0);
                auVar84 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),auVar227,local_8a0._0_16_);
                auVar80 = vfmadd231ss_fma(auVar227,local_8a0._0_16_,SUB6416(ZEXT464(0xc0000000),0));
                fVar234 = local_8a0._0_4_;
                auVar202._0_4_ = fVar234 * (float)local_6c0._0_4_;
                auVar202._4_4_ = fVar234 * (float)local_6c0._4_4_;
                auVar202._8_4_ = fVar234 * fStack_6b8;
                auVar202._12_4_ = fVar234 * fStack_6b4;
                auVar219._0_4_ = auVar80._0_4_;
                auVar219._4_4_ = auVar219._0_4_;
                auVar219._8_4_ = auVar219._0_4_;
                auVar219._12_4_ = auVar219._0_4_;
                auVar80 = vfmadd132ps_fma(auVar219,auVar202,local_680._0_16_);
                auVar177._0_4_ = auVar84._0_4_;
                auVar177._4_4_ = auVar177._0_4_;
                auVar177._8_4_ = auVar177._0_4_;
                auVar177._12_4_ = auVar177._0_4_;
                auVar80 = vfmadd132ps_fma(auVar177,auVar80,local_6a0._0_16_);
                auVar80 = vfmadd132ps_fma(_local_560,auVar80,local_660._0_16_);
                auVar178._0_4_ = auVar80._0_4_ * (float)local_580._0_4_;
                auVar178._4_4_ = auVar80._4_4_ * (float)local_580._0_4_;
                auVar178._8_4_ = auVar80._8_4_ * (float)local_580._0_4_;
                auVar178._12_4_ = auVar80._12_4_ * (float)local_580._0_4_;
                auVar80 = vdpps_avx(auVar85,auVar80,0x7f);
                fVar233 = auVar80._0_4_;
                auVar203._0_4_ = auVar85._0_4_ * fVar233;
                auVar203._4_4_ = auVar85._4_4_ * fVar233;
                auVar203._8_4_ = auVar85._8_4_ * fVar233;
                auVar203._12_4_ = auVar85._12_4_ * fVar233;
                auVar80 = vsubps_avx(auVar178,auVar203);
                fVar233 = (float)local_5c0._0_4_ * (float)local_5a0._0_4_;
                auVar31._8_4_ = 0x80000000;
                auVar31._0_8_ = 0x8000000080000000;
                auVar31._12_4_ = 0x80000000;
                auVar83 = vxorps_avx512vl(auVar85,auVar31);
                auVar231._0_4_ = fVar257 * auVar80._0_4_ * fVar233;
                auVar231._4_4_ = fVar222 * auVar80._4_4_ * fVar233;
                auVar231._8_4_ = fVar248 * auVar80._8_4_ * fVar233;
                auVar231._12_4_ = fVar223 * auVar80._12_4_ * fVar233;
                auVar80 = vdpps_avx(auVar83,auVar271,0x7f);
                auVar227 = vmaxss_avx(ZEXT416((uint)fVar253),
                                      ZEXT416((uint)((float)local_780._0_4_ *
                                                    fVar256 * 1.9073486e-06)));
                auVar84 = vdivss_avx512f(ZEXT416((uint)fVar253),auVar86);
                auVar86 = vdpps_avx(local_720._0_16_,auVar231,0x7f);
                auVar78 = vfmadd213ss_fma(auVar78,ZEXT416((uint)fVar253),auVar227);
                auVar84 = vfmadd213ss_fma(ZEXT416((uint)fVar258),auVar84,auVar78);
                auVar78 = vdpps_avx(local_6f0,auVar271,0x7f);
                fVar257 = auVar80._0_4_ + auVar86._0_4_;
                auVar80 = vdpps_avx(local_720._0_16_,auVar83,0x7f);
                auVar82 = vmulss_avx512f(auVar82,auVar81);
                auVar81 = vmulss_avx512f(auVar81,auVar81);
                auVar86 = vdpps_avx(local_720._0_16_,local_6f0,0x7f);
                auVar82 = vaddss_avx512f(auVar79,ZEXT416((uint)(auVar82._0_4_ * auVar81._0_4_)));
                auVar81 = vfnmadd231ss_fma(auVar80,auVar77,ZEXT416((uint)fVar257));
                auVar79 = vfnmadd231ss_fma(auVar86,auVar77,auVar78);
                auVar80 = vpermilps_avx(local_540._0_16_,0xff);
                fVar221 = fVar221 - auVar80._0_4_;
                auVar80 = vshufps_avx(auVar85,auVar85,0xff);
                auVar86 = vfmsub213ss_fma(auVar81,auVar82,auVar80);
                fVar258 = auVar79._0_4_ * auVar82._0_4_;
                auVar81 = vfmsub231ss_fma(ZEXT416((uint)(auVar78._0_4_ * auVar86._0_4_)),
                                          ZEXT416((uint)fVar257),ZEXT416((uint)fVar258));
                auVar252 = ZEXT1664(auVar81);
                fVar248 = auVar81._0_4_;
                fVar222 = fVar220 * (auVar86._0_4_ / fVar248);
                auVar241 = ZEXT464((uint)fVar222);
                fVar234 = fVar234 - (fVar220 * (fVar258 / fVar248) -
                                    fVar221 * (auVar78._0_4_ / fVar248));
                auVar184 = ZEXT464((uint)fVar234);
                fVar257 = (float)local_780._0_4_ - (fVar221 * (fVar257 / fVar248) - fVar222);
                auVar255 = ZEXT464((uint)fVar257);
                auVar32._8_4_ = 0x7fffffff;
                auVar32._0_8_ = 0x7fffffff7fffffff;
                auVar32._12_4_ = 0x7fffffff;
                auVar78 = vandps_avx512vl(auVar77,auVar32);
                if (auVar78._0_4_ < auVar84._0_4_) {
                  auVar78 = vfmadd231ss_fma(ZEXT416((uint)(auVar84._0_4_ + auVar227._0_4_)),
                                            local_630,ZEXT416(0x36000000));
                  auVar33._8_4_ = 0x7fffffff;
                  auVar33._0_8_ = 0x7fffffff7fffffff;
                  auVar33._12_4_ = 0x7fffffff;
                  auVar77 = vandps_avx512vl(ZEXT416((uint)fVar221),auVar33);
                  if (auVar77._0_4_ < auVar78._0_4_) {
                    fVar256 = fVar257 + (float)local_640._0_4_;
                    if (fVar256 < fVar158) break;
                    fVar258 = *(float *)(ray + k * 4 + 0x80);
                    auVar241 = ZEXT464((uint)fVar258);
                    if (((fVar258 < fVar256) || (fVar234 < 0.0)) || (1.0 < fVar234)) break;
                    auVar204._4_12_ = SUB1612(ZEXT816(0),0);
                    auVar204._0_4_ = local_740._0_4_;
                    auVar78 = vrsqrt14ss_avx512f(ZEXT816(0) << 0x20,auVar204);
                    fVar220 = auVar78._0_4_;
                    pGVar4 = (context->scene->geometries).items[uVar63].ptr;
                    if ((pGVar4->mask & *(uint *)(ray + k * 4 + 0x90)) == 0) break;
                    fVar220 = fVar220 * 1.5 + local_740._0_4_ * -0.5 * fVar220 * fVar220 * fVar220;
                    auVar205._0_4_ = local_720._0_4_ * fVar220;
                    auVar205._4_4_ = local_720._4_4_ * fVar220;
                    auVar205._8_4_ = local_720._8_4_ * fVar220;
                    auVar205._12_4_ = local_720._12_4_ * fVar220;
                    auVar86 = vfmadd213ps_fma(auVar80,auVar205,auVar85);
                    auVar78 = vshufps_avx(auVar205,auVar205,0xc9);
                    auVar77 = vshufps_avx(auVar85,auVar85,0xc9);
                    auVar206._0_4_ = auVar205._0_4_ * auVar77._0_4_;
                    auVar206._4_4_ = auVar205._4_4_ * auVar77._4_4_;
                    auVar206._8_4_ = auVar205._8_4_ * auVar77._8_4_;
                    auVar206._12_4_ = auVar205._12_4_ * auVar77._12_4_;
                    auVar80 = vfmsub231ps_fma(auVar206,auVar85,auVar78);
                    auVar78 = vshufps_avx(auVar80,auVar80,0xc9);
                    auVar77 = vshufps_avx(auVar86,auVar86,0xc9);
                    auVar80 = vshufps_avx(auVar80,auVar80,0xd2);
                    auVar149._0_4_ = auVar86._0_4_ * auVar80._0_4_;
                    auVar149._4_4_ = auVar86._4_4_ * auVar80._4_4_;
                    auVar149._8_4_ = auVar86._8_4_ * auVar80._8_4_;
                    auVar149._12_4_ = auVar86._12_4_ * auVar80._12_4_;
                    auVar78 = vfmsub231ps_fma(auVar149,auVar78,auVar77);
                    uVar165 = auVar78._0_4_;
                    if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                       (pGVar4->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                      *(float *)(ray + k * 4 + 0x80) = fVar256;
                      uVar3 = vextractps_avx(auVar78,1);
                      *(undefined4 *)(ray + k * 4 + 0xc0) = uVar3;
                      uVar3 = vextractps_avx(auVar78,2);
                      *(undefined4 *)(ray + k * 4 + 0xd0) = uVar3;
                      *(undefined4 *)(ray + k * 4 + 0xe0) = uVar165;
                      *(float *)(ray + k * 4 + 0xf0) = fVar234;
                      *(undefined4 *)(ray + k * 4 + 0x100) = 0;
                      *(int *)(ray + k * 4 + 0x110) = (int)local_748;
                      *(uint *)(ray + k * 4 + 0x120) = uVar63;
                      *(uint *)(ray + k * 4 + 0x130) = context->user->instID[0];
                      *(uint *)(ray + k * 4 + 0x140) = context->user->instPrimID[0];
                      break;
                    }
                    local_4e0 = (RTCHitN  [16])vshufps_avx(auVar78,auVar78,0x55);
                    auStack_4d0 = vshufps_avx(auVar78,auVar78,0xaa);
                    local_4c0 = uVar165;
                    uStack_4bc = uVar165;
                    uStack_4b8 = uVar165;
                    uStack_4b4 = uVar165;
                    local_4b0 = fVar234;
                    fStack_4ac = fVar234;
                    fStack_4a8 = fVar234;
                    fStack_4a4 = fVar234;
                    local_4a0 = ZEXT416(0) << 0x20;
                    local_490 = local_500._0_8_;
                    uStack_488 = local_500._8_8_;
                    local_480 = local_4f0;
                    vpcmpeqd_avx2(ZEXT1632(local_4f0),ZEXT1632(local_4f0));
                    uStack_46c = context->user->instID[0];
                    local_470 = uStack_46c;
                    uStack_468 = uStack_46c;
                    uStack_464 = uStack_46c;
                    uStack_460 = context->user->instPrimID[0];
                    uStack_45c = uStack_460;
                    uStack_458 = uStack_460;
                    uStack_454 = uStack_460;
                    *(float *)(ray + k * 4 + 0x80) = fVar256;
                    local_9c0 = local_510;
                    local_870.valid = (int *)local_9c0;
                    local_870.geometryUserPtr = pGVar4->userPtr;
                    local_870.context = context->user;
                    local_870.hit = local_4e0;
                    local_870.N = 4;
                    local_870.ray = (RTCRayN *)ray;
                    if (pGVar4->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                      auVar252 = ZEXT1664(auVar81);
                      auVar255 = ZEXT464((uint)fVar257);
                      auVar259 = ZEXT1664(local_720._0_16_);
                      auVar262 = ZEXT1664(local_740._0_16_);
                      auVar267 = ZEXT1664(auVar85);
                      (*pGVar4->intersectionFilterN)(&local_870);
                      auVar283 = ZEXT3264(local_8c0);
                      auVar282 = ZEXT3264(local_840);
                      auVar281 = ZEXT3264(local_820);
                      auVar279 = ZEXT3264(local_9a0);
                      auVar278 = ZEXT3264(local_980);
                      auVar277 = ZEXT3264(local_800);
                      auVar276 = ZEXT3264(local_960);
                      auVar275 = ZEXT3264(local_7e0);
                      auVar274 = ZEXT3264(local_940);
                      auVar273 = ZEXT3264(local_920);
                      auVar272 = ZEXT3264(local_900);
                      auVar280 = ZEXT3264(local_8e0);
                    }
                    uVar70 = vptestmd_avx512vl(local_9c0,local_9c0);
                    if ((uVar70 & 0xf) != 0) {
                      p_Var8 = context->args->filter;
                      if ((p_Var8 != (RTCFilterFunctionN)0x0) &&
                         (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                           RTC_RAY_QUERY_FLAG_INCOHERENT ||
                          (((pGVar4->field_8).field_0x2 & 0x40) != 0)))) {
                        auVar252 = ZEXT1664(auVar252._0_16_);
                        auVar255 = ZEXT1664(auVar255._0_16_);
                        auVar259 = ZEXT1664(auVar259._0_16_);
                        auVar262 = ZEXT1664(auVar262._0_16_);
                        auVar267 = ZEXT1664(auVar267._0_16_);
                        (*p_Var8)(&local_870);
                        auVar283 = ZEXT3264(local_8c0);
                        auVar282 = ZEXT3264(local_840);
                        auVar281 = ZEXT3264(local_820);
                        auVar279 = ZEXT3264(local_9a0);
                        auVar278 = ZEXT3264(local_980);
                        auVar277 = ZEXT3264(local_800);
                        auVar276 = ZEXT3264(local_960);
                        auVar275 = ZEXT3264(local_7e0);
                        auVar274 = ZEXT3264(local_940);
                        auVar273 = ZEXT3264(local_920);
                        auVar272 = ZEXT3264(local_900);
                        auVar280 = ZEXT3264(local_8e0);
                      }
                      auVar241 = ZEXT464((uint)fVar258);
                      uVar70 = vptestmd_avx512vl(local_9c0,local_9c0);
                      uVar70 = uVar70 & 0xf;
                      bVar69 = (byte)uVar70;
                      if (bVar69 != 0) {
                        iVar55 = *(int *)(local_870.hit + 4);
                        iVar56 = *(int *)(local_870.hit + 8);
                        iVar57 = *(int *)(local_870.hit + 0xc);
                        bVar9 = (bool)((byte)(uVar70 >> 1) & 1);
                        bVar10 = (bool)((byte)(uVar70 >> 2) & 1);
                        bVar11 = SUB81(uVar70 >> 3,0);
                        *(uint *)(local_870.ray + 0xc0) =
                             (uint)(bVar69 & 1) * *(int *)local_870.hit |
                             (uint)!(bool)(bVar69 & 1) * *(int *)(local_870.ray + 0xc0);
                        *(uint *)(local_870.ray + 0xc4) =
                             (uint)bVar9 * iVar55 | (uint)!bVar9 * *(int *)(local_870.ray + 0xc4);
                        *(uint *)(local_870.ray + 200) =
                             (uint)bVar10 * iVar56 | (uint)!bVar10 * *(int *)(local_870.ray + 200);
                        *(uint *)(local_870.ray + 0xcc) =
                             (uint)bVar11 * iVar57 | (uint)!bVar11 * *(int *)(local_870.ray + 0xcc);
                        iVar55 = *(int *)(local_870.hit + 0x14);
                        iVar56 = *(int *)(local_870.hit + 0x18);
                        iVar57 = *(int *)(local_870.hit + 0x1c);
                        bVar9 = (bool)((byte)(uVar70 >> 1) & 1);
                        bVar10 = (bool)((byte)(uVar70 >> 2) & 1);
                        bVar11 = SUB81(uVar70 >> 3,0);
                        *(uint *)(local_870.ray + 0xd0) =
                             (uint)(bVar69 & 1) * *(int *)(local_870.hit + 0x10) |
                             (uint)!(bool)(bVar69 & 1) * *(int *)(local_870.ray + 0xd0);
                        *(uint *)(local_870.ray + 0xd4) =
                             (uint)bVar9 * iVar55 | (uint)!bVar9 * *(int *)(local_870.ray + 0xd4);
                        *(uint *)(local_870.ray + 0xd8) =
                             (uint)bVar10 * iVar56 | (uint)!bVar10 * *(int *)(local_870.ray + 0xd8);
                        *(uint *)(local_870.ray + 0xdc) =
                             (uint)bVar11 * iVar57 | (uint)!bVar11 * *(int *)(local_870.ray + 0xdc);
                        iVar55 = *(int *)(local_870.hit + 0x24);
                        iVar56 = *(int *)(local_870.hit + 0x28);
                        iVar57 = *(int *)(local_870.hit + 0x2c);
                        bVar9 = (bool)((byte)(uVar70 >> 1) & 1);
                        bVar10 = (bool)((byte)(uVar70 >> 2) & 1);
                        bVar11 = SUB81(uVar70 >> 3,0);
                        *(uint *)(local_870.ray + 0xe0) =
                             (uint)(bVar69 & 1) * *(int *)(local_870.hit + 0x20) |
                             (uint)!(bool)(bVar69 & 1) * *(int *)(local_870.ray + 0xe0);
                        *(uint *)(local_870.ray + 0xe4) =
                             (uint)bVar9 * iVar55 | (uint)!bVar9 * *(int *)(local_870.ray + 0xe4);
                        *(uint *)(local_870.ray + 0xe8) =
                             (uint)bVar10 * iVar56 | (uint)!bVar10 * *(int *)(local_870.ray + 0xe8);
                        *(uint *)(local_870.ray + 0xec) =
                             (uint)bVar11 * iVar57 | (uint)!bVar11 * *(int *)(local_870.ray + 0xec);
                        iVar55 = *(int *)(local_870.hit + 0x34);
                        iVar56 = *(int *)(local_870.hit + 0x38);
                        iVar57 = *(int *)(local_870.hit + 0x3c);
                        bVar9 = (bool)((byte)(uVar70 >> 1) & 1);
                        bVar10 = (bool)((byte)(uVar70 >> 2) & 1);
                        bVar11 = SUB81(uVar70 >> 3,0);
                        *(uint *)(local_870.ray + 0xf0) =
                             (uint)(bVar69 & 1) * *(int *)(local_870.hit + 0x30) |
                             (uint)!(bool)(bVar69 & 1) * *(int *)(local_870.ray + 0xf0);
                        *(uint *)(local_870.ray + 0xf4) =
                             (uint)bVar9 * iVar55 | (uint)!bVar9 * *(int *)(local_870.ray + 0xf4);
                        *(uint *)(local_870.ray + 0xf8) =
                             (uint)bVar10 * iVar56 | (uint)!bVar10 * *(int *)(local_870.ray + 0xf8);
                        *(uint *)(local_870.ray + 0xfc) =
                             (uint)bVar11 * iVar57 | (uint)!bVar11 * *(int *)(local_870.ray + 0xfc);
                        auVar87._0_4_ =
                             (uint)(bVar69 & 1) * *(int *)(local_870.hit + 0x40) |
                             (uint)!(bool)(bVar69 & 1) * *(int *)(local_870.ray + 0x100);
                        bVar9 = (bool)((byte)(uVar70 >> 1) & 1);
                        auVar87._4_4_ =
                             (uint)bVar9 * *(int *)(local_870.hit + 0x44) |
                             (uint)!bVar9 * *(int *)(local_870.ray + 0x104);
                        bVar9 = (bool)((byte)(uVar70 >> 2) & 1);
                        auVar87._8_4_ =
                             (uint)bVar9 * *(int *)(local_870.hit + 0x48) |
                             (uint)!bVar9 * *(int *)(local_870.ray + 0x108);
                        bVar9 = SUB81(uVar70 >> 3,0);
                        auVar87._12_4_ =
                             (uint)bVar9 * *(int *)(local_870.hit + 0x4c) |
                             (uint)!bVar9 * *(int *)(local_870.ray + 0x10c);
                        *(undefined1 (*) [16])(local_870.ray + 0x100) = auVar87;
                        auVar78 = vmovdqu32_avx512vl(*(undefined1 (*) [16])(local_870.hit + 0x50));
                        *(undefined1 (*) [16])(local_870.ray + 0x110) = auVar78;
                        auVar78 = vmovdqu32_avx512vl(*(undefined1 (*) [16])(local_870.hit + 0x60));
                        *(undefined1 (*) [16])(local_870.ray + 0x120) = auVar78;
                        auVar78 = vmovdqa32_avx512vl(*(undefined1 (*) [16])(local_870.hit + 0x70));
                        *(undefined1 (*) [16])(local_870.ray + 0x130) = auVar78;
                        auVar78 = vmovdqa32_avx512vl(*(undefined1 (*) [16])(local_870.hit + 0x80));
                        *(undefined1 (*) [16])(local_870.ray + 0x140) = auVar78;
                        break;
                      }
                    }
                    auVar241 = ZEXT464((uint)fVar258);
                    *(float *)(ray + k * 4 + 0x80) = fVar258;
                    break;
                  }
                }
                lVar68 = lVar68 + -1;
              } while (lVar68 != 0);
              uVar165 = *(undefined4 *)(ray + k * 4 + 0x80);
              auVar155._4_4_ = uVar165;
              auVar155._0_4_ = uVar165;
              auVar155._8_4_ = uVar165;
              auVar155._12_4_ = uVar165;
              auVar155._16_4_ = uVar165;
              auVar155._20_4_ = uVar165;
              auVar155._24_4_ = uVar165;
              auVar155._28_4_ = uVar165;
              auVar59._4_4_ = fStack_3bc;
              auVar59._0_4_ = local_3c0;
              auVar59._8_4_ = fStack_3b8;
              auVar59._12_4_ = fStack_3b4;
              auVar59._16_4_ = fStack_3b0;
              auVar59._20_4_ = fStack_3ac;
              auVar59._24_4_ = fStack_3a8;
              auVar59._28_4_ = fStack_3a4;
              uVar17 = vcmpps_avx512vl(auVar155,auVar59,0xd);
              bVar67 = ~('\x01' << ((byte)iVar21 & 0x1f)) & bVar67 & (byte)uVar17;
            } while (bVar67 != 0);
            auVar127 = local_3e0;
            fVar253 = (float)local_6e0._0_4_;
            fVar256 = (float)local_6e0._4_4_;
            fVar257 = fStack_6d8;
            fVar258 = fStack_6d4;
            fVar220 = fStack_6d0;
            fVar221 = fStack_6cc;
            fVar222 = fStack_6c8;
            fVar248 = fStack_6c4;
          }
          uVar18 = vpcmpgtd_avx512vl(auVar127,local_380);
          uVar20 = vpcmpd_avx512vl(local_380,local_300,1);
          auVar207._0_4_ = fVar253 + (float)local_200._0_4_;
          auVar207._4_4_ = fVar256 + (float)local_200._4_4_;
          auVar207._8_4_ = fVar257 + fStack_1f8;
          auVar207._12_4_ = fVar258 + fStack_1f4;
          auVar207._16_4_ = fVar220 + fStack_1f0;
          auVar207._20_4_ = fVar221 + fStack_1ec;
          auVar207._24_4_ = fVar222 + fStack_1e8;
          auVar207._28_4_ = fVar248 + fStack_1e4;
          uVar17 = vcmpps_avx512vl(auVar207,auVar155,2);
          bVar65 = bVar65 & (byte)uVar20 & (byte)uVar17;
          auVar208._0_4_ = fVar253 + local_360._0_4_;
          auVar208._4_4_ = fVar256 + local_360._4_4_;
          auVar208._8_4_ = fVar257 + local_360._8_4_;
          auVar208._12_4_ = fVar258 + local_360._12_4_;
          auVar208._16_4_ = fVar220 + local_360._16_4_;
          auVar208._20_4_ = fVar221 + local_360._20_4_;
          auVar208._24_4_ = fVar222 + local_360._24_4_;
          auVar208._28_4_ = fVar248 + local_360._28_4_;
          uVar17 = vcmpps_avx512vl(auVar208,auVar155,2);
          bVar61 = bVar61 & (byte)uVar18 & (byte)uVar17 | bVar65;
          if (bVar61 != 0) {
            abStack_180[uVar64 * 0x60] = bVar61;
            auVar129._0_4_ =
                 (uint)(bVar65 & 1) * local_200._0_4_ |
                 (uint)!(bool)(bVar65 & 1) * (int)local_360._0_4_;
            bVar9 = (bool)(bVar65 >> 1 & 1);
            auVar129._4_4_ = (uint)bVar9 * local_200._4_4_ | (uint)!bVar9 * (int)local_360._4_4_;
            bVar9 = (bool)(bVar65 >> 2 & 1);
            auVar129._8_4_ = (uint)bVar9 * (int)fStack_1f8 | (uint)!bVar9 * (int)local_360._8_4_;
            bVar9 = (bool)(bVar65 >> 3 & 1);
            auVar129._12_4_ = (uint)bVar9 * (int)fStack_1f4 | (uint)!bVar9 * (int)local_360._12_4_;
            bVar9 = (bool)(bVar65 >> 4 & 1);
            auVar129._16_4_ = (uint)bVar9 * (int)fStack_1f0 | (uint)!bVar9 * (int)local_360._16_4_;
            bVar9 = (bool)(bVar65 >> 5 & 1);
            auVar129._20_4_ = (uint)bVar9 * (int)fStack_1ec | (uint)!bVar9 * (int)local_360._20_4_;
            auVar129._24_4_ =
                 (uint)(bVar65 >> 6) * (int)fStack_1e8 |
                 (uint)!(bool)(bVar65 >> 6) * (int)local_360._24_4_;
            auVar129._28_4_ = local_360._28_4_;
            *(undefined1 (*) [32])(auStack_160 + uVar64 * 0x60) = auVar129;
            uVar70 = vmovlps_avx(local_390);
            (&uStack_140)[uVar64 * 0xc] = uVar70;
            aiStack_138[uVar64 * 0x18] = local_9ac + 1;
            uVar64 = (ulong)((int)uVar64 + 1);
          }
        }
      }
    }
    do {
      uVar73 = (uint)uVar64;
      uVar64 = (ulong)(uVar73 - 1);
      if (uVar73 == 0) {
        uVar165 = *(undefined4 *)(ray + k * 4 + 0x80);
        auVar34._4_4_ = uVar165;
        auVar34._0_4_ = uVar165;
        auVar34._8_4_ = uVar165;
        auVar34._12_4_ = uVar165;
        uVar17 = vcmpps_avx512vl(local_3a0,auVar34,2);
        uVar63 = (uint)uVar17 & (uint)local_5e8 - 1 & (uint)local_5e8;
        local_5e8 = (ulong)uVar63;
        if (uVar63 == 0) {
          return;
        }
        goto LAB_01b9e678;
      }
      lVar68 = uVar64 * 0x60;
      auVar91 = *(undefined1 (*) [32])(auStack_160 + lVar68);
      auVar182._0_4_ = fVar253 + auVar91._0_4_;
      auVar182._4_4_ = fVar256 + auVar91._4_4_;
      auVar182._8_4_ = fVar257 + auVar91._8_4_;
      auVar182._12_4_ = fVar258 + auVar91._12_4_;
      auVar182._16_4_ = fVar220 + auVar91._16_4_;
      auVar182._20_4_ = fVar221 + auVar91._20_4_;
      auVar182._24_4_ = fVar222 + auVar91._24_4_;
      auVar182._28_4_ = fVar248 + auVar91._28_4_;
      uVar165 = *(undefined4 *)(ray + k * 4 + 0x80);
      auVar39._4_4_ = uVar165;
      auVar39._0_4_ = uVar165;
      auVar39._8_4_ = uVar165;
      auVar39._12_4_ = uVar165;
      auVar39._16_4_ = uVar165;
      auVar39._20_4_ = uVar165;
      auVar39._24_4_ = uVar165;
      auVar39._28_4_ = uVar165;
      uVar17 = vcmpps_avx512vl(auVar182,auVar39,2);
      uVar72 = (uint)uVar17 & (uint)abStack_180[lVar68];
    } while (uVar72 == 0);
    uVar70 = (&uStack_140)[uVar64 * 0xc];
    auVar179._8_8_ = 0;
    auVar179._0_8_ = uVar70;
    auVar209._8_4_ = 0x7f800000;
    auVar209._0_8_ = 0x7f8000007f800000;
    auVar209._12_4_ = 0x7f800000;
    auVar209._16_4_ = 0x7f800000;
    auVar209._20_4_ = 0x7f800000;
    auVar209._24_4_ = 0x7f800000;
    auVar209._28_4_ = 0x7f800000;
    auVar88 = vblendmps_avx512vl(auVar209,auVar91);
    bVar61 = (byte)uVar72;
    auVar130._0_4_ =
         (uint)(bVar61 & 1) * auVar88._0_4_ | (uint)!(bool)(bVar61 & 1) * (int)auVar91._0_4_;
    bVar9 = (bool)((byte)(uVar72 >> 1) & 1);
    auVar130._4_4_ = (uint)bVar9 * auVar88._4_4_ | (uint)!bVar9 * (int)auVar91._4_4_;
    bVar9 = (bool)((byte)(uVar72 >> 2) & 1);
    auVar130._8_4_ = (uint)bVar9 * auVar88._8_4_ | (uint)!bVar9 * (int)auVar91._8_4_;
    bVar9 = (bool)((byte)(uVar72 >> 3) & 1);
    auVar130._12_4_ = (uint)bVar9 * auVar88._12_4_ | (uint)!bVar9 * (int)auVar91._12_4_;
    bVar9 = (bool)((byte)(uVar72 >> 4) & 1);
    auVar130._16_4_ = (uint)bVar9 * auVar88._16_4_ | (uint)!bVar9 * (int)auVar91._16_4_;
    bVar9 = (bool)((byte)(uVar72 >> 5) & 1);
    auVar130._20_4_ = (uint)bVar9 * auVar88._20_4_ | (uint)!bVar9 * (int)auVar91._20_4_;
    bVar9 = (bool)((byte)(uVar72 >> 6) & 1);
    auVar130._24_4_ = (uint)bVar9 * auVar88._24_4_ | (uint)!bVar9 * (int)auVar91._24_4_;
    auVar130._28_4_ =
         (uVar72 >> 7) * auVar88._28_4_ | (uint)!SUB41(uVar72 >> 7,0) * (int)auVar91._28_4_;
    auVar91 = vshufps_avx(auVar130,auVar130,0xb1);
    auVar91 = vminps_avx(auVar130,auVar91);
    auVar88 = vshufpd_avx(auVar91,auVar91,5);
    auVar91 = vminps_avx(auVar91,auVar88);
    auVar88 = vpermpd_avx2(auVar91,0x4e);
    auVar91 = vminps_avx(auVar91,auVar88);
    uVar17 = vcmpps_avx512vl(auVar130,auVar91,0);
    bVar65 = (byte)uVar17 & bVar61;
    if (bVar65 != 0) {
      uVar72 = (uint)bVar65;
    }
    uVar131 = 0;
    for (; (uVar72 & 1) == 0; uVar72 = uVar72 >> 1 | 0x80000000) {
      uVar131 = uVar131 + 1;
    }
    local_9ac = aiStack_138[uVar64 * 0x18];
    bVar61 = ~('\x01' << ((byte)uVar131 & 0x1f)) & bVar61;
    abStack_180[lVar68] = bVar61;
    if (bVar61 == 0) {
      uVar73 = uVar73 - 1;
    }
    uVar165 = (undefined4)uVar70;
    auVar157._4_4_ = uVar165;
    auVar157._0_4_ = uVar165;
    auVar157._8_4_ = uVar165;
    auVar157._12_4_ = uVar165;
    auVar157._16_4_ = uVar165;
    auVar157._20_4_ = uVar165;
    auVar157._24_4_ = uVar165;
    auVar157._28_4_ = uVar165;
    auVar78 = vmovshdup_avx(auVar179);
    auVar78 = vsubps_avx(auVar78,auVar179);
    auVar183._0_4_ = auVar78._0_4_;
    auVar183._4_4_ = auVar183._0_4_;
    auVar183._8_4_ = auVar183._0_4_;
    auVar183._12_4_ = auVar183._0_4_;
    auVar183._16_4_ = auVar183._0_4_;
    auVar183._20_4_ = auVar183._0_4_;
    auVar183._24_4_ = auVar183._0_4_;
    auVar183._28_4_ = auVar183._0_4_;
    auVar78 = vfmadd132ps_fma(auVar183,auVar157,_DAT_01faff20);
    _local_4e0 = ZEXT1632(auVar78);
    auVar184 = ZEXT864(*(ulong *)(local_4e0 + (ulong)uVar131 * 4));
    uVar64 = (ulong)uVar73;
  } while( true );
}

Assistant:

static __forceinline void intersect_t(Precalculations& pre, RayHitK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(normal.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff a0,a1,a2,a3; geom->gather(a0,a1,a2,a3,geom->curve(primID),ray.time()[k]);

          Intersector().intersect(pre,ray,k,context,geom,primID,a0,a1,a2,a3,Epilog(ray,k,context,geomID,primID));
          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
      }